

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  uint uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [24];
  uint uVar125;
  uint uVar126;
  uint uVar127;
  long lVar128;
  ulong uVar129;
  ulong uVar130;
  long lVar131;
  Primitive *pPVar132;
  LinearSpace3fa *pLVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar151;
  float fVar153;
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar155;
  float fVar162;
  float fVar164;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar167;
  float fVar168;
  float fVar185;
  float fVar187;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar190;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar188;
  float fVar191;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar186;
  float fVar189;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar192;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar207 [16];
  float fVar206;
  undefined1 auVar203 [32];
  undefined1 auVar209 [16];
  float fVar208;
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar210 [16];
  undefined1 auVar216 [32];
  undefined1 auVar211 [16];
  undefined1 auVar217 [32];
  float fVar226;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar229;
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar230;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar246;
  float fVar249;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar238 [32];
  float fVar252;
  undefined1 auVar239 [32];
  float fVar247;
  float fVar250;
  float fVar253;
  undefined1 auVar240 [32];
  float fVar248;
  float fVar251;
  float fVar254;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  float fVar258;
  float fVar266;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar264;
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar270;
  float fVar271;
  float fVar281;
  float fVar283;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar274 [32];
  float fVar285;
  undefined1 auVar275 [32];
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar304;
  undefined1 auVar297 [32];
  undefined1 auVar298 [64];
  float fVar312;
  undefined1 auVar305 [16];
  float fVar309;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar317;
  float fVar325;
  float fVar326;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  float fVar327;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [64];
  float fVar334;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar343 [16];
  float in_register_0000151c;
  undefined1 auVar344 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [64];
  float fVar351;
  undefined1 auVar352 [16];
  float fVar356;
  float fVar357;
  undefined1 auVar353 [32];
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar361;
  float fVar364;
  float fVar365;
  float fVar366;
  float in_register_0000159c;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar367;
  float fVar370;
  float fVar371;
  float fVar372;
  float in_register_000015dc;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [8];
  float fStack_868;
  undefined1 local_830 [16];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 (*local_6f8) [16];
  size_t local_6f0;
  RayHitK<4> *local_6e8;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 auStack_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [2] [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar308 [32];
  undefined1 auVar310 [12];
  undefined1 auVar345 [32];
  
  PVar16 = prim[1];
  uVar130 = (ulong)(byte)PVar16;
  auVar260 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar260 = vinsertps_avx(auVar260,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar197 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar260 = vsubps_avx(auVar260,*(undefined1 (*) [16])(prim + uVar130 * 0x19 + 6));
  fVar270 = *(float *)(prim + uVar130 * 0x19 + 0x12);
  auVar169._0_4_ = fVar270 * auVar260._0_4_;
  auVar169._4_4_ = fVar270 * auVar260._4_4_;
  auVar169._8_4_ = fVar270 * auVar260._8_4_;
  auVar169._12_4_ = fVar270 * auVar260._12_4_;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 4 + 6)));
  auVar272._0_4_ = fVar270 * auVar197._0_4_;
  auVar272._4_4_ = fVar270 * auVar197._4_4_;
  auVar272._8_4_ = fVar270 * auVar197._8_4_;
  auVar272._12_4_ = fVar270 * auVar197._12_4_;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 4 + 10)));
  auVar144._16_16_ = auVar197;
  auVar144._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 5 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 5 + 10)));
  auVar201._16_16_ = auVar197;
  auVar201._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 6 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 6 + 10)));
  auVar223 = vcvtdq2ps_avx(auVar201);
  auVar212._16_16_ = auVar197;
  auVar212._0_16_ = auVar260;
  auVar23 = vcvtdq2ps_avx(auVar212);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xb + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xb + 10)));
  auVar213._16_16_ = auVar197;
  auVar213._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xc + 6)));
  auVar24 = vcvtdq2ps_avx(auVar213);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xc + 10)));
  auVar261._16_16_ = auVar197;
  auVar261._0_16_ = auVar260;
  auVar25 = vcvtdq2ps_avx(auVar261);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xd + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xd + 10)));
  auVar290._16_16_ = auVar197;
  auVar290._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x12 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x12 + 10)));
  auVar26 = vcvtdq2ps_avx(auVar290);
  auVar291._16_16_ = auVar197;
  auVar291._0_16_ = auVar260;
  auVar27 = vcvtdq2ps_avx(auVar291);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x13 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x13 + 10)));
  auVar318._16_16_ = auVar197;
  auVar318._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x14 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar318);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x14 + 10)));
  auVar328._16_16_ = auVar197;
  auVar328._0_16_ = auVar260;
  auVar29 = vcvtdq2ps_avx(auVar328);
  auVar260 = vshufps_avx(auVar272,auVar272,0);
  auVar197 = vshufps_avx(auVar272,auVar272,0x55);
  auVar207 = vshufps_avx(auVar272,auVar272,0xaa);
  fVar270 = auVar207._0_4_;
  fVar281 = auVar207._4_4_;
  fVar283 = auVar207._8_4_;
  fVar285 = auVar207._12_4_;
  fVar287 = auVar197._0_4_;
  fVar288 = auVar197._4_4_;
  fVar289 = auVar197._8_4_;
  fVar229 = auVar197._12_4_;
  fVar246 = auVar260._0_4_;
  fVar249 = auVar260._4_4_;
  fVar252 = auVar260._8_4_;
  fVar255 = auVar260._12_4_;
  auVar344._0_4_ = fVar246 * auVar144._0_4_ + fVar287 * auVar223._0_4_ + fVar270 * auVar23._0_4_;
  auVar344._4_4_ = fVar249 * auVar144._4_4_ + fVar288 * auVar223._4_4_ + fVar281 * auVar23._4_4_;
  auVar344._8_4_ = fVar252 * auVar144._8_4_ + fVar289 * auVar223._8_4_ + fVar283 * auVar23._8_4_;
  auVar344._12_4_ = fVar255 * auVar144._12_4_ + fVar229 * auVar223._12_4_ + fVar285 * auVar23._12_4_
  ;
  auVar344._16_4_ = fVar246 * auVar144._16_4_ + fVar287 * auVar223._16_4_ + fVar270 * auVar23._16_4_
  ;
  auVar344._20_4_ = fVar249 * auVar144._20_4_ + fVar288 * auVar223._20_4_ + fVar281 * auVar23._20_4_
  ;
  auVar344._24_4_ = fVar252 * auVar144._24_4_ + fVar289 * auVar223._24_4_ + fVar283 * auVar23._24_4_
  ;
  auVar344._28_4_ = fVar229 + in_register_000015dc + in_register_0000151c;
  auVar335._0_4_ = fVar246 * auVar24._0_4_ + fVar287 * auVar25._0_4_ + auVar26._0_4_ * fVar270;
  auVar335._4_4_ = fVar249 * auVar24._4_4_ + fVar288 * auVar25._4_4_ + auVar26._4_4_ * fVar281;
  auVar335._8_4_ = fVar252 * auVar24._8_4_ + fVar289 * auVar25._8_4_ + auVar26._8_4_ * fVar283;
  auVar335._12_4_ = fVar255 * auVar24._12_4_ + fVar229 * auVar25._12_4_ + auVar26._12_4_ * fVar285;
  auVar335._16_4_ = fVar246 * auVar24._16_4_ + fVar287 * auVar25._16_4_ + auVar26._16_4_ * fVar270;
  auVar335._20_4_ = fVar249 * auVar24._20_4_ + fVar288 * auVar25._20_4_ + auVar26._20_4_ * fVar281;
  auVar335._24_4_ = fVar252 * auVar24._24_4_ + fVar289 * auVar25._24_4_ + auVar26._24_4_ * fVar283;
  auVar335._28_4_ = fVar229 + in_register_000015dc + in_register_0000159c;
  auVar274._0_4_ = fVar246 * auVar27._0_4_ + fVar287 * auVar28._0_4_ + auVar29._0_4_ * fVar270;
  auVar274._4_4_ = fVar249 * auVar27._4_4_ + fVar288 * auVar28._4_4_ + auVar29._4_4_ * fVar281;
  auVar274._8_4_ = fVar252 * auVar27._8_4_ + fVar289 * auVar28._8_4_ + auVar29._8_4_ * fVar283;
  auVar274._12_4_ = fVar255 * auVar27._12_4_ + fVar229 * auVar28._12_4_ + auVar29._12_4_ * fVar285;
  auVar274._16_4_ = fVar246 * auVar27._16_4_ + fVar287 * auVar28._16_4_ + auVar29._16_4_ * fVar270;
  auVar274._20_4_ = fVar249 * auVar27._20_4_ + fVar288 * auVar28._20_4_ + auVar29._20_4_ * fVar281;
  auVar274._24_4_ = fVar252 * auVar27._24_4_ + fVar289 * auVar28._24_4_ + auVar29._24_4_ * fVar283;
  auVar274._28_4_ = fVar255 + fVar229 + fVar285;
  auVar260 = vshufps_avx(auVar169,auVar169,0);
  auVar197 = vshufps_avx(auVar169,auVar169,0x55);
  auVar207 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar281 = auVar207._0_4_;
  fVar283 = auVar207._4_4_;
  fVar285 = auVar207._8_4_;
  fVar287 = auVar207._12_4_;
  fVar249 = auVar197._0_4_;
  fVar252 = auVar197._4_4_;
  fVar255 = auVar197._8_4_;
  fVar256 = auVar197._12_4_;
  fVar288 = auVar260._0_4_;
  fVar289 = auVar260._4_4_;
  fVar229 = auVar260._8_4_;
  fVar246 = auVar260._12_4_;
  fVar270 = auVar144._28_4_;
  auVar173._0_4_ = fVar288 * auVar144._0_4_ + fVar249 * auVar223._0_4_ + fVar281 * auVar23._0_4_;
  auVar173._4_4_ = fVar289 * auVar144._4_4_ + fVar252 * auVar223._4_4_ + fVar283 * auVar23._4_4_;
  auVar173._8_4_ = fVar229 * auVar144._8_4_ + fVar255 * auVar223._8_4_ + fVar285 * auVar23._8_4_;
  auVar173._12_4_ = fVar246 * auVar144._12_4_ + fVar256 * auVar223._12_4_ + fVar287 * auVar23._12_4_
  ;
  auVar173._16_4_ = fVar288 * auVar144._16_4_ + fVar249 * auVar223._16_4_ + fVar281 * auVar23._16_4_
  ;
  auVar173._20_4_ = fVar289 * auVar144._20_4_ + fVar252 * auVar223._20_4_ + fVar283 * auVar23._20_4_
  ;
  auVar173._24_4_ = fVar229 * auVar144._24_4_ + fVar255 * auVar223._24_4_ + fVar285 * auVar23._24_4_
  ;
  auVar173._28_4_ = fVar270 + auVar223._28_4_ + auVar23._28_4_;
  auVar214._0_4_ = fVar288 * auVar24._0_4_ + auVar26._0_4_ * fVar281 + fVar249 * auVar25._0_4_;
  auVar214._4_4_ = fVar289 * auVar24._4_4_ + auVar26._4_4_ * fVar283 + fVar252 * auVar25._4_4_;
  auVar214._8_4_ = fVar229 * auVar24._8_4_ + auVar26._8_4_ * fVar285 + fVar255 * auVar25._8_4_;
  auVar214._12_4_ = fVar246 * auVar24._12_4_ + auVar26._12_4_ * fVar287 + fVar256 * auVar25._12_4_;
  auVar214._16_4_ = fVar288 * auVar24._16_4_ + auVar26._16_4_ * fVar281 + fVar249 * auVar25._16_4_;
  auVar214._20_4_ = fVar289 * auVar24._20_4_ + auVar26._20_4_ * fVar283 + fVar252 * auVar25._20_4_;
  auVar214._24_4_ = fVar229 * auVar24._24_4_ + auVar26._24_4_ * fVar285 + fVar255 * auVar25._24_4_;
  auVar214._28_4_ = fVar270 + auVar26._28_4_ + auVar23._28_4_;
  auVar292._8_4_ = 0x7fffffff;
  auVar292._0_8_ = 0x7fffffff7fffffff;
  auVar292._12_4_ = 0x7fffffff;
  auVar292._16_4_ = 0x7fffffff;
  auVar292._20_4_ = 0x7fffffff;
  auVar292._24_4_ = 0x7fffffff;
  auVar292._28_4_ = 0x7fffffff;
  auVar202._0_4_ = fVar288 * auVar27._0_4_ + fVar249 * auVar28._0_4_ + auVar29._0_4_ * fVar281;
  auVar202._4_4_ = fVar289 * auVar27._4_4_ + fVar252 * auVar28._4_4_ + auVar29._4_4_ * fVar283;
  auVar202._8_4_ = fVar229 * auVar27._8_4_ + fVar255 * auVar28._8_4_ + auVar29._8_4_ * fVar285;
  auVar202._12_4_ = fVar246 * auVar27._12_4_ + fVar256 * auVar28._12_4_ + auVar29._12_4_ * fVar287;
  auVar202._16_4_ = fVar288 * auVar27._16_4_ + fVar249 * auVar28._16_4_ + auVar29._16_4_ * fVar281;
  auVar202._20_4_ = fVar289 * auVar27._20_4_ + fVar252 * auVar28._20_4_ + auVar29._20_4_ * fVar283;
  auVar202._24_4_ = fVar229 * auVar27._24_4_ + fVar255 * auVar28._24_4_ + auVar29._24_4_ * fVar285;
  auVar202._28_4_ = fVar270 + auVar25._28_4_ + fVar287;
  auVar144 = vandps_avx(auVar344,auVar292);
  auVar238._8_4_ = 0x219392ef;
  auVar238._0_8_ = 0x219392ef219392ef;
  auVar238._12_4_ = 0x219392ef;
  auVar238._16_4_ = 0x219392ef;
  auVar238._20_4_ = 0x219392ef;
  auVar238._24_4_ = 0x219392ef;
  auVar238._28_4_ = 0x219392ef;
  auVar144 = vcmpps_avx(auVar144,auVar238,1);
  auVar223 = vblendvps_avx(auVar344,auVar238,auVar144);
  auVar144 = vandps_avx(auVar335,auVar292);
  auVar144 = vcmpps_avx(auVar144,auVar238,1);
  auVar23 = vblendvps_avx(auVar335,auVar238,auVar144);
  auVar144 = vandps_avx(auVar274,auVar292);
  auVar144 = vcmpps_avx(auVar144,auVar238,1);
  auVar24 = vrcpps_avx(auVar223);
  auVar144 = vblendvps_avx(auVar274,auVar238,auVar144);
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar319._16_4_ = 0x3f800000;
  auVar319._20_4_ = 0x3f800000;
  auVar319._24_4_ = 0x3f800000;
  auVar319._28_4_ = 0x3f800000;
  fVar229 = auVar24._0_4_;
  fVar246 = auVar24._4_4_;
  auVar25._4_4_ = fVar246 * auVar223._4_4_;
  auVar25._0_4_ = fVar229 * auVar223._0_4_;
  fVar249 = auVar24._8_4_;
  auVar25._8_4_ = fVar249 * auVar223._8_4_;
  fVar252 = auVar24._12_4_;
  auVar25._12_4_ = fVar252 * auVar223._12_4_;
  fVar255 = auVar24._16_4_;
  auVar25._16_4_ = fVar255 * auVar223._16_4_;
  fVar256 = auVar24._20_4_;
  auVar25._20_4_ = fVar256 * auVar223._20_4_;
  fVar257 = auVar24._24_4_;
  auVar25._24_4_ = fVar257 * auVar223._24_4_;
  auVar25._28_4_ = auVar223._28_4_;
  auVar223 = vsubps_avx(auVar319,auVar25);
  fVar229 = fVar229 + fVar229 * auVar223._0_4_;
  fVar246 = fVar246 + fVar246 * auVar223._4_4_;
  fVar249 = fVar249 + fVar249 * auVar223._8_4_;
  fVar252 = fVar252 + fVar252 * auVar223._12_4_;
  fVar255 = fVar255 + fVar255 * auVar223._16_4_;
  fVar256 = fVar256 + fVar256 * auVar223._20_4_;
  fVar257 = fVar257 + fVar257 * auVar223._24_4_;
  auVar223 = vrcpps_avx(auVar23);
  fVar270 = auVar223._0_4_;
  fVar281 = auVar223._4_4_;
  auVar24._4_4_ = fVar281 * auVar23._4_4_;
  auVar24._0_4_ = fVar270 * auVar23._0_4_;
  fVar283 = auVar223._8_4_;
  auVar24._8_4_ = fVar283 * auVar23._8_4_;
  fVar285 = auVar223._12_4_;
  auVar24._12_4_ = fVar285 * auVar23._12_4_;
  fVar287 = auVar223._16_4_;
  auVar24._16_4_ = fVar287 * auVar23._16_4_;
  fVar288 = auVar223._20_4_;
  auVar24._20_4_ = fVar288 * auVar23._20_4_;
  fVar289 = auVar223._24_4_;
  auVar24._24_4_ = fVar289 * auVar23._24_4_;
  auVar24._28_4_ = auVar23._28_4_;
  auVar24 = vsubps_avx(auVar319,auVar24);
  auVar23 = vrcpps_avx(auVar144);
  fVar270 = fVar270 + fVar270 * auVar24._0_4_;
  fVar281 = fVar281 + fVar281 * auVar24._4_4_;
  fVar283 = fVar283 + fVar283 * auVar24._8_4_;
  fVar285 = fVar285 + fVar285 * auVar24._12_4_;
  fVar287 = fVar287 + fVar287 * auVar24._16_4_;
  fVar288 = fVar288 + fVar288 * auVar24._20_4_;
  fVar289 = fVar289 + fVar289 * auVar24._24_4_;
  fVar258 = auVar23._0_4_;
  fVar264 = auVar23._4_4_;
  auVar26._4_4_ = fVar264 * auVar144._4_4_;
  auVar26._0_4_ = fVar258 * auVar144._0_4_;
  fVar265 = auVar23._8_4_;
  auVar26._8_4_ = fVar265 * auVar144._8_4_;
  fVar266 = auVar23._12_4_;
  auVar26._12_4_ = fVar266 * auVar144._12_4_;
  fVar267 = auVar23._16_4_;
  auVar26._16_4_ = fVar267 * auVar144._16_4_;
  fVar268 = auVar23._20_4_;
  auVar26._20_4_ = fVar268 * auVar144._20_4_;
  fVar269 = auVar23._24_4_;
  auVar26._24_4_ = fVar269 * auVar144._24_4_;
  auVar26._28_4_ = auVar223._28_4_;
  auVar144 = vsubps_avx(auVar319,auVar26);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar130 * 7 + 6);
  auVar260 = vpmovsxwd_avx(auVar260);
  fVar258 = fVar258 + fVar258 * auVar144._0_4_;
  fVar264 = fVar264 + fVar264 * auVar144._4_4_;
  fVar265 = fVar265 + fVar265 * auVar144._8_4_;
  fVar266 = fVar266 + fVar266 * auVar144._12_4_;
  fVar267 = fVar267 + fVar267 * auVar144._16_4_;
  fVar268 = fVar268 + fVar268 * auVar144._20_4_;
  fVar269 = fVar269 + fVar269 * auVar144._24_4_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar130 * 7 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar138._16_16_ = auVar197;
  auVar138._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar138);
  auVar144 = vsubps_avx(auVar144,auVar173);
  auVar136._0_4_ = fVar229 * auVar144._0_4_;
  auVar136._4_4_ = fVar246 * auVar144._4_4_;
  auVar136._8_4_ = fVar249 * auVar144._8_4_;
  auVar136._12_4_ = fVar252 * auVar144._12_4_;
  auVar23._16_4_ = fVar255 * auVar144._16_4_;
  auVar23._0_16_ = auVar136;
  auVar23._20_4_ = fVar256 * auVar144._20_4_;
  auVar23._24_4_ = fVar257 * auVar144._24_4_;
  auVar23._28_4_ = auVar144._28_4_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar130 * 9 + 6);
  auVar260 = vpmovsxwd_avx(auVar207);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar130 * 9 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar8);
  auVar293._16_16_ = auVar197;
  auVar293._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar293);
  auVar144 = vsubps_avx(auVar144,auVar173);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar130 * 0xe + 6);
  auVar260 = vpmovsxwd_avx(auVar9);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar130 * 0xe + 0xe);
  auVar197 = vpmovsxwd_avx(auVar235);
  auVar170._0_4_ = fVar229 * auVar144._0_4_;
  auVar170._4_4_ = fVar246 * auVar144._4_4_;
  auVar170._8_4_ = fVar249 * auVar144._8_4_;
  auVar170._12_4_ = fVar252 * auVar144._12_4_;
  auVar27._16_4_ = fVar255 * auVar144._16_4_;
  auVar27._0_16_ = auVar170;
  auVar27._20_4_ = fVar256 * auVar144._20_4_;
  auVar27._24_4_ = fVar257 * auVar144._24_4_;
  auVar27._28_4_ = auVar144._28_4_;
  auVar239._16_16_ = auVar197;
  auVar239._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar239);
  auVar144 = vsubps_avx(auVar144,auVar214);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  auVar260 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar11);
  auVar232._0_4_ = fVar270 * auVar144._0_4_;
  auVar232._4_4_ = fVar281 * auVar144._4_4_;
  auVar232._8_4_ = fVar283 * auVar144._8_4_;
  auVar232._12_4_ = fVar285 * auVar144._12_4_;
  auVar28._16_4_ = fVar287 * auVar144._16_4_;
  auVar28._0_16_ = auVar232;
  auVar28._20_4_ = fVar288 * auVar144._20_4_;
  auVar28._24_4_ = fVar289 * auVar144._24_4_;
  auVar28._28_4_ = auVar144._28_4_;
  auVar294._16_16_ = auVar197;
  auVar294._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar294);
  auVar144 = vsubps_avx(auVar144,auVar214);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar130 * 0x15 + 6);
  auVar260 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar130 * 0x15 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar13);
  auVar209._0_4_ = fVar270 * auVar144._0_4_;
  auVar209._4_4_ = fVar281 * auVar144._4_4_;
  auVar209._8_4_ = fVar283 * auVar144._8_4_;
  auVar209._12_4_ = fVar285 * auVar144._12_4_;
  auVar29._16_4_ = fVar287 * auVar144._16_4_;
  auVar29._0_16_ = auVar209;
  auVar29._20_4_ = fVar288 * auVar144._20_4_;
  auVar29._24_4_ = fVar289 * auVar144._24_4_;
  auVar29._28_4_ = auVar144._28_4_;
  auVar275._16_16_ = auVar197;
  auVar275._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar275);
  auVar144 = vsubps_avx(auVar144,auVar202);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar130 * 0x17 + 6);
  auVar260 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar130 * 0x17 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar15);
  auVar273._0_4_ = fVar258 * auVar144._0_4_;
  auVar273._4_4_ = fVar264 * auVar144._4_4_;
  auVar273._8_4_ = fVar265 * auVar144._8_4_;
  auVar273._12_4_ = fVar266 * auVar144._12_4_;
  auVar30._16_4_ = fVar267 * auVar144._16_4_;
  auVar30._0_16_ = auVar273;
  auVar30._20_4_ = fVar268 * auVar144._20_4_;
  auVar30._24_4_ = fVar269 * auVar144._24_4_;
  auVar30._28_4_ = auVar144._28_4_;
  auVar295._16_16_ = auVar197;
  auVar295._0_16_ = auVar260;
  auVar144 = vcvtdq2ps_avx(auVar295);
  auVar144 = vsubps_avx(auVar144,auVar202);
  auVar193._0_4_ = fVar258 * auVar144._0_4_;
  auVar193._4_4_ = fVar264 * auVar144._4_4_;
  auVar193._8_4_ = fVar265 * auVar144._8_4_;
  auVar193._12_4_ = fVar266 * auVar144._12_4_;
  auVar223._16_4_ = fVar267 * auVar144._16_4_;
  auVar223._0_16_ = auVar193;
  auVar223._20_4_ = fVar268 * auVar144._20_4_;
  auVar223._24_4_ = fVar269 * auVar144._24_4_;
  auVar223._28_4_ = auVar144._28_4_;
  auVar260 = vpminsd_avx(auVar23._16_16_,auVar27._16_16_);
  auVar197 = vpminsd_avx(auVar136,auVar170);
  auVar329._16_16_ = auVar260;
  auVar329._0_16_ = auVar197;
  auVar260 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar197 = vpminsd_avx(auVar232,auVar209);
  auVar336._16_16_ = auVar260;
  auVar336._0_16_ = auVar197;
  auVar144 = vmaxps_avx(auVar329,auVar336);
  auVar207 = auVar223._16_16_;
  auVar333 = ZEXT1664(auVar207);
  auVar260 = vpminsd_avx(auVar30._16_16_,auVar207);
  auVar197 = vpminsd_avx(auVar273,auVar193);
  auVar353._16_16_ = auVar260;
  auVar353._0_16_ = auVar197;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar362._4_4_ = uVar7;
  auVar362._0_4_ = uVar7;
  auVar362._8_4_ = uVar7;
  auVar362._12_4_ = uVar7;
  auVar362._16_4_ = uVar7;
  auVar362._20_4_ = uVar7;
  auVar362._24_4_ = uVar7;
  auVar362._28_4_ = uVar7;
  auVar223 = vmaxps_avx(auVar353,auVar362);
  auVar144 = vmaxps_avx(auVar144,auVar223);
  local_80._4_4_ = auVar144._4_4_ * 0.99999964;
  local_80._0_4_ = auVar144._0_4_ * 0.99999964;
  local_80._8_4_ = auVar144._8_4_ * 0.99999964;
  local_80._12_4_ = auVar144._12_4_ * 0.99999964;
  local_80._16_4_ = auVar144._16_4_ * 0.99999964;
  local_80._20_4_ = auVar144._20_4_ * 0.99999964;
  local_80._24_4_ = auVar144._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar260 = vpmaxsd_avx(auVar23._16_16_,auVar27._16_16_);
  auVar197 = vpmaxsd_avx(auVar136,auVar170);
  auVar139._16_16_ = auVar260;
  auVar139._0_16_ = auVar197;
  auVar260 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar197 = vpmaxsd_avx(auVar232,auVar209);
  auVar174._16_16_ = auVar260;
  auVar174._0_16_ = auVar197;
  auVar144 = vminps_avx(auVar139,auVar174);
  auVar260 = vpmaxsd_avx(auVar30._16_16_,auVar207);
  auVar197 = vpmaxsd_avx(auVar273,auVar193);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar215._4_4_ = uVar7;
  auVar215._0_4_ = uVar7;
  auVar215._8_4_ = uVar7;
  auVar215._12_4_ = uVar7;
  auVar215._16_4_ = uVar7;
  auVar215._20_4_ = uVar7;
  auVar215._24_4_ = uVar7;
  auVar215._28_4_ = uVar7;
  auVar175._16_16_ = auVar260;
  auVar175._0_16_ = auVar197;
  auVar223 = vminps_avx(auVar175,auVar215);
  auVar144 = vminps_avx(auVar144,auVar223);
  auVar22._4_4_ = auVar144._4_4_ * 1.0000004;
  auVar22._0_4_ = auVar144._0_4_ * 1.0000004;
  auVar22._8_4_ = auVar144._8_4_ * 1.0000004;
  auVar22._12_4_ = auVar144._12_4_ * 1.0000004;
  auVar22._16_4_ = auVar144._16_4_ * 1.0000004;
  auVar22._20_4_ = auVar144._20_4_ * 1.0000004;
  auVar22._24_4_ = auVar144._24_4_ * 1.0000004;
  auVar22._28_4_ = auVar144._28_4_;
  auVar144 = vcmpps_avx(local_80,auVar22,2);
  auVar260 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar176._16_16_ = auVar260;
  auVar176._0_16_ = auVar260;
  auVar223 = vcvtdq2ps_avx(auVar176);
  auVar223 = vcmpps_avx(_DAT_01f7b060,auVar223,1);
  auVar144 = vandps_avx(auVar144,auVar223);
  uVar125 = vmovmskps_avx(auVar144);
  local_5a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_5a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_5a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_5a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_6f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pPVar132 = prim + uVar130 * 0x19 + 0x16;
  pLVar133 = pre->ray_space + k;
  do {
    uVar130 = (ulong)uVar125;
    if (uVar130 == 0) {
      return;
    }
    auVar144 = auVar333._0_32_;
    lVar128 = 0;
    if (uVar130 != 0) {
      for (; (uVar125 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
      }
    }
    uVar130 = uVar130 - 1 & uVar130;
    uVar125 = *(uint *)(prim + lVar128 * 4 + 6);
    lVar128 = lVar128 * 0x40;
    lVar131 = 0;
    if (uVar130 != 0) {
      for (; (uVar130 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    uVar17 = *(uint *)(prim + 2);
    pGVar20 = (context->scene->geometries).items[uVar17].ptr;
    local_780._0_8_ = pGVar20;
    auVar260 = *(undefined1 (*) [16])(pPVar132 + lVar128);
    if (((uVar130 != 0) && (uVar129 = uVar130 - 1 & uVar130, uVar129 != 0)) &&
       (lVar131 = 0, uVar129 != 0)) {
      for (; (uVar129 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    _local_7c0 = *(undefined1 (*) [16])(pPVar132 + lVar128 + 0x10);
    _local_7d0 = *(undefined1 (*) [16])(pPVar132 + lVar128 + 0x20);
    _local_7e0 = *(undefined1 (*) [16])(pPVar132 + lVar128 + 0x30);
    uVar18 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar9 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar8 = vsubps_avx(auVar260,auVar9);
    auVar197 = vshufps_avx(auVar8,auVar8,0);
    auVar207 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    fVar270 = (pLVar133->vx).field_0.m128[0];
    fVar281 = (pLVar133->vx).field_0.m128[1];
    fVar283 = (pLVar133->vx).field_0.m128[2];
    fVar285 = (pLVar133->vx).field_0.m128[3];
    fVar287 = (pLVar133->vy).field_0.m128[0];
    fVar288 = (pLVar133->vy).field_0.m128[1];
    fVar289 = (pLVar133->vy).field_0.m128[2];
    fVar229 = (pLVar133->vy).field_0.m128[3];
    fVar246 = (pLVar133->vz).field_0.m128[0];
    fVar249 = (pLVar133->vz).field_0.m128[1];
    fVar252 = (pLVar133->vz).field_0.m128[2];
    fVar255 = (pLVar133->vz).field_0.m128[3];
    auVar233._0_4_ = auVar197._0_4_ * fVar270 + auVar207._0_4_ * fVar287 + fVar246 * auVar8._0_4_;
    auVar233._4_4_ = auVar197._4_4_ * fVar281 + auVar207._4_4_ * fVar288 + fVar249 * auVar8._4_4_;
    auVar233._8_4_ = auVar197._8_4_ * fVar283 + auVar207._8_4_ * fVar289 + fVar252 * auVar8._8_4_;
    auVar233._12_4_ =
         auVar197._12_4_ * fVar285 + auVar207._12_4_ * fVar229 + fVar255 * auVar8._12_4_;
    auVar197 = vblendps_avx(auVar233,auVar260,8);
    auVar235 = vsubps_avx(_local_7c0,auVar9);
    auVar207 = vshufps_avx(auVar235,auVar235,0);
    auVar8 = vshufps_avx(auVar235,auVar235,0x55);
    auVar235 = vshufps_avx(auVar235,auVar235,0xaa);
    auVar352._0_4_ = auVar207._0_4_ * fVar270 + auVar8._0_4_ * fVar287 + fVar246 * auVar235._0_4_;
    auVar352._4_4_ = auVar207._4_4_ * fVar281 + auVar8._4_4_ * fVar288 + fVar249 * auVar235._4_4_;
    auVar352._8_4_ = auVar207._8_4_ * fVar283 + auVar8._8_4_ * fVar289 + fVar252 * auVar235._8_4_;
    auVar352._12_4_ =
         auVar207._12_4_ * fVar285 + auVar8._12_4_ * fVar229 + fVar255 * auVar235._12_4_;
    auVar207 = vblendps_avx(auVar352,_local_7c0,8);
    auVar10 = vsubps_avx(_local_7d0,auVar9);
    auVar8 = vshufps_avx(auVar10,auVar10,0);
    auVar235 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar234._0_4_ = auVar8._0_4_ * fVar270 + auVar235._0_4_ * fVar287 + auVar10._0_4_ * fVar246;
    auVar234._4_4_ = auVar8._4_4_ * fVar281 + auVar235._4_4_ * fVar288 + auVar10._4_4_ * fVar249;
    auVar234._8_4_ = auVar8._8_4_ * fVar283 + auVar235._8_4_ * fVar289 + auVar10._8_4_ * fVar252;
    auVar234._12_4_ = auVar8._12_4_ * fVar285 + auVar235._12_4_ * fVar229 + auVar10._12_4_ * fVar255
    ;
    auVar8 = vblendps_avx(auVar234,_local_7d0,8);
    auVar10 = vsubps_avx(_local_7e0,auVar9);
    auVar9 = vshufps_avx(auVar10,auVar10,0);
    auVar235 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar259._0_4_ = auVar9._0_4_ * fVar270 + auVar235._0_4_ * fVar287 + fVar246 * auVar10._0_4_;
    auVar259._4_4_ = auVar9._4_4_ * fVar281 + auVar235._4_4_ * fVar288 + fVar249 * auVar10._4_4_;
    auVar259._8_4_ = auVar9._8_4_ * fVar283 + auVar235._8_4_ * fVar289 + fVar252 * auVar10._8_4_;
    auVar259._12_4_ = auVar9._12_4_ * fVar285 + auVar235._12_4_ * fVar229 + fVar255 * auVar10._12_4_
    ;
    auVar9 = vblendps_avx(auVar259,_local_7e0,8);
    auVar210._8_4_ = 0x7fffffff;
    auVar210._0_8_ = 0x7fffffff7fffffff;
    auVar210._12_4_ = 0x7fffffff;
    auVar197 = vandps_avx(auVar197,auVar210);
    auVar207 = vandps_avx(auVar207,auVar210);
    auVar235 = vmaxps_avx(auVar197,auVar207);
    auVar197 = vandps_avx(auVar8,auVar210);
    auVar207 = vandps_avx(auVar9,auVar210);
    auVar197 = vmaxps_avx(auVar197,auVar207);
    auVar197 = vmaxps_avx(auVar235,auVar197);
    auVar207 = vmovshdup_avx(auVar197);
    auVar207 = vmaxss_avx(auVar207,auVar197);
    auVar197 = vshufpd_avx(auVar197,auVar197,1);
    auVar197 = vmaxss_avx(auVar197,auVar207);
    lVar128 = (long)(int)uVar18 * 0x44;
    fVar270 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar128 + 0x908);
    fVar281 = *(float *)(bspline_basis0 + lVar128 + 0x90c);
    fVar283 = *(float *)(bspline_basis0 + lVar128 + 0x910);
    fVar285 = *(float *)(bspline_basis0 + lVar128 + 0x914);
    fVar287 = *(float *)(bspline_basis0 + lVar128 + 0x918);
    fVar288 = *(float *)(bspline_basis0 + lVar128 + 0x91c);
    fVar289 = *(float *)(bspline_basis0 + lVar128 + 0x920);
    auVar121 = *(undefined1 (*) [28])(bspline_basis0 + lVar128 + 0x908);
    auVar207 = vshufps_avx(auVar234,auVar234,0);
    register0x00001250 = auVar207;
    _local_600 = auVar207;
    auVar8 = vshufps_avx(auVar234,auVar234,0x55);
    register0x00001390 = auVar8;
    _local_820 = auVar8;
    fVar229 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar128 + 0xd8c);
    fVar246 = *(float *)(bspline_basis0 + lVar128 + 0xd90);
    fVar249 = *(float *)(bspline_basis0 + lVar128 + 0xd94);
    fVar252 = *(float *)(bspline_basis0 + lVar128 + 0xd98);
    fVar255 = *(float *)(bspline_basis0 + lVar128 + 0xd9c);
    fVar256 = *(float *)(bspline_basis0 + lVar128 + 0xda0);
    fVar257 = *(float *)(bspline_basis0 + lVar128 + 0xda4);
    auVar120 = *(undefined1 (*) [28])(bspline_basis0 + lVar128 + 0xd8c);
    auVar9 = vshufps_avx(auVar259,auVar259,0);
    register0x000014d0 = auVar9;
    _local_460 = auVar9;
    auVar235 = vshufps_avx(auVar259,auVar259,0x55);
    register0x00001350 = auVar235;
    _local_720 = auVar235;
    fVar334 = auVar9._0_4_;
    fVar340 = auVar9._4_4_;
    fVar341 = auVar9._8_4_;
    fVar342 = auVar9._12_4_;
    fVar167 = auVar207._0_4_;
    fVar185 = auVar207._4_4_;
    fVar304 = auVar207._8_4_;
    fVar188 = auVar207._12_4_;
    fVar186 = auVar235._0_4_;
    fVar187 = auVar235._4_4_;
    fVar189 = auVar235._8_4_;
    fVar190 = auVar235._12_4_;
    fVar271 = auVar8._0_4_;
    fVar282 = auVar8._4_4_;
    fVar284 = auVar8._8_4_;
    fVar286 = auVar8._12_4_;
    auVar207 = vshufps_avx(_local_7d0,_local_7d0,0xff);
    register0x00001350 = auVar207;
    _local_120 = auVar207;
    auVar8 = vshufps_avx(_local_7e0,_local_7e0,0xff);
    register0x000013d0 = auVar8;
    _local_140 = auVar8;
    fVar254 = auVar8._0_4_;
    fVar299 = auVar8._4_4_;
    fVar300 = auVar8._8_4_;
    fVar301 = auVar8._12_4_;
    fVar231 = auVar207._0_4_;
    fVar248 = auVar207._4_4_;
    fVar251 = auVar207._8_4_;
    auVar8 = vshufps_avx(auVar352,auVar352,0);
    register0x00001550 = auVar8;
    _local_640 = auVar8;
    fVar258 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar128 + 0x484);
    fVar264 = *(float *)(bspline_basis0 + lVar128 + 0x488);
    fVar265 = *(float *)(bspline_basis0 + lVar128 + 0x48c);
    fVar266 = *(float *)(bspline_basis0 + lVar128 + 0x490);
    fVar267 = *(float *)(bspline_basis0 + lVar128 + 0x494);
    fVar268 = *(float *)(bspline_basis0 + lVar128 + 0x498);
    fVar269 = *(float *)(bspline_basis0 + lVar128 + 0x49c);
    auVar122 = *(undefined1 (*) [28])(bspline_basis0 + lVar128 + 0x484);
    fVar351 = auVar8._0_4_;
    fVar356 = auVar8._4_4_;
    fVar357 = auVar8._8_4_;
    fVar359 = auVar8._12_4_;
    auVar8 = vshufps_avx(auVar352,auVar352,0x55);
    register0x000015d0 = auVar8;
    _local_740 = auVar8;
    fVar367 = auVar8._0_4_;
    fVar370 = auVar8._4_4_;
    fVar371 = auVar8._8_4_;
    fVar372 = auVar8._12_4_;
    auVar8 = vshufps_avx(_local_7c0,_local_7c0,0xff);
    register0x00001590 = auVar8;
    _local_a0 = auVar8;
    fVar358 = auVar8._0_4_;
    fVar360 = auVar8._4_4_;
    fVar361 = auVar8._8_4_;
    fVar364 = auVar8._12_4_;
    auVar8 = vshufps_avx(auVar233,auVar233,0);
    register0x00001310 = auVar8;
    _local_300 = auVar8;
    fVar309 = *(float *)(bspline_basis0 + lVar128);
    fVar311 = *(float *)(bspline_basis0 + lVar128 + 4);
    fVar226 = *(float *)(bspline_basis0 + lVar128 + 8);
    fVar302 = *(float *)(bspline_basis0 + lVar128 + 0xc);
    fVar312 = *(float *)(bspline_basis0 + lVar128 + 0x10);
    fVar313 = *(float *)(bspline_basis0 + lVar128 + 0x14);
    fVar160 = *(float *)(bspline_basis0 + lVar128 + 0x18);
    fVar230 = auVar8._0_4_;
    fVar247 = auVar8._4_4_;
    fVar250 = auVar8._8_4_;
    fVar253 = auVar8._12_4_;
    auVar343._0_4_ = fVar230 * fVar309 + fVar351 * fVar258 + fVar167 * fVar270 + fVar334 * fVar229;
    auVar343._4_4_ = fVar247 * fVar311 + fVar356 * fVar264 + fVar185 * fVar281 + fVar340 * fVar246;
    auVar343._8_4_ = fVar250 * fVar226 + fVar357 * fVar265 + fVar304 * fVar283 + fVar341 * fVar249;
    auVar343._12_4_ = fVar253 * fVar302 + fVar359 * fVar266 + fVar188 * fVar285 + fVar342 * fVar252;
    auVar345._16_4_ = fVar230 * fVar312 + fVar351 * fVar267 + fVar167 * fVar287 + fVar334 * fVar255;
    auVar345._0_16_ = auVar343;
    auVar345._20_4_ = fVar247 * fVar313 + fVar356 * fVar268 + fVar185 * fVar288 + fVar340 * fVar256;
    auVar345._24_4_ = fVar250 * fVar160 + fVar357 * fVar269 + fVar304 * fVar289 + fVar341 * fVar257;
    auVar345._28_4_ = fVar188 + 0.0 + 0.0 + 0.0;
    auVar8 = vshufps_avx(auVar233,auVar233,0x55);
    fVar192 = auVar8._0_4_;
    fVar204 = auVar8._4_4_;
    fVar205 = auVar8._8_4_;
    fVar206 = auVar8._12_4_;
    auVar306._0_4_ = fVar192 * fVar309 + fVar367 * fVar258 + fVar271 * fVar270 + fVar186 * fVar229;
    auVar306._4_4_ = fVar204 * fVar311 + fVar370 * fVar264 + fVar282 * fVar281 + fVar187 * fVar246;
    auVar306._8_4_ = fVar205 * fVar226 + fVar371 * fVar265 + fVar284 * fVar283 + fVar189 * fVar249;
    auVar306._12_4_ = fVar206 * fVar302 + fVar372 * fVar266 + fVar286 * fVar285 + fVar190 * fVar252;
    auVar306._16_4_ = fVar192 * fVar312 + fVar367 * fVar267 + fVar271 * fVar287 + fVar186 * fVar255;
    auVar306._20_4_ = fVar204 * fVar313 + fVar370 * fVar268 + fVar282 * fVar288 + fVar187 * fVar256;
    auVar306._24_4_ = fVar205 * fVar160 + fVar371 * fVar269 + fVar284 * fVar289 + fVar189 * fVar257;
    auVar306._28_4_ = fVar188 + 0.0 + 0.0 + 0.0;
    auVar8 = vpermilps_avx(auVar260,0xff);
    register0x00001450 = auVar8;
    _local_c0 = auVar8;
    fVar317 = auVar8._0_4_;
    fVar325 = auVar8._4_4_;
    fVar326 = auVar8._8_4_;
    fVar134 = fVar358 * fVar258 + fVar231 * fVar270 + fVar254 * fVar229 + fVar317 * fVar309;
    fVar151 = fVar360 * fVar264 + fVar248 * fVar281 + fVar299 * fVar246 + fVar325 * fVar311;
    fVar153 = fVar361 * fVar265 + fVar251 * fVar283 + fVar300 * fVar249 + fVar326 * fVar226;
    fVar155 = fVar364 * fVar266 + auVar207._12_4_ * fVar285 + fVar301 * fVar252 +
              auVar8._12_4_ * fVar302;
    fVar157 = fVar358 * fVar267 + fVar231 * fVar287 + fVar254 * fVar255 + fVar317 * fVar312;
    fVar159 = fVar360 * fVar268 + fVar248 * fVar288 + fVar299 * fVar256 + fVar325 * fVar313;
    fVar161 = fVar361 * fVar269 + fVar251 * fVar289 + fVar300 * fVar257 + fVar326 * fVar160;
    fVar164 = *(float *)(bspline_basis0 + lVar128 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar258 = *(float *)(bspline_basis1 + lVar128 + 0x908);
    fVar264 = *(float *)(bspline_basis1 + lVar128 + 0x90c);
    fVar265 = *(float *)(bspline_basis1 + lVar128 + 0x910);
    fVar266 = *(float *)(bspline_basis1 + lVar128 + 0x914);
    fVar267 = *(float *)(bspline_basis1 + lVar128 + 0x918);
    fVar268 = *(float *)(bspline_basis1 + lVar128 + 0x91c);
    fVar269 = *(float *)(bspline_basis1 + lVar128 + 0x920);
    fVar163 = *(float *)(bspline_basis1 + lVar128 + 0xd8c);
    fVar314 = *(float *)(bspline_basis1 + lVar128 + 0xd90);
    fVar315 = *(float *)(bspline_basis1 + lVar128 + 0xd94);
    fVar227 = *(float *)(bspline_basis1 + lVar128 + 0xd98);
    fVar303 = *(float *)(bspline_basis1 + lVar128 + 0xd9c);
    fVar316 = *(float *)(bspline_basis1 + lVar128 + 0xda0);
    fVar327 = *(float *)(bspline_basis1 + lVar128 + 0xda4);
    fVar228 = *(float *)(bspline_basis1 + lVar128 + 0x484);
    fVar191 = *(float *)(bspline_basis1 + lVar128 + 0x488);
    fVar135 = *(float *)(bspline_basis1 + lVar128 + 0x48c);
    fVar152 = *(float *)(bspline_basis1 + lVar128 + 0x490);
    fVar154 = *(float *)(bspline_basis1 + lVar128 + 0x494);
    fVar156 = *(float *)(bspline_basis1 + lVar128 + 0x498);
    fVar158 = *(float *)(bspline_basis1 + lVar128 + 0x49c);
    fVar165 = *(float *)(bspline_basis1 + lVar128);
    fVar162 = *(float *)(bspline_basis1 + lVar128 + 4);
    fVar208 = *(float *)(bspline_basis1 + lVar128 + 8);
    fVar224 = *(float *)(bspline_basis1 + lVar128 + 0xc);
    fVar225 = *(float *)(bspline_basis1 + lVar128 + 0x10);
    fVar166 = *(float *)(bspline_basis1 + lVar128 + 0x14);
    fVar168 = *(float *)(bspline_basis1 + lVar128 + 0x18);
    auVar240._0_4_ = fVar230 * fVar165 + fVar351 * fVar228 + fVar258 * fVar167 + fVar334 * fVar163;
    auVar240._4_4_ = fVar247 * fVar162 + fVar356 * fVar191 + fVar264 * fVar185 + fVar340 * fVar314;
    auVar240._8_4_ = fVar250 * fVar208 + fVar357 * fVar135 + fVar265 * fVar304 + fVar341 * fVar315;
    auVar240._12_4_ = fVar253 * fVar224 + fVar359 * fVar152 + fVar266 * fVar188 + fVar342 * fVar227;
    auVar240._16_4_ = fVar230 * fVar225 + fVar351 * fVar154 + fVar267 * fVar167 + fVar334 * fVar303;
    auVar240._20_4_ = fVar247 * fVar166 + fVar356 * fVar156 + fVar268 * fVar185 + fVar340 * fVar316;
    auVar240._24_4_ = fVar250 * fVar168 + fVar357 * fVar158 + fVar269 * fVar304 + fVar341 * fVar327;
    auVar240._28_4_ = fVar364 + fVar359 + 0.0;
    auVar216._0_4_ = fVar192 * fVar165 + fVar367 * fVar228 + fVar258 * fVar271 + fVar163 * fVar186;
    auVar216._4_4_ = fVar204 * fVar162 + fVar370 * fVar191 + fVar264 * fVar282 + fVar314 * fVar187;
    auVar216._8_4_ = fVar205 * fVar208 + fVar371 * fVar135 + fVar265 * fVar284 + fVar315 * fVar189;
    auVar216._12_4_ = fVar206 * fVar224 + fVar372 * fVar152 + fVar266 * fVar286 + fVar227 * fVar190;
    auVar216._16_4_ = fVar192 * fVar225 + fVar367 * fVar154 + fVar267 * fVar271 + fVar303 * fVar186;
    auVar216._20_4_ = fVar204 * fVar166 + fVar370 * fVar156 + fVar268 * fVar282 + fVar316 * fVar187;
    auVar216._24_4_ = fVar205 * fVar168 + fVar371 * fVar158 + fVar269 * fVar284 + fVar327 * fVar189;
    auVar216._28_4_ = fVar206 + fVar359 + 0.0;
    local_6c0._0_4_ = fVar358 * fVar228 + fVar231 * fVar258 + fVar254 * fVar163 + fVar317 * fVar165;
    local_6c0._4_4_ = fVar360 * fVar191 + fVar248 * fVar264 + fVar299 * fVar314 + fVar325 * fVar162;
    local_6c0._8_4_ = fVar361 * fVar135 + fVar251 * fVar265 + fVar300 * fVar315 + fVar326 * fVar208;
    local_6c0._12_4_ =
         fVar364 * fVar152 + auVar207._12_4_ * fVar266 + fVar301 * fVar227 + auVar8._12_4_ * fVar224
    ;
    local_6c0._16_4_ = fVar358 * fVar154 + fVar231 * fVar267 + fVar254 * fVar303 + fVar317 * fVar225
    ;
    local_6c0._20_4_ = fVar360 * fVar156 + fVar248 * fVar268 + fVar299 * fVar316 + fVar325 * fVar166
    ;
    local_6c0._24_4_ = fVar361 * fVar158 + fVar251 * fVar269 + fVar300 * fVar327 + fVar326 * fVar168
    ;
    local_6c0._28_4_ = fVar359 + fVar301 + 0.0 + fVar206;
    auVar24 = vsubps_avx(auVar240,auVar345);
    auVar25 = vsubps_avx(auVar216,auVar306);
    fVar270 = auVar24._0_4_;
    fVar283 = auVar24._4_4_;
    auVar31._4_4_ = auVar306._4_4_ * fVar283;
    auVar31._0_4_ = auVar306._0_4_ * fVar270;
    fVar287 = auVar24._8_4_;
    auVar31._8_4_ = auVar306._8_4_ * fVar287;
    fVar289 = auVar24._12_4_;
    auVar31._12_4_ = auVar306._12_4_ * fVar289;
    fVar246 = auVar24._16_4_;
    auVar31._16_4_ = auVar306._16_4_ * fVar246;
    fVar252 = auVar24._20_4_;
    auVar31._20_4_ = auVar306._20_4_ * fVar252;
    fVar256 = auVar24._24_4_;
    auVar31._24_4_ = auVar306._24_4_ * fVar256;
    auVar31._28_4_ = fVar206;
    fVar281 = auVar25._0_4_;
    fVar285 = auVar25._4_4_;
    auVar32._4_4_ = auVar343._4_4_ * fVar285;
    auVar32._0_4_ = auVar343._0_4_ * fVar281;
    fVar288 = auVar25._8_4_;
    auVar32._8_4_ = auVar343._8_4_ * fVar288;
    fVar229 = auVar25._12_4_;
    auVar32._12_4_ = auVar343._12_4_ * fVar229;
    fVar249 = auVar25._16_4_;
    auVar32._16_4_ = auVar345._16_4_ * fVar249;
    fVar255 = auVar25._20_4_;
    auVar32._20_4_ = auVar345._20_4_ * fVar255;
    fVar257 = auVar25._24_4_;
    auVar32._24_4_ = auVar345._24_4_ * fVar257;
    auVar32._28_4_ = auVar216._28_4_;
    auVar23 = vsubps_avx(auVar31,auVar32);
    auVar115._4_4_ = fVar151;
    auVar115._0_4_ = fVar134;
    auVar115._8_4_ = fVar153;
    auVar115._12_4_ = fVar155;
    auVar115._16_4_ = fVar157;
    auVar115._20_4_ = fVar159;
    auVar115._24_4_ = fVar161;
    auVar115._28_4_ = fVar164;
    auVar223 = vmaxps_avx(auVar115,local_6c0);
    auVar33._4_4_ = auVar223._4_4_ * auVar223._4_4_ * (fVar283 * fVar283 + fVar285 * fVar285);
    auVar33._0_4_ = auVar223._0_4_ * auVar223._0_4_ * (fVar270 * fVar270 + fVar281 * fVar281);
    auVar33._8_4_ = auVar223._8_4_ * auVar223._8_4_ * (fVar287 * fVar287 + fVar288 * fVar288);
    auVar33._12_4_ = auVar223._12_4_ * auVar223._12_4_ * (fVar289 * fVar289 + fVar229 * fVar229);
    auVar33._16_4_ = auVar223._16_4_ * auVar223._16_4_ * (fVar246 * fVar246 + fVar249 * fVar249);
    auVar33._20_4_ = auVar223._20_4_ * auVar223._20_4_ * (fVar252 * fVar252 + fVar255 * fVar255);
    auVar33._24_4_ = auVar223._24_4_ * auVar223._24_4_ * (fVar256 * fVar256 + fVar257 * fVar257);
    auVar33._28_4_ = auVar240._28_4_ + auVar216._28_4_;
    auVar34._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar34._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar34._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar34._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar34._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar34._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar34._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar34._28_4_ = auVar23._28_4_;
    auVar223 = vcmpps_avx(auVar34,auVar33,2);
    auVar211._0_4_ = (float)(int)uVar18;
    auVar211._4_12_ = auVar343._4_12_;
    auVar235 = ZEXT416((uint)(auVar197._0_4_ * 4.7683716e-07));
    auVar197 = vshufps_avx(auVar211,auVar211,0);
    auVar217._16_16_ = auVar197;
    auVar217._0_16_ = auVar197;
    auVar23 = vcmpps_avx(_DAT_01f7b060,auVar217,1);
    auVar197 = vpermilps_avx(auVar233,0xaa);
    register0x00001450 = auVar197;
    _local_520 = auVar197;
    auVar207 = vpermilps_avx(auVar352,0xaa);
    register0x00001550 = auVar207;
    _local_2e0 = auVar207;
    auVar8 = vpermilps_avx(auVar234,0xaa);
    register0x00001590 = auVar8;
    _local_e0 = auVar8;
    auVar9 = vpermilps_avx(auVar259,0xaa);
    register0x00001310 = auVar9;
    _local_2c0 = auVar9;
    auVar245 = ZEXT3264(_local_2c0);
    auVar26 = auVar23 & auVar223;
    local_620._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
    _local_480 = ZEXT416(uVar17);
    local_4a0._0_16_ = ZEXT416(uVar125);
    local_8d0 = auVar260._0_4_;
    fStack_8cc = auVar260._4_4_;
    fStack_8c8 = auVar260._8_4_;
    fStack_8c4 = auVar260._12_4_;
    uVar126 = uVar18;
    fVar270 = fVar186;
    fVar281 = fVar187;
    fVar283 = fVar189;
    fVar285 = fVar190;
    fVar287 = fVar367;
    fVar288 = fVar370;
    fVar289 = fVar371;
    fVar229 = fVar372;
    local_560 = auVar211._0_4_;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0x7f,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0xbf,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f]) {
      auVar333 = ZEXT3264(auVar144);
LAB_009b7d7c:
      auVar350 = ZEXT3264(_local_820);
      auVar324 = ZEXT3264(_local_640);
    }
    else {
      local_320 = vandps_avx(auVar223,auVar23);
      fVar299 = auVar197._0_4_;
      fVar300 = auVar197._4_4_;
      fVar301 = auVar197._8_4_;
      fVar317 = auVar197._12_4_;
      fVar325 = auVar207._0_4_;
      fVar326 = auVar207._4_4_;
      fVar358 = auVar207._8_4_;
      fVar360 = auVar207._12_4_;
      fVar361 = auVar8._0_4_;
      fVar364 = auVar8._4_4_;
      fVar365 = auVar8._8_4_;
      fVar366 = auVar8._12_4_;
      fVar231 = auVar9._0_4_;
      fVar248 = auVar9._4_4_;
      fVar251 = auVar9._8_4_;
      fVar254 = auVar9._12_4_;
      fVar246 = auVar23._28_4_ + *(float *)(bspline_basis1 + lVar128 + 0x924) + 0.0;
      local_340._0_4_ =
           fVar299 * fVar165 + fVar325 * fVar228 + fVar361 * fVar258 + fVar231 * fVar163;
      local_340._4_4_ =
           fVar300 * fVar162 + fVar326 * fVar191 + fVar364 * fVar264 + fVar248 * fVar314;
      fStack_338 = fVar301 * fVar208 + fVar358 * fVar135 + fVar365 * fVar265 + fVar251 * fVar315;
      fStack_334 = fVar317 * fVar224 + fVar360 * fVar152 + fVar366 * fVar266 + fVar254 * fVar227;
      fStack_330 = fVar299 * fVar225 + fVar325 * fVar154 + fVar361 * fVar267 + fVar231 * fVar303;
      fStack_32c = fVar300 * fVar166 + fVar326 * fVar156 + fVar364 * fVar268 + fVar248 * fVar316;
      fStack_328 = fVar301 * fVar168 + fVar358 * fVar158 + fVar365 * fVar269 + fVar251 * fVar327;
      fStack_324 = local_320._28_4_ + fVar246;
      local_6a0._0_4_ = auVar122._0_4_;
      local_6a0._4_4_ = auVar122._4_4_;
      fStack_698 = auVar122._8_4_;
      fStack_694 = auVar122._12_4_;
      fStack_690 = auVar122._16_4_;
      fStack_68c = auVar122._20_4_;
      fStack_688 = auVar122._24_4_;
      local_4e0._0_4_ = auVar121._0_4_;
      local_4e0._4_4_ = auVar121._4_4_;
      fStack_4d8 = auVar121._8_4_;
      fStack_4d4 = auVar121._12_4_;
      fStack_4d0 = auVar121._16_4_;
      fStack_4cc = auVar121._20_4_;
      fStack_4c8 = auVar121._24_4_;
      local_760._0_4_ = auVar120._0_4_;
      local_760._4_4_ = auVar120._4_4_;
      fStack_758 = auVar120._8_4_;
      fStack_754 = auVar120._12_4_;
      fStack_750 = auVar120._16_4_;
      fStack_74c = auVar120._20_4_;
      fStack_748 = auVar120._24_4_;
      local_4e0._0_4_ =
           fVar299 * fVar309 +
           fVar325 * (float)local_6a0._0_4_ +
           fVar361 * (float)local_4e0._0_4_ + fVar231 * (float)local_760._0_4_;
      local_4e0._4_4_ =
           fVar300 * fVar311 +
           fVar326 * (float)local_6a0._4_4_ +
           fVar364 * (float)local_4e0._4_4_ + fVar248 * (float)local_760._4_4_;
      fStack_4d8 = fVar301 * fVar226 +
                   fVar358 * fStack_698 + fVar365 * fStack_4d8 + fVar251 * fStack_758;
      fStack_4d4 = fVar317 * fVar302 +
                   fVar360 * fStack_694 + fVar366 * fStack_4d4 + fVar254 * fStack_754;
      fStack_4d0 = fVar299 * fVar312 +
                   fVar325 * fStack_690 + fVar361 * fStack_4d0 + fVar231 * fStack_750;
      fStack_4cc = fVar300 * fVar313 +
                   fVar326 * fStack_68c + fVar364 * fStack_4cc + fVar248 * fStack_74c;
      fStack_4c8 = fVar301 * fVar160 +
                   fVar358 * fStack_688 + fVar365 * fStack_4c8 + fVar251 * fStack_748;
      fStack_4c4 = fStack_324 + fVar246 + local_320._28_4_ + auVar23._28_4_;
      fVar246 = *(float *)(bspline_basis0 + lVar128 + 0x1210);
      fVar249 = *(float *)(bspline_basis0 + lVar128 + 0x1214);
      fVar252 = *(float *)(bspline_basis0 + lVar128 + 0x1218);
      fVar255 = *(float *)(bspline_basis0 + lVar128 + 0x121c);
      fVar256 = *(float *)(bspline_basis0 + lVar128 + 0x1220);
      fVar257 = *(float *)(bspline_basis0 + lVar128 + 0x1224);
      fVar258 = *(float *)(bspline_basis0 + lVar128 + 0x1228);
      fVar264 = *(float *)(bspline_basis0 + lVar128 + 0x1694);
      fVar265 = *(float *)(bspline_basis0 + lVar128 + 0x1698);
      fVar266 = *(float *)(bspline_basis0 + lVar128 + 0x169c);
      fVar267 = *(float *)(bspline_basis0 + lVar128 + 0x16a0);
      fVar268 = *(float *)(bspline_basis0 + lVar128 + 0x16a4);
      fVar269 = *(float *)(bspline_basis0 + lVar128 + 0x16a8);
      fVar309 = *(float *)(bspline_basis0 + lVar128 + 0x16ac);
      fVar311 = *(float *)(bspline_basis0 + lVar128 + 0x1b18);
      fVar226 = *(float *)(bspline_basis0 + lVar128 + 0x1b1c);
      fVar302 = *(float *)(bspline_basis0 + lVar128 + 0x1b20);
      fVar312 = *(float *)(bspline_basis0 + lVar128 + 0x1b24);
      fVar313 = *(float *)(bspline_basis0 + lVar128 + 0x1b28);
      fVar160 = *(float *)(bspline_basis0 + lVar128 + 0x1b2c);
      fVar163 = *(float *)(bspline_basis0 + lVar128 + 0x1b30);
      fVar314 = *(float *)(bspline_basis0 + lVar128 + 0x1f9c);
      fVar315 = *(float *)(bspline_basis0 + lVar128 + 0x1fa0);
      fVar227 = *(float *)(bspline_basis0 + lVar128 + 0x1fa4);
      fVar303 = *(float *)(bspline_basis0 + lVar128 + 0x1fa8);
      fVar316 = *(float *)(bspline_basis0 + lVar128 + 0x1fac);
      fVar327 = *(float *)(bspline_basis0 + lVar128 + 0x1fb0);
      fVar228 = *(float *)(bspline_basis0 + lVar128 + 0x1fb4);
      fVar191 = *(float *)(bspline_basis0 + lVar128 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar128 + 0x1fb8);
      fVar135 = *(float *)(bspline_basis0 + lVar128 + 0x16b0) + fVar191;
      local_5e0 = fVar230 * fVar246 + fVar351 * fVar264 + fVar167 * fVar311 + fVar334 * fVar314;
      fStack_5dc = fVar247 * fVar249 + fVar356 * fVar265 + fVar185 * fVar226 + fVar340 * fVar315;
      fStack_5d8 = fVar250 * fVar252 + fVar357 * fVar266 + fVar304 * fVar302 + fVar341 * fVar227;
      fStack_5d4 = fVar253 * fVar255 + fVar359 * fVar267 + fVar188 * fVar312 + fVar342 * fVar303;
      fStack_5d0 = fVar230 * fVar256 + fVar351 * fVar268 + fVar167 * fVar313 + fVar334 * fVar316;
      fStack_5cc = fVar247 * fVar257 + fVar356 * fVar269 + fVar185 * fVar160 + fVar340 * fVar327;
      fStack_5c8 = fVar250 * fVar258 + fVar357 * fVar309 + fVar304 * fVar163 + fVar341 * fVar228;
      fStack_5c4 = *(float *)(bspline_basis0 + lVar128 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar128 + 0x1fb8) +
                   fVar317 + *(float *)(bspline_basis1 + lVar128 + 0x4a0);
      auVar177._0_4_ = fVar271 * fVar311 + fVar186 * fVar314 + fVar367 * fVar264 + fVar192 * fVar246
      ;
      auVar177._4_4_ = fVar282 * fVar226 + fVar187 * fVar315 + fVar370 * fVar265 + fVar204 * fVar249
      ;
      auVar177._8_4_ = fVar284 * fVar302 + fVar189 * fVar227 + fVar371 * fVar266 + fVar205 * fVar252
      ;
      auVar177._12_4_ =
           fVar286 * fVar312 + fVar190 * fVar303 + fVar372 * fVar267 + fVar206 * fVar255;
      auVar177._16_4_ =
           fVar271 * fVar313 + fVar186 * fVar316 + fVar367 * fVar268 + fVar192 * fVar256;
      auVar177._20_4_ =
           fVar282 * fVar160 + fVar187 * fVar327 + fVar370 * fVar269 + fVar204 * fVar257;
      auVar177._24_4_ =
           fVar284 * fVar163 + fVar189 * fVar228 + fVar371 * fVar309 + fVar205 * fVar258;
      auVar177._28_4_ =
           fVar317 + *(float *)(bspline_basis1 + lVar128 + 0x1c) +
           fVar317 + *(float *)(bspline_basis1 + lVar128 + 0x4a0) + fVar191;
      local_360._4_4_ =
           fVar326 * fVar265 + fVar364 * fVar226 + fVar248 * fVar315 + fVar300 * fVar249;
      local_360._0_4_ =
           fVar325 * fVar264 + fVar361 * fVar311 + fVar231 * fVar314 + fVar299 * fVar246;
      fStack_358 = fVar358 * fVar266 + fVar365 * fVar302 + fVar251 * fVar227 + fVar301 * fVar252;
      fStack_354 = fVar360 * fVar267 + fVar366 * fVar312 + fVar254 * fVar303 + fVar317 * fVar255;
      fStack_350 = fVar325 * fVar268 + fVar361 * fVar313 + fVar231 * fVar316 + fVar299 * fVar256;
      fStack_34c = fVar326 * fVar269 + fVar364 * fVar160 + fVar248 * fVar327 + fVar300 * fVar257;
      fStack_348 = fVar358 * fVar309 + fVar365 * fVar163 + fVar251 * fVar228 + fVar301 * fVar258;
      fStack_344 = fVar135 + *(float *)(bspline_basis0 + lVar128 + 0x122c);
      fVar246 = *(float *)(bspline_basis1 + lVar128 + 0x1b18);
      fVar249 = *(float *)(bspline_basis1 + lVar128 + 0x1b1c);
      fVar252 = *(float *)(bspline_basis1 + lVar128 + 0x1b20);
      fVar255 = *(float *)(bspline_basis1 + lVar128 + 0x1b24);
      fVar256 = *(float *)(bspline_basis1 + lVar128 + 0x1b28);
      fVar257 = *(float *)(bspline_basis1 + lVar128 + 0x1b2c);
      fVar258 = *(float *)(bspline_basis1 + lVar128 + 0x1b30);
      fVar264 = *(float *)(bspline_basis1 + lVar128 + 0x1f9c);
      fVar265 = *(float *)(bspline_basis1 + lVar128 + 0x1fa0);
      fVar266 = *(float *)(bspline_basis1 + lVar128 + 0x1fa4);
      fVar267 = *(float *)(bspline_basis1 + lVar128 + 0x1fa8);
      fVar268 = *(float *)(bspline_basis1 + lVar128 + 0x1fac);
      fVar269 = *(float *)(bspline_basis1 + lVar128 + 0x1fb0);
      fVar309 = *(float *)(bspline_basis1 + lVar128 + 0x1fb4);
      fVar311 = *(float *)(bspline_basis1 + lVar128 + 0x1694);
      fVar226 = *(float *)(bspline_basis1 + lVar128 + 0x1698);
      fVar302 = *(float *)(bspline_basis1 + lVar128 + 0x169c);
      fVar312 = *(float *)(bspline_basis1 + lVar128 + 0x16a0);
      fVar313 = *(float *)(bspline_basis1 + lVar128 + 0x16a4);
      fVar160 = *(float *)(bspline_basis1 + lVar128 + 0x16a8);
      fVar163 = *(float *)(bspline_basis1 + lVar128 + 0x16ac);
      fVar314 = *(float *)(bspline_basis1 + lVar128 + 0x1210);
      fVar315 = *(float *)(bspline_basis1 + lVar128 + 0x1214);
      fVar227 = *(float *)(bspline_basis1 + lVar128 + 0x1218);
      fVar303 = *(float *)(bspline_basis1 + lVar128 + 0x121c);
      fVar316 = *(float *)(bspline_basis1 + lVar128 + 0x1220);
      fVar327 = *(float *)(bspline_basis1 + lVar128 + 0x1224);
      fVar228 = *(float *)(bspline_basis1 + lVar128 + 0x1228);
      auVar296._0_4_ = fVar230 * fVar314 + fVar351 * fVar311 + fVar167 * fVar246 + fVar334 * fVar264
      ;
      auVar296._4_4_ = fVar247 * fVar315 + fVar356 * fVar226 + fVar185 * fVar249 + fVar340 * fVar265
      ;
      auVar296._8_4_ = fVar250 * fVar227 + fVar357 * fVar302 + fVar304 * fVar252 + fVar341 * fVar266
      ;
      auVar296._12_4_ =
           fVar253 * fVar303 + fVar359 * fVar312 + fVar188 * fVar255 + fVar342 * fVar267;
      auVar296._16_4_ =
           fVar230 * fVar316 + fVar351 * fVar313 + fVar167 * fVar256 + fVar334 * fVar268;
      auVar296._20_4_ =
           fVar247 * fVar327 + fVar356 * fVar160 + fVar185 * fVar257 + fVar340 * fVar269;
      auVar296._24_4_ =
           fVar250 * fVar228 + fVar357 * fVar163 + fVar304 * fVar258 + fVar341 * fVar309;
      auVar296._28_4_ = fVar286 + fVar286 + fVar135 + fVar342;
      auVar320._0_4_ = fVar192 * fVar314 + fVar367 * fVar311 + fVar271 * fVar246 + fVar186 * fVar264
      ;
      auVar320._4_4_ = fVar204 * fVar315 + fVar370 * fVar226 + fVar282 * fVar249 + fVar187 * fVar265
      ;
      auVar320._8_4_ = fVar205 * fVar227 + fVar371 * fVar302 + fVar284 * fVar252 + fVar189 * fVar266
      ;
      auVar320._12_4_ =
           fVar206 * fVar303 + fVar372 * fVar312 + fVar286 * fVar255 + fVar190 * fVar267;
      auVar320._16_4_ =
           fVar192 * fVar316 + fVar367 * fVar313 + fVar271 * fVar256 + fVar186 * fVar268;
      auVar320._20_4_ =
           fVar204 * fVar327 + fVar370 * fVar160 + fVar282 * fVar257 + fVar187 * fVar269;
      auVar320._24_4_ =
           fVar205 * fVar228 + fVar371 * fVar163 + fVar284 * fVar258 + fVar189 * fVar309;
      auVar320._28_4_ = fVar286 + fVar286 + fVar286 + fVar135;
      auVar203._0_4_ = fVar299 * fVar314 + fVar325 * fVar311 + fVar361 * fVar246 + fVar231 * fVar264
      ;
      auVar203._4_4_ = fVar300 * fVar315 + fVar326 * fVar226 + fVar364 * fVar249 + fVar248 * fVar265
      ;
      auVar203._8_4_ = fVar301 * fVar227 + fVar358 * fVar302 + fVar365 * fVar252 + fVar251 * fVar266
      ;
      auVar203._12_4_ =
           fVar317 * fVar303 + fVar360 * fVar312 + fVar366 * fVar255 + fVar254 * fVar267;
      auVar203._16_4_ =
           fVar299 * fVar316 + fVar325 * fVar313 + fVar361 * fVar256 + fVar231 * fVar268;
      auVar203._20_4_ =
           fVar300 * fVar327 + fVar326 * fVar160 + fVar364 * fVar257 + fVar248 * fVar269;
      auVar203._24_4_ =
           fVar301 * fVar228 + fVar358 * fVar163 + fVar365 * fVar258 + fVar251 * fVar309;
      auVar203._28_4_ =
           *(float *)(bspline_basis1 + lVar128 + 0x122c) +
           *(float *)(bspline_basis1 + lVar128 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar128 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar128 + 0x1fb8);
      auVar241._8_4_ = 0x7fffffff;
      auVar241._0_8_ = 0x7fffffff7fffffff;
      auVar241._12_4_ = 0x7fffffff;
      auVar241._16_4_ = 0x7fffffff;
      auVar241._20_4_ = 0x7fffffff;
      auVar241._24_4_ = 0x7fffffff;
      auVar241._28_4_ = 0x7fffffff;
      auVar117._4_4_ = fStack_5dc;
      auVar117._0_4_ = local_5e0;
      auVar117._8_4_ = fStack_5d8;
      auVar117._12_4_ = fStack_5d4;
      auVar117._16_4_ = fStack_5d0;
      auVar117._20_4_ = fStack_5cc;
      auVar117._24_4_ = fStack_5c8;
      auVar117._28_4_ = fStack_5c4;
      auVar223 = vandps_avx(auVar117,auVar241);
      auVar23 = vandps_avx(auVar177,auVar241);
      auVar23 = vmaxps_avx(auVar223,auVar23);
      auVar223 = vandps_avx(auVar241,_local_360);
      auVar223 = vmaxps_avx(auVar23,auVar223);
      auVar260 = vpermilps_avx(auVar235,0);
      auVar276._16_16_ = auVar260;
      auVar276._0_16_ = auVar260;
      auVar223 = vcmpps_avx(auVar223,auVar276,1);
      auVar26 = vblendvps_avx(auVar117,auVar24,auVar223);
      auVar27 = vblendvps_avx(auVar177,auVar25,auVar223);
      auVar223 = vandps_avx(auVar296,auVar241);
      auVar23 = vandps_avx(auVar320,auVar241);
      auVar28 = vmaxps_avx(auVar223,auVar23);
      auVar223 = vandps_avx(auVar203,auVar241);
      auVar223 = vmaxps_avx(auVar28,auVar223);
      auVar28 = vcmpps_avx(auVar223,auVar276,1);
      auVar223 = vblendvps_avx(auVar296,auVar24,auVar28);
      auVar24 = vblendvps_avx(auVar320,auVar25,auVar28);
      fVar135 = auVar26._0_4_;
      fVar152 = auVar26._4_4_;
      fVar154 = auVar26._8_4_;
      fVar156 = auVar26._12_4_;
      fVar158 = auVar26._16_4_;
      fVar165 = auVar26._20_4_;
      fVar162 = auVar26._24_4_;
      fVar208 = auVar223._0_4_;
      fVar224 = auVar223._4_4_;
      fVar225 = auVar223._8_4_;
      fVar166 = auVar223._12_4_;
      fVar168 = auVar223._16_4_;
      fVar167 = auVar223._20_4_;
      fVar185 = auVar223._24_4_;
      fVar304 = -auVar223._28_4_;
      fVar246 = auVar27._0_4_;
      fVar256 = auVar27._4_4_;
      fVar265 = auVar27._8_4_;
      fVar269 = auVar27._12_4_;
      fVar302 = auVar27._16_4_;
      fVar163 = auVar27._20_4_;
      fVar303 = auVar27._24_4_;
      auVar140._0_4_ = fVar246 * fVar246 + fVar135 * fVar135;
      auVar140._4_4_ = fVar256 * fVar256 + fVar152 * fVar152;
      auVar140._8_4_ = fVar265 * fVar265 + fVar154 * fVar154;
      auVar140._12_4_ = fVar269 * fVar269 + fVar156 * fVar156;
      auVar140._16_4_ = fVar302 * fVar302 + fVar158 * fVar158;
      auVar140._20_4_ = fVar163 * fVar163 + fVar165 * fVar165;
      auVar140._24_4_ = fVar303 * fVar303 + fVar162 * fVar162;
      auVar140._28_4_ = auVar320._28_4_ + auVar26._28_4_;
      auVar25 = vrsqrtps_avx(auVar140);
      fVar249 = auVar25._0_4_;
      fVar252 = auVar25._4_4_;
      auVar35._4_4_ = fVar252 * 1.5;
      auVar35._0_4_ = fVar249 * 1.5;
      fVar255 = auVar25._8_4_;
      auVar35._8_4_ = fVar255 * 1.5;
      fVar257 = auVar25._12_4_;
      auVar35._12_4_ = fVar257 * 1.5;
      fVar258 = auVar25._16_4_;
      auVar35._16_4_ = fVar258 * 1.5;
      fVar264 = auVar25._20_4_;
      auVar35._20_4_ = fVar264 * 1.5;
      fVar266 = auVar25._24_4_;
      fVar191 = auVar23._28_4_;
      auVar35._24_4_ = fVar266 * 1.5;
      auVar35._28_4_ = fVar191;
      auVar36._4_4_ = fVar252 * fVar252 * fVar252 * auVar140._4_4_ * 0.5;
      auVar36._0_4_ = fVar249 * fVar249 * fVar249 * auVar140._0_4_ * 0.5;
      auVar36._8_4_ = fVar255 * fVar255 * fVar255 * auVar140._8_4_ * 0.5;
      auVar36._12_4_ = fVar257 * fVar257 * fVar257 * auVar140._12_4_ * 0.5;
      auVar36._16_4_ = fVar258 * fVar258 * fVar258 * auVar140._16_4_ * 0.5;
      auVar36._20_4_ = fVar264 * fVar264 * fVar264 * auVar140._20_4_ * 0.5;
      auVar36._24_4_ = fVar266 * fVar266 * fVar266 * auVar140._24_4_ * 0.5;
      auVar36._28_4_ = auVar140._28_4_;
      auVar23 = vsubps_avx(auVar35,auVar36);
      fVar249 = auVar23._0_4_;
      fVar257 = auVar23._4_4_;
      fVar266 = auVar23._8_4_;
      fVar309 = auVar23._12_4_;
      fVar312 = auVar23._16_4_;
      fVar314 = auVar23._20_4_;
      fVar316 = auVar23._24_4_;
      fVar252 = auVar24._0_4_;
      fVar258 = auVar24._4_4_;
      fVar267 = auVar24._8_4_;
      fVar311 = auVar24._12_4_;
      fVar313 = auVar24._16_4_;
      fVar315 = auVar24._20_4_;
      fVar327 = auVar24._24_4_;
      auVar141._0_4_ = fVar252 * fVar252 + fVar208 * fVar208;
      auVar141._4_4_ = fVar258 * fVar258 + fVar224 * fVar224;
      auVar141._8_4_ = fVar267 * fVar267 + fVar225 * fVar225;
      auVar141._12_4_ = fVar311 * fVar311 + fVar166 * fVar166;
      auVar141._16_4_ = fVar313 * fVar313 + fVar168 * fVar168;
      auVar141._20_4_ = fVar315 * fVar315 + fVar167 * fVar167;
      auVar141._24_4_ = fVar327 * fVar327 + fVar185 * fVar185;
      auVar141._28_4_ = auVar223._28_4_ + auVar23._28_4_;
      auVar223 = vrsqrtps_avx(auVar141);
      fVar255 = auVar223._0_4_;
      fVar264 = auVar223._4_4_;
      auVar37._4_4_ = fVar264 * 1.5;
      auVar37._0_4_ = fVar255 * 1.5;
      fVar268 = auVar223._8_4_;
      auVar37._8_4_ = fVar268 * 1.5;
      fVar226 = auVar223._12_4_;
      auVar37._12_4_ = fVar226 * 1.5;
      fVar160 = auVar223._16_4_;
      auVar37._16_4_ = fVar160 * 1.5;
      fVar227 = auVar223._20_4_;
      auVar37._20_4_ = fVar227 * 1.5;
      fVar228 = auVar223._24_4_;
      auVar37._24_4_ = fVar228 * 1.5;
      auVar37._28_4_ = fVar191;
      auVar38._4_4_ = fVar264 * fVar264 * fVar264 * auVar141._4_4_ * 0.5;
      auVar38._0_4_ = fVar255 * fVar255 * fVar255 * auVar141._0_4_ * 0.5;
      auVar38._8_4_ = fVar268 * fVar268 * fVar268 * auVar141._8_4_ * 0.5;
      auVar38._12_4_ = fVar226 * fVar226 * fVar226 * auVar141._12_4_ * 0.5;
      auVar38._16_4_ = fVar160 * fVar160 * fVar160 * auVar141._16_4_ * 0.5;
      auVar38._20_4_ = fVar227 * fVar227 * fVar227 * auVar141._20_4_ * 0.5;
      auVar38._24_4_ = fVar228 * fVar228 * fVar228 * auVar141._24_4_ * 0.5;
      auVar38._28_4_ = auVar141._28_4_;
      auVar223 = vsubps_avx(auVar37,auVar38);
      fVar255 = auVar223._0_4_;
      fVar264 = auVar223._4_4_;
      fVar268 = auVar223._8_4_;
      fVar226 = auVar223._12_4_;
      fVar160 = auVar223._16_4_;
      fVar227 = auVar223._20_4_;
      fVar228 = auVar223._24_4_;
      fVar246 = fVar134 * fVar246 * fVar249;
      fVar256 = fVar151 * fVar256 * fVar257;
      auVar39._4_4_ = fVar256;
      auVar39._0_4_ = fVar246;
      fVar265 = fVar153 * fVar265 * fVar266;
      auVar39._8_4_ = fVar265;
      fVar269 = fVar155 * fVar269 * fVar309;
      auVar39._12_4_ = fVar269;
      fVar302 = fVar157 * fVar302 * fVar312;
      auVar39._16_4_ = fVar302;
      fVar163 = fVar159 * fVar163 * fVar314;
      auVar39._20_4_ = fVar163;
      fVar303 = fVar161 * fVar303 * fVar316;
      auVar39._24_4_ = fVar303;
      auVar39._28_4_ = fVar304;
      local_760._4_4_ = auVar343._4_4_ + fVar256;
      local_760._0_4_ = auVar343._0_4_ + fVar246;
      fStack_758 = auVar343._8_4_ + fVar265;
      fStack_754 = auVar343._12_4_ + fVar269;
      fStack_750 = auVar345._16_4_ + fVar302;
      fStack_74c = auVar345._20_4_ + fVar163;
      fStack_748 = auVar345._24_4_ + fVar303;
      fStack_744 = auVar345._28_4_ + fVar304;
      fVar246 = fVar134 * fVar249 * -fVar135;
      fVar256 = fVar151 * fVar257 * -fVar152;
      auVar40._4_4_ = fVar256;
      auVar40._0_4_ = fVar246;
      fVar265 = fVar153 * fVar266 * -fVar154;
      auVar40._8_4_ = fVar265;
      fVar269 = fVar155 * fVar309 * -fVar156;
      auVar40._12_4_ = fVar269;
      fVar302 = fVar157 * fVar312 * -fVar158;
      auVar40._16_4_ = fVar302;
      fVar163 = fVar159 * fVar314 * -fVar165;
      auVar40._20_4_ = fVar163;
      fVar303 = fVar161 * fVar316 * -fVar162;
      auVar40._24_4_ = fVar303;
      auVar40._28_4_ = fVar191;
      local_6a0._4_4_ = fVar256 + auVar306._4_4_;
      local_6a0._0_4_ = fVar246 + auVar306._0_4_;
      fStack_698 = fVar265 + auVar306._8_4_;
      fStack_694 = fVar269 + auVar306._12_4_;
      fStack_690 = fVar302 + auVar306._16_4_;
      fStack_68c = fVar163 + auVar306._20_4_;
      fStack_688 = fVar303 + auVar306._24_4_;
      fStack_684 = fVar191 + auVar306._28_4_;
      fVar246 = fVar134 * fVar249 * 0.0;
      fVar249 = fVar151 * fVar257 * 0.0;
      auVar41._4_4_ = fVar249;
      auVar41._0_4_ = fVar246;
      fVar256 = fVar153 * fVar266 * 0.0;
      auVar41._8_4_ = fVar256;
      fVar257 = fVar155 * fVar309 * 0.0;
      auVar41._12_4_ = fVar257;
      fVar265 = fVar157 * fVar312 * 0.0;
      auVar41._16_4_ = fVar265;
      fVar266 = fVar159 * fVar314 * 0.0;
      auVar41._20_4_ = fVar266;
      fVar269 = fVar161 * fVar316 * 0.0;
      auVar41._24_4_ = fVar269;
      auVar41._28_4_ = fVar359;
      auVar277._0_4_ = (float)local_4e0._0_4_ + fVar246;
      auVar277._4_4_ = (float)local_4e0._4_4_ + fVar249;
      auVar277._8_4_ = fStack_4d8 + fVar256;
      auVar277._12_4_ = fStack_4d4 + fVar257;
      auVar277._16_4_ = fStack_4d0 + fVar265;
      auVar277._20_4_ = fStack_4cc + fVar266;
      auVar277._24_4_ = fStack_4c8 + fVar269;
      auVar277._28_4_ = fStack_4c4 + fVar359;
      fVar246 = (float)local_6c0._0_4_ * fVar252 * fVar255;
      fVar249 = local_6c0._4_4_ * fVar258 * fVar264;
      auVar42._4_4_ = fVar249;
      auVar42._0_4_ = fVar246;
      fVar252 = local_6c0._8_4_ * fVar267 * fVar268;
      auVar42._8_4_ = fVar252;
      fVar256 = local_6c0._12_4_ * fVar311 * fVar226;
      auVar42._12_4_ = fVar256;
      fVar257 = local_6c0._16_4_ * fVar313 * fVar160;
      auVar42._16_4_ = fVar257;
      fVar258 = local_6c0._20_4_ * fVar315 * fVar227;
      auVar42._20_4_ = fVar258;
      fVar265 = local_6c0._24_4_ * fVar327 * fVar228;
      auVar42._24_4_ = fVar265;
      auVar42._28_4_ = auVar24._28_4_;
      auVar28 = vsubps_avx(auVar345,auVar39);
      auVar321._0_4_ = auVar240._0_4_ + fVar246;
      auVar321._4_4_ = auVar240._4_4_ + fVar249;
      auVar321._8_4_ = auVar240._8_4_ + fVar252;
      auVar321._12_4_ = auVar240._12_4_ + fVar256;
      auVar321._16_4_ = auVar240._16_4_ + fVar257;
      auVar321._20_4_ = auVar240._20_4_ + fVar258;
      auVar321._24_4_ = auVar240._24_4_ + fVar265;
      auVar321._28_4_ = auVar240._28_4_ + auVar24._28_4_;
      fVar246 = (float)local_6c0._0_4_ * fVar255 * -fVar208;
      fVar249 = local_6c0._4_4_ * fVar264 * -fVar224;
      auVar43._4_4_ = fVar249;
      auVar43._0_4_ = fVar246;
      fVar252 = local_6c0._8_4_ * fVar268 * -fVar225;
      auVar43._8_4_ = fVar252;
      fVar256 = local_6c0._12_4_ * fVar226 * -fVar166;
      auVar43._12_4_ = fVar256;
      fVar257 = local_6c0._16_4_ * fVar160 * -fVar168;
      auVar43._16_4_ = fVar257;
      fVar258 = local_6c0._20_4_ * fVar227 * -fVar167;
      auVar43._20_4_ = fVar258;
      fVar265 = local_6c0._24_4_ * fVar228 * -fVar185;
      auVar43._24_4_ = fVar265;
      auVar43._28_4_ = fVar360;
      auVar29 = vsubps_avx(auVar306,auVar40);
      auVar330._0_4_ = fVar246 + auVar216._0_4_;
      auVar330._4_4_ = fVar249 + auVar216._4_4_;
      auVar330._8_4_ = fVar252 + auVar216._8_4_;
      auVar330._12_4_ = fVar256 + auVar216._12_4_;
      auVar330._16_4_ = fVar257 + auVar216._16_4_;
      auVar330._20_4_ = fVar258 + auVar216._20_4_;
      auVar330._24_4_ = fVar265 + auVar216._24_4_;
      auVar330._28_4_ = fVar360 + auVar216._28_4_;
      fVar246 = (float)local_6c0._0_4_ * fVar255 * 0.0;
      fVar249 = local_6c0._4_4_ * fVar264 * 0.0;
      auVar44._4_4_ = fVar249;
      auVar44._0_4_ = fVar246;
      fVar252 = local_6c0._8_4_ * fVar268 * 0.0;
      auVar44._8_4_ = fVar252;
      fVar255 = local_6c0._12_4_ * fVar226 * 0.0;
      auVar44._12_4_ = fVar255;
      fVar256 = local_6c0._16_4_ * fVar160 * 0.0;
      auVar44._16_4_ = fVar256;
      fVar257 = local_6c0._20_4_ * fVar227 * 0.0;
      auVar44._20_4_ = fVar257;
      fVar258 = local_6c0._24_4_ * fVar228 * 0.0;
      auVar44._24_4_ = fVar258;
      auVar44._28_4_ = 0x3f000000;
      auVar30 = vsubps_avx(_local_4e0,auVar41);
      auVar363._0_4_ = fVar246 + (float)local_340._0_4_;
      auVar363._4_4_ = fVar249 + (float)local_340._4_4_;
      auVar363._8_4_ = fVar252 + fStack_338;
      auVar363._12_4_ = fVar255 + fStack_334;
      auVar363._16_4_ = fVar256 + fStack_330;
      auVar363._20_4_ = fVar257 + fStack_32c;
      auVar363._24_4_ = fVar258 + fStack_328;
      auVar363._28_4_ = fStack_324 + 0.5;
      auVar223 = vsubps_avx(auVar240,auVar42);
      auVar23 = vsubps_avx(auVar216,auVar43);
      auVar138 = vsubps_avx(_local_340,auVar44);
      auVar24 = vsubps_avx(auVar330,auVar29);
      auVar25 = vsubps_avx(auVar363,auVar30);
      auVar45._4_4_ = auVar30._4_4_ * auVar24._4_4_;
      auVar45._0_4_ = auVar30._0_4_ * auVar24._0_4_;
      auVar45._8_4_ = auVar30._8_4_ * auVar24._8_4_;
      auVar45._12_4_ = auVar30._12_4_ * auVar24._12_4_;
      auVar45._16_4_ = auVar30._16_4_ * auVar24._16_4_;
      auVar45._20_4_ = auVar30._20_4_ * auVar24._20_4_;
      auVar45._24_4_ = auVar30._24_4_ * auVar24._24_4_;
      auVar45._28_4_ = fVar317;
      auVar46._4_4_ = auVar29._4_4_ * auVar25._4_4_;
      auVar46._0_4_ = auVar29._0_4_ * auVar25._0_4_;
      auVar46._8_4_ = auVar29._8_4_ * auVar25._8_4_;
      auVar46._12_4_ = auVar29._12_4_ * auVar25._12_4_;
      auVar46._16_4_ = auVar29._16_4_ * auVar25._16_4_;
      auVar46._20_4_ = auVar29._20_4_ * auVar25._20_4_;
      auVar46._24_4_ = auVar29._24_4_ * auVar25._24_4_;
      auVar46._28_4_ = fStack_324;
      auVar26 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = auVar28._4_4_ * auVar25._4_4_;
      auVar47._0_4_ = auVar28._0_4_ * auVar25._0_4_;
      auVar47._8_4_ = auVar28._8_4_ * auVar25._8_4_;
      auVar47._12_4_ = auVar28._12_4_ * auVar25._12_4_;
      auVar47._16_4_ = auVar28._16_4_ * auVar25._16_4_;
      auVar47._20_4_ = auVar28._20_4_ * auVar25._20_4_;
      auVar47._24_4_ = auVar28._24_4_ * auVar25._24_4_;
      auVar47._28_4_ = auVar25._28_4_;
      auVar27 = vsubps_avx(auVar321,auVar28);
      auVar48._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar48._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar48._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar48._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar48._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar48._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar48._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar48._28_4_ = auVar216._28_4_;
      auVar22 = vsubps_avx(auVar48,auVar47);
      auVar49._4_4_ = auVar27._4_4_ * auVar29._4_4_;
      auVar49._0_4_ = auVar27._0_4_ * auVar29._0_4_;
      auVar49._8_4_ = auVar27._8_4_ * auVar29._8_4_;
      auVar49._12_4_ = auVar27._12_4_ * auVar29._12_4_;
      auVar49._16_4_ = auVar27._16_4_ * auVar29._16_4_;
      auVar49._20_4_ = auVar27._20_4_ * auVar29._20_4_;
      auVar49._24_4_ = auVar27._24_4_ * auVar29._24_4_;
      auVar49._28_4_ = auVar25._28_4_;
      auVar50._4_4_ = auVar28._4_4_ * auVar24._4_4_;
      auVar50._0_4_ = auVar28._0_4_ * auVar24._0_4_;
      auVar50._8_4_ = auVar28._8_4_ * auVar24._8_4_;
      auVar50._12_4_ = auVar28._12_4_ * auVar24._12_4_;
      auVar50._16_4_ = auVar28._16_4_ * auVar24._16_4_;
      auVar50._20_4_ = auVar28._20_4_ * auVar24._20_4_;
      auVar50._24_4_ = auVar28._24_4_ * auVar24._24_4_;
      auVar50._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar50,auVar49);
      auVar142._0_4_ = auVar26._0_4_ * 0.0 + auVar24._0_4_ + auVar22._0_4_ * 0.0;
      auVar142._4_4_ = auVar26._4_4_ * 0.0 + auVar24._4_4_ + auVar22._4_4_ * 0.0;
      auVar142._8_4_ = auVar26._8_4_ * 0.0 + auVar24._8_4_ + auVar22._8_4_ * 0.0;
      auVar142._12_4_ = auVar26._12_4_ * 0.0 + auVar24._12_4_ + auVar22._12_4_ * 0.0;
      auVar142._16_4_ = auVar26._16_4_ * 0.0 + auVar24._16_4_ + auVar22._16_4_ * 0.0;
      auVar142._20_4_ = auVar26._20_4_ * 0.0 + auVar24._20_4_ + auVar22._20_4_ * 0.0;
      auVar142._24_4_ = auVar26._24_4_ * 0.0 + auVar24._24_4_ + auVar22._24_4_ * 0.0;
      auVar142._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar22._28_4_;
      auVar22 = vcmpps_avx(auVar142,ZEXT432(0) << 0x20,2);
      auVar223 = vblendvps_avx(auVar223,_local_760,auVar22);
      auVar23 = vblendvps_avx(auVar23,_local_6a0,auVar22);
      auVar24 = vblendvps_avx(auVar138,auVar277,auVar22);
      auVar25 = vblendvps_avx(auVar28,auVar321,auVar22);
      auVar26 = vblendvps_avx(auVar29,auVar330,auVar22);
      auVar27 = vblendvps_avx(auVar30,auVar363,auVar22);
      auVar28 = vblendvps_avx(auVar321,auVar28,auVar22);
      auVar29 = vblendvps_avx(auVar330,auVar29,auVar22);
      auVar260 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
      auStack_6d0 = auVar345._16_16_;
      auVar30 = vblendvps_avx(auVar363,auVar30,auVar22);
      auVar28 = vsubps_avx(auVar28,auVar223);
      auVar139 = vsubps_avx(auVar29,auVar23);
      auVar30 = vsubps_avx(auVar30,auVar24);
      auVar173 = vsubps_avx(auVar23,auVar26);
      fVar246 = auVar139._0_4_;
      fVar162 = auVar24._0_4_;
      fVar257 = auVar139._4_4_;
      fVar208 = auVar24._4_4_;
      auVar51._4_4_ = fVar208 * fVar257;
      auVar51._0_4_ = fVar162 * fVar246;
      fVar267 = auVar139._8_4_;
      fVar224 = auVar24._8_4_;
      auVar51._8_4_ = fVar224 * fVar267;
      fVar226 = auVar139._12_4_;
      fVar225 = auVar24._12_4_;
      auVar51._12_4_ = fVar225 * fVar226;
      fVar163 = auVar139._16_4_;
      fVar166 = auVar24._16_4_;
      auVar51._16_4_ = fVar166 * fVar163;
      fVar316 = auVar139._20_4_;
      fVar168 = auVar24._20_4_;
      auVar51._20_4_ = fVar168 * fVar316;
      fVar152 = auVar139._24_4_;
      fVar167 = auVar24._24_4_;
      auVar51._24_4_ = fVar167 * fVar152;
      auVar51._28_4_ = auVar29._28_4_;
      fVar249 = auVar23._0_4_;
      fVar231 = auVar30._0_4_;
      fVar258 = auVar23._4_4_;
      fVar248 = auVar30._4_4_;
      auVar52._4_4_ = fVar248 * fVar258;
      auVar52._0_4_ = fVar231 * fVar249;
      fVar268 = auVar23._8_4_;
      fVar251 = auVar30._8_4_;
      auVar52._8_4_ = fVar251 * fVar268;
      fVar302 = auVar23._12_4_;
      fVar271 = auVar30._12_4_;
      auVar52._12_4_ = fVar271 * fVar302;
      fVar314 = auVar23._16_4_;
      fVar282 = auVar30._16_4_;
      auVar52._16_4_ = fVar282 * fVar314;
      fVar327 = auVar23._20_4_;
      fVar284 = auVar30._20_4_;
      auVar52._20_4_ = fVar284 * fVar327;
      fVar154 = auVar23._24_4_;
      fVar286 = auVar30._24_4_;
      uVar7 = auVar138._28_4_;
      auVar52._24_4_ = fVar286 * fVar154;
      auVar52._28_4_ = uVar7;
      auVar29 = vsubps_avx(auVar52,auVar51);
      fVar252 = auVar223._0_4_;
      fVar264 = auVar223._4_4_;
      auVar53._4_4_ = fVar248 * fVar264;
      auVar53._0_4_ = fVar231 * fVar252;
      fVar269 = auVar223._8_4_;
      auVar53._8_4_ = fVar251 * fVar269;
      fVar312 = auVar223._12_4_;
      auVar53._12_4_ = fVar271 * fVar312;
      fVar315 = auVar223._16_4_;
      auVar53._16_4_ = fVar282 * fVar315;
      fVar228 = auVar223._20_4_;
      auVar53._20_4_ = fVar284 * fVar228;
      fVar156 = auVar223._24_4_;
      auVar53._24_4_ = fVar286 * fVar156;
      auVar53._28_4_ = uVar7;
      fVar255 = auVar28._0_4_;
      fVar265 = auVar28._4_4_;
      auVar54._4_4_ = fVar208 * fVar265;
      auVar54._0_4_ = fVar162 * fVar255;
      fVar309 = auVar28._8_4_;
      auVar54._8_4_ = fVar224 * fVar309;
      fVar313 = auVar28._12_4_;
      auVar54._12_4_ = fVar225 * fVar313;
      fVar227 = auVar28._16_4_;
      auVar54._16_4_ = fVar166 * fVar227;
      fVar191 = auVar28._20_4_;
      auVar54._20_4_ = fVar168 * fVar191;
      fVar158 = auVar28._24_4_;
      auVar54._24_4_ = fVar167 * fVar158;
      auVar54._28_4_ = auVar363._28_4_;
      auVar138 = vsubps_avx(auVar54,auVar53);
      auVar55._4_4_ = fVar258 * fVar265;
      auVar55._0_4_ = fVar249 * fVar255;
      auVar55._8_4_ = fVar268 * fVar309;
      auVar55._12_4_ = fVar302 * fVar313;
      auVar55._16_4_ = fVar314 * fVar227;
      auVar55._20_4_ = fVar327 * fVar191;
      auVar55._24_4_ = fVar154 * fVar158;
      auVar55._28_4_ = uVar7;
      auVar368._0_4_ = fVar252 * fVar246;
      auVar368._4_4_ = fVar264 * fVar257;
      auVar368._8_4_ = fVar269 * fVar267;
      auVar368._12_4_ = fVar312 * fVar226;
      auVar368._16_4_ = fVar315 * fVar163;
      auVar368._20_4_ = fVar228 * fVar316;
      auVar368._24_4_ = fVar156 * fVar152;
      auVar368._28_4_ = 0;
      auVar174 = vsubps_avx(auVar368,auVar55);
      auVar175 = vsubps_avx(auVar24,auVar27);
      fVar256 = auVar174._28_4_ + auVar138._28_4_;
      auVar178._0_4_ = auVar174._0_4_ + auVar138._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
      auVar178._4_4_ = auVar174._4_4_ + auVar138._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
      auVar178._8_4_ = auVar174._8_4_ + auVar138._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
      auVar178._12_4_ = auVar174._12_4_ + auVar138._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
      auVar178._16_4_ = auVar174._16_4_ + auVar138._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
      auVar178._20_4_ = auVar174._20_4_ + auVar138._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
      auVar178._24_4_ = auVar174._24_4_ + auVar138._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
      auVar178._28_4_ = fVar256 + auVar29._28_4_;
      fVar185 = auVar173._0_4_;
      fVar304 = auVar173._4_4_;
      auVar56._4_4_ = fVar304 * auVar27._4_4_;
      auVar56._0_4_ = fVar185 * auVar27._0_4_;
      fVar188 = auVar173._8_4_;
      auVar56._8_4_ = fVar188 * auVar27._8_4_;
      fVar230 = auVar173._12_4_;
      auVar56._12_4_ = fVar230 * auVar27._12_4_;
      fVar247 = auVar173._16_4_;
      auVar56._16_4_ = fVar247 * auVar27._16_4_;
      fVar250 = auVar173._20_4_;
      auVar56._20_4_ = fVar250 * auVar27._20_4_;
      fVar253 = auVar173._24_4_;
      auVar56._24_4_ = fVar253 * auVar27._24_4_;
      auVar56._28_4_ = fVar256;
      fVar256 = auVar175._0_4_;
      fVar266 = auVar175._4_4_;
      auVar57._4_4_ = auVar26._4_4_ * fVar266;
      auVar57._0_4_ = auVar26._0_4_ * fVar256;
      fVar311 = auVar175._8_4_;
      auVar57._8_4_ = auVar26._8_4_ * fVar311;
      fVar160 = auVar175._12_4_;
      auVar57._12_4_ = auVar26._12_4_ * fVar160;
      fVar303 = auVar175._16_4_;
      auVar57._16_4_ = auVar26._16_4_ * fVar303;
      fVar135 = auVar175._20_4_;
      auVar57._20_4_ = auVar26._20_4_ * fVar135;
      fVar165 = auVar175._24_4_;
      auVar57._24_4_ = auVar26._24_4_ * fVar165;
      auVar57._28_4_ = auVar174._28_4_;
      auVar138 = vsubps_avx(auVar57,auVar56);
      auVar173 = vsubps_avx(auVar223,auVar25);
      fVar254 = auVar173._0_4_;
      fVar299 = auVar173._4_4_;
      auVar58._4_4_ = fVar299 * auVar27._4_4_;
      auVar58._0_4_ = fVar254 * auVar27._0_4_;
      fVar300 = auVar173._8_4_;
      auVar58._8_4_ = fVar300 * auVar27._8_4_;
      fVar301 = auVar173._12_4_;
      auVar58._12_4_ = fVar301 * auVar27._12_4_;
      fVar317 = auVar173._16_4_;
      auVar58._16_4_ = fVar317 * auVar27._16_4_;
      fVar325 = auVar173._20_4_;
      auVar58._20_4_ = fVar325 * auVar27._20_4_;
      fVar326 = auVar173._24_4_;
      auVar58._24_4_ = fVar326 * auVar27._24_4_;
      auVar58._28_4_ = auVar27._28_4_;
      auVar59._4_4_ = auVar25._4_4_ * fVar266;
      auVar59._0_4_ = auVar25._0_4_ * fVar256;
      auVar59._8_4_ = auVar25._8_4_ * fVar311;
      auVar59._12_4_ = auVar25._12_4_ * fVar160;
      auVar59._16_4_ = auVar25._16_4_ * fVar303;
      auVar59._20_4_ = auVar25._20_4_ * fVar135;
      auVar59._24_4_ = auVar25._24_4_ * fVar165;
      auVar59._28_4_ = auVar29._28_4_;
      auVar29 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = auVar26._4_4_ * fVar299;
      auVar60._0_4_ = auVar26._0_4_ * fVar254;
      auVar60._8_4_ = auVar26._8_4_ * fVar300;
      auVar60._12_4_ = auVar26._12_4_ * fVar301;
      auVar60._16_4_ = auVar26._16_4_ * fVar317;
      auVar60._20_4_ = auVar26._20_4_ * fVar325;
      auVar60._24_4_ = auVar26._24_4_ * fVar326;
      auVar60._28_4_ = auVar27._28_4_;
      auVar61._4_4_ = auVar25._4_4_ * fVar304;
      auVar61._0_4_ = auVar25._0_4_ * fVar185;
      auVar61._8_4_ = auVar25._8_4_ * fVar188;
      auVar61._12_4_ = auVar25._12_4_ * fVar230;
      auVar61._16_4_ = auVar25._16_4_ * fVar247;
      auVar61._20_4_ = auVar25._20_4_ * fVar250;
      auVar61._24_4_ = auVar25._24_4_ * fVar253;
      auVar61._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar61,auVar60);
      auVar242._0_4_ = auVar138._0_4_ * 0.0 + auVar25._0_4_ + auVar29._0_4_ * 0.0;
      auVar242._4_4_ = auVar138._4_4_ * 0.0 + auVar25._4_4_ + auVar29._4_4_ * 0.0;
      auVar242._8_4_ = auVar138._8_4_ * 0.0 + auVar25._8_4_ + auVar29._8_4_ * 0.0;
      auVar242._12_4_ = auVar138._12_4_ * 0.0 + auVar25._12_4_ + auVar29._12_4_ * 0.0;
      auVar242._16_4_ = auVar138._16_4_ * 0.0 + auVar25._16_4_ + auVar29._16_4_ * 0.0;
      auVar242._20_4_ = auVar138._20_4_ * 0.0 + auVar25._20_4_ + auVar29._20_4_ * 0.0;
      auVar242._24_4_ = auVar138._24_4_ * 0.0 + auVar25._24_4_ + auVar29._24_4_ * 0.0;
      auVar242._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar29._28_4_;
      auVar245 = ZEXT3264(auVar242);
      auVar25 = vmaxps_avx(auVar178,auVar242);
      auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
      auVar197 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
      auVar260 = vpand_avx(auVar197,auVar260);
      auVar197 = vpmovsxwd_avx(auVar260);
      auVar207 = vpunpckhwd_avx(auVar260,auVar260);
      auVar218._16_16_ = auVar207;
      auVar218._0_16_ = auVar197;
      if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar218 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar218 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar218 >> 0x7f,0) == '\0') &&
            (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar207 >> 0x3f,0) == '\0') &&
          (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar207[0xf]
         ) {
LAB_009b929a:
        auVar184 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                      CONCAT816(local_5a0[1]._16_8_,
                                                CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))));
        auVar333 = ZEXT3264(auVar144);
        auVar337._4_4_ = fVar151;
        auVar337._0_4_ = fVar134;
        auVar337._8_4_ = fVar153;
        auVar337._12_4_ = fVar155;
        auVar337._16_4_ = fVar157;
        auVar337._20_4_ = fVar159;
        auVar337._24_4_ = fVar161;
        auVar337._28_4_ = fVar164;
      }
      else {
        auVar62._4_4_ = fVar266 * fVar257;
        auVar62._0_4_ = fVar256 * fVar246;
        auVar62._8_4_ = fVar311 * fVar267;
        auVar62._12_4_ = fVar160 * fVar226;
        auVar62._16_4_ = fVar303 * fVar163;
        auVar62._20_4_ = fVar135 * fVar316;
        auVar62._24_4_ = fVar165 * fVar152;
        auVar62._28_4_ = auVar207._12_4_;
        auVar346._0_4_ = fVar185 * fVar231;
        auVar346._4_4_ = fVar304 * fVar248;
        auVar346._8_4_ = fVar188 * fVar251;
        auVar346._12_4_ = fVar230 * fVar271;
        auVar346._16_4_ = fVar247 * fVar282;
        auVar346._20_4_ = fVar250 * fVar284;
        auVar346._24_4_ = fVar253 * fVar286;
        auVar346._28_4_ = 0;
        auVar25 = vsubps_avx(auVar346,auVar62);
        auVar63._4_4_ = fVar299 * fVar248;
        auVar63._0_4_ = fVar254 * fVar231;
        auVar63._8_4_ = fVar300 * fVar251;
        auVar63._12_4_ = fVar301 * fVar271;
        auVar63._16_4_ = fVar317 * fVar282;
        auVar63._20_4_ = fVar325 * fVar284;
        auVar63._24_4_ = fVar326 * fVar286;
        auVar63._28_4_ = auVar30._28_4_;
        auVar64._4_4_ = fVar266 * fVar265;
        auVar64._0_4_ = fVar256 * fVar255;
        auVar64._8_4_ = fVar311 * fVar309;
        auVar64._12_4_ = fVar160 * fVar313;
        auVar64._16_4_ = fVar303 * fVar227;
        auVar64._20_4_ = fVar135 * fVar191;
        auVar64._24_4_ = fVar165 * fVar158;
        auVar64._28_4_ = auVar175._28_4_;
        auVar27 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = fVar304 * fVar265;
        auVar65._0_4_ = fVar185 * fVar255;
        auVar65._8_4_ = fVar188 * fVar309;
        auVar65._12_4_ = fVar230 * fVar313;
        auVar65._16_4_ = fVar247 * fVar227;
        auVar65._20_4_ = fVar250 * fVar191;
        auVar65._24_4_ = fVar253 * fVar158;
        auVar65._28_4_ = auVar178._28_4_;
        auVar66._4_4_ = fVar299 * fVar257;
        auVar66._0_4_ = fVar254 * fVar246;
        auVar66._8_4_ = fVar300 * fVar267;
        auVar66._12_4_ = fVar301 * fVar226;
        auVar66._16_4_ = fVar317 * fVar163;
        auVar66._20_4_ = fVar325 * fVar316;
        auVar66._24_4_ = fVar326 * fVar152;
        auVar66._28_4_ = auVar139._28_4_;
        auVar29 = vsubps_avx(auVar66,auVar65);
        auVar297._0_4_ = auVar25._0_4_ * 0.0 + auVar29._0_4_ + auVar27._0_4_ * 0.0;
        auVar297._4_4_ = auVar25._4_4_ * 0.0 + auVar29._4_4_ + auVar27._4_4_ * 0.0;
        auVar297._8_4_ = auVar25._8_4_ * 0.0 + auVar29._8_4_ + auVar27._8_4_ * 0.0;
        auVar297._12_4_ = auVar25._12_4_ * 0.0 + auVar29._12_4_ + auVar27._12_4_ * 0.0;
        auVar297._16_4_ = auVar25._16_4_ * 0.0 + auVar29._16_4_ + auVar27._16_4_ * 0.0;
        auVar297._20_4_ = auVar25._20_4_ * 0.0 + auVar29._20_4_ + auVar27._20_4_ * 0.0;
        auVar297._24_4_ = auVar25._24_4_ * 0.0 + auVar29._24_4_ + auVar27._24_4_ * 0.0;
        auVar297._28_4_ = auVar139._28_4_ + auVar29._28_4_ + auVar178._28_4_;
        auVar26 = vrcpps_avx(auVar297);
        fVar246 = auVar26._0_4_;
        fVar255 = auVar26._4_4_;
        auVar67._4_4_ = auVar297._4_4_ * fVar255;
        auVar67._0_4_ = auVar297._0_4_ * fVar246;
        fVar256 = auVar26._8_4_;
        auVar67._8_4_ = auVar297._8_4_ * fVar256;
        fVar257 = auVar26._12_4_;
        auVar67._12_4_ = auVar297._12_4_ * fVar257;
        fVar265 = auVar26._16_4_;
        auVar67._16_4_ = auVar297._16_4_ * fVar265;
        fVar266 = auVar26._20_4_;
        auVar67._20_4_ = auVar297._20_4_ * fVar266;
        fVar267 = auVar26._24_4_;
        auVar67._24_4_ = auVar297._24_4_ * fVar267;
        auVar67._28_4_ = auVar175._28_4_;
        auVar347._8_4_ = 0x3f800000;
        auVar347._0_8_ = 0x3f8000003f800000;
        auVar347._12_4_ = 0x3f800000;
        auVar347._16_4_ = 0x3f800000;
        auVar347._20_4_ = 0x3f800000;
        auVar347._24_4_ = 0x3f800000;
        auVar347._28_4_ = 0x3f800000;
        auVar30 = vsubps_avx(auVar347,auVar67);
        fVar246 = auVar30._0_4_ * fVar246 + fVar246;
        fVar255 = auVar30._4_4_ * fVar255 + fVar255;
        fVar256 = auVar30._8_4_ * fVar256 + fVar256;
        fVar257 = auVar30._12_4_ * fVar257 + fVar257;
        fVar265 = auVar30._16_4_ * fVar265 + fVar265;
        fVar266 = auVar30._20_4_ * fVar266 + fVar266;
        fVar267 = auVar30._24_4_ * fVar267 + fVar267;
        auVar68._4_4_ =
             (auVar25._4_4_ * fVar264 + auVar27._4_4_ * fVar258 + auVar29._4_4_ * fVar208) * fVar255
        ;
        auVar68._0_4_ =
             (auVar25._0_4_ * fVar252 + auVar27._0_4_ * fVar249 + auVar29._0_4_ * fVar162) * fVar246
        ;
        auVar68._8_4_ =
             (auVar25._8_4_ * fVar269 + auVar27._8_4_ * fVar268 + auVar29._8_4_ * fVar224) * fVar256
        ;
        auVar68._12_4_ =
             (auVar25._12_4_ * fVar312 + auVar27._12_4_ * fVar302 + auVar29._12_4_ * fVar225) *
             fVar257;
        auVar68._16_4_ =
             (auVar25._16_4_ * fVar315 + auVar27._16_4_ * fVar314 + auVar29._16_4_ * fVar166) *
             fVar265;
        auVar68._20_4_ =
             (auVar25._20_4_ * fVar228 + auVar27._20_4_ * fVar327 + auVar29._20_4_ * fVar168) *
             fVar266;
        auVar68._24_4_ =
             (auVar25._24_4_ * fVar156 + auVar27._24_4_ * fVar154 + auVar29._24_4_ * fVar167) *
             fVar267;
        auVar68._28_4_ = auVar28._28_4_ + auVar24._28_4_;
        auVar197 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
        auVar143._16_16_ = auVar197;
        auVar143._0_16_ = auVar197;
        auVar24 = vcmpps_avx(auVar143,auVar68,2);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar219._4_4_ = uVar7;
        auVar219._0_4_ = uVar7;
        auVar219._8_4_ = uVar7;
        auVar219._12_4_ = uVar7;
        auVar219._16_4_ = uVar7;
        auVar219._20_4_ = uVar7;
        auVar219._24_4_ = uVar7;
        auVar219._28_4_ = uVar7;
        auVar25 = vcmpps_avx(auVar68,auVar219,2);
        auVar24 = vandps_avx(auVar25,auVar24);
        auVar197 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar260 = vpand_avx(auVar260,auVar197);
        auVar197 = vpmovsxwd_avx(auVar260);
        auVar207 = vpshufd_avx(auVar260,0xee);
        auVar207 = vpmovsxwd_avx(auVar207);
        auVar220._16_16_ = auVar207;
        auVar220._0_16_ = auVar197;
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar220 >> 0x7f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar207 >> 0x3f,0) == '\0') &&
            (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar207[0xf]) goto LAB_009b929a;
        auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,auVar297,4);
        auVar197 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar260 = vpand_avx(auVar260,auVar197);
        auVar197 = vpmovsxwd_avx(auVar260);
        auVar260 = vpunpckhwd_avx(auVar260,auVar260);
        auVar278._16_16_ = auVar260;
        auVar278._0_16_ = auVar197;
        auVar184 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                      CONCAT816(local_5a0[1]._16_8_,
                                                CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))));
        auVar333 = ZEXT3264(auVar144);
        auVar337._4_4_ = fVar151;
        auVar337._0_4_ = fVar134;
        auVar337._8_4_ = fVar153;
        auVar337._12_4_ = fVar155;
        auVar337._16_4_ = fVar157;
        auVar337._20_4_ = fVar159;
        auVar337._24_4_ = fVar161;
        auVar337._28_4_ = fVar164;
        if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar278 >> 0x7f,0) != '\0') ||
              (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar260 >> 0x3f,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar260[0xf] < '\0') {
          auVar69._4_4_ = auVar178._4_4_ * fVar255;
          auVar69._0_4_ = auVar178._0_4_ * fVar246;
          auVar69._8_4_ = auVar178._8_4_ * fVar256;
          auVar69._12_4_ = auVar178._12_4_ * fVar257;
          auVar69._16_4_ = auVar178._16_4_ * fVar265;
          auVar69._20_4_ = auVar178._20_4_ * fVar266;
          auVar69._24_4_ = auVar178._24_4_ * fVar267;
          auVar69._28_4_ = SUB84(local_5a0[1]._24_8_,4);
          auVar70._4_4_ = auVar242._4_4_ * fVar255;
          auVar70._0_4_ = auVar242._0_4_ * fVar246;
          auVar70._8_4_ = auVar242._8_4_ * fVar256;
          auVar70._12_4_ = auVar242._12_4_ * fVar257;
          auVar70._16_4_ = auVar242._16_4_ * fVar265;
          auVar70._20_4_ = auVar242._20_4_ * fVar266;
          auVar70._24_4_ = auVar242._24_4_ * fVar267;
          auVar70._28_4_ = auVar30._28_4_ + auVar26._28_4_;
          auVar243._8_4_ = 0x3f800000;
          auVar243._0_8_ = 0x3f8000003f800000;
          auVar243._12_4_ = 0x3f800000;
          auVar243._16_4_ = 0x3f800000;
          auVar243._20_4_ = 0x3f800000;
          auVar243._24_4_ = 0x3f800000;
          auVar243._28_4_ = 0x3f800000;
          auVar245 = ZEXT3264(auVar243);
          auVar144 = vsubps_avx(auVar243,auVar69);
          auVar144 = vblendvps_avx(auVar144,auVar69,auVar22);
          auVar333 = ZEXT3264(auVar144);
          auVar144 = vsubps_avx(auVar243,auVar70);
          _local_380 = vblendvps_avx(auVar144,auVar70,auVar22);
          auVar184 = ZEXT3264(auVar278);
          local_4c0 = auVar68;
        }
      }
      auVar350 = ZEXT3264(_local_820);
      auVar324 = ZEXT3264(_local_640);
      auVar144 = auVar184._0_32_;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0x7f,0) == '\0') &&
            (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar144 >> 0xbf,0) == '\0') &&
          (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar184[0x1f]) goto LAB_009b7d7c;
      auVar24 = vsubps_avx(local_6c0,auVar337);
      fVar249 = auVar337._0_4_ + auVar333._0_4_ * auVar24._0_4_;
      fVar252 = auVar337._4_4_ + auVar333._4_4_ * auVar24._4_4_;
      fVar255 = auVar337._8_4_ + auVar333._8_4_ * auVar24._8_4_;
      fVar256 = auVar337._12_4_ + auVar333._12_4_ * auVar24._12_4_;
      fVar257 = auVar337._16_4_ + auVar333._16_4_ * auVar24._16_4_;
      fVar258 = auVar337._20_4_ + auVar333._20_4_ * auVar24._20_4_;
      fVar264 = auVar337._24_4_ + auVar333._24_4_ * auVar24._24_4_;
      fVar265 = auVar337._28_4_ + auVar24._28_4_;
      fVar246 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
      auVar71._4_4_ = (fVar252 + fVar252) * fVar246;
      auVar71._0_4_ = (fVar249 + fVar249) * fVar246;
      auVar71._8_4_ = (fVar255 + fVar255) * fVar246;
      auVar71._12_4_ = (fVar256 + fVar256) * fVar246;
      auVar71._16_4_ = (fVar257 + fVar257) * fVar246;
      auVar71._20_4_ = (fVar258 + fVar258) * fVar246;
      auVar71._24_4_ = (fVar264 + fVar264) * fVar246;
      auVar71._28_4_ = fVar265 + fVar265;
      auVar245 = ZEXT3264(local_4c0);
      auVar24 = vcmpps_avx(local_4c0,auVar71,6);
      auVar25 = auVar144 & auVar24;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
        local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
        uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
        uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
        uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
        uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
        uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
        uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
        local_800 = auVar333._0_32_;
        local_280 = local_800;
        auVar124 = _local_380;
        auVar25 = _local_380;
        local_260 = (float)local_380._0_4_;
        fStack_25c = (float)local_380._4_4_;
        fStack_258 = (float)uStack_378;
        fStack_254 = uStack_378._4_4_;
        fStack_250 = (float)uStack_370;
        fStack_24c = uStack_370._4_4_;
        fStack_248 = (float)uStack_368;
        fStack_244 = uStack_368._4_4_;
        local_240 = local_4c0;
        local_220 = 0;
        local_6c0._0_4_ = uVar18;
        local_21c = uVar18;
        local_210 = local_8d0;
        fStack_20c = fStack_8cc;
        fStack_208 = fStack_8c8;
        fStack_204 = fStack_8c4;
        local_200 = local_7c0;
        uStack_1f8 = uStack_7b8;
        local_1f0 = local_7d0;
        uStack_1e8 = uStack_7c8;
        local_1e0 = local_7e0;
        uStack_1d8 = uStack_7d8;
        _local_380 = auVar25;
        if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          local_5a0[0] = vandps_avx(auVar24,auVar144);
          auVar194._0_4_ = 1.0 / auVar211._0_4_;
          auVar194._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar260 = vshufps_avx(auVar194,auVar194,0);
          local_1a0[0] = auVar260._0_4_ * (auVar333._0_4_ + 0.0);
          local_1a0[1] = auVar260._4_4_ * (auVar333._4_4_ + 1.0);
          local_1a0[2] = auVar260._8_4_ * (auVar333._8_4_ + 2.0);
          local_1a0[3] = auVar260._12_4_ * (auVar333._12_4_ + 3.0);
          fStack_190 = auVar260._0_4_ * (auVar333._16_4_ + 4.0);
          fStack_18c = auVar260._4_4_ * (auVar333._20_4_ + 5.0);
          fStack_188 = auVar260._8_4_ * (auVar333._24_4_ + 6.0);
          fStack_184 = auVar333._28_4_ + 7.0;
          uStack_370 = auVar124._16_8_;
          uStack_368 = auVar25._24_8_;
          local_180 = local_380;
          uStack_178 = uStack_378;
          uStack_170 = uStack_370;
          uStack_168 = uStack_368;
          local_160 = local_4c0;
          auVar179._8_4_ = 0x7f800000;
          auVar179._0_8_ = 0x7f8000007f800000;
          auVar179._12_4_ = 0x7f800000;
          auVar179._16_4_ = 0x7f800000;
          auVar179._20_4_ = 0x7f800000;
          auVar179._24_4_ = 0x7f800000;
          auVar179._28_4_ = 0x7f800000;
          auVar144 = vblendvps_avx(auVar179,local_4c0,local_5a0[0]);
          auVar24 = vshufps_avx(auVar144,auVar144,0xb1);
          auVar24 = vminps_avx(auVar144,auVar24);
          auVar25 = vshufpd_avx(auVar24,auVar24,5);
          auVar24 = vminps_avx(auVar24,auVar25);
          auVar25 = vperm2f128_avx(auVar24,auVar24,1);
          auVar24 = vminps_avx(auVar24,auVar25);
          auVar24 = vcmpps_avx(auVar144,auVar24,0);
          auVar25 = local_5a0[0] & auVar24;
          auVar144 = local_5a0[0];
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            auVar144 = vandps_avx(auVar24,local_5a0[0]);
          }
          uVar127 = vmovmskps_avx(auVar144);
          uVar126 = 0;
          if (uVar127 != 0) {
            for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
            }
          }
          uVar129 = (ulong)uVar126;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar270 = local_1a0[uVar129];
            uVar7 = *(undefined4 *)((long)&local_180 + uVar129 * 4);
            fVar283 = 1.0 - fVar270;
            fVar281 = fVar270 * fVar283 * 4.0;
            auVar260 = ZEXT416((uint)(fVar270 * fVar270 * 0.5));
            auVar260 = vshufps_avx(auVar260,auVar260,0);
            auVar197 = ZEXT416((uint)((fVar283 * fVar283 + fVar281) * 0.5));
            auVar197 = vshufps_avx(auVar197,auVar197,0);
            auVar207 = ZEXT416((uint)((-fVar270 * fVar270 - fVar281) * 0.5));
            auVar207 = vshufps_avx(auVar207,auVar207,0);
            fVar281 = auVar207._0_4_ * (float)local_7c0._0_4_;
            fVar285 = auVar207._4_4_ * (float)local_7c0._4_4_;
            fVar246 = auVar207._8_4_ * (float)uStack_7b8;
            fVar249 = auVar207._12_4_ * uStack_7b8._4_4_;
            auVar245 = ZEXT1664(CONCAT412(fVar249,CONCAT48(fVar246,CONCAT44(fVar285,fVar281))));
            auVar207 = ZEXT416((uint)(fVar283 * -fVar283 * 0.5));
            auVar207 = vshufps_avx(auVar207,auVar207,0);
            auVar195._0_4_ =
                 local_8d0 * auVar207._0_4_ +
                 fVar281 + auVar260._0_4_ * (float)local_7e0._0_4_ +
                           auVar197._0_4_ * (float)local_7d0._0_4_;
            auVar195._4_4_ =
                 fStack_8cc * auVar207._4_4_ +
                 fVar285 + auVar260._4_4_ * (float)local_7e0._4_4_ +
                           auVar197._4_4_ * (float)local_7d0._4_4_;
            auVar195._8_4_ =
                 fStack_8c8 * auVar207._8_4_ +
                 fVar246 + auVar260._8_4_ * (float)uStack_7d8 + auVar197._8_4_ * (float)uStack_7c8;
            auVar195._12_4_ =
                 fStack_8c4 * auVar207._12_4_ +
                 fVar249 + auVar260._12_4_ * uStack_7d8._4_4_ + auVar197._12_4_ * uStack_7c8._4_4_;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar129 * 4);
            *(float *)(ray + k * 4 + 0xc0) = auVar195._0_4_;
            uVar19 = vextractps_avx(auVar195,1);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
            uVar19 = vextractps_avx(auVar195,2);
            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
            *(float *)(ray + k * 4 + 0xf0) = fVar270;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = uVar125;
            *(uint *)(ray + k * 4 + 0x120) = uVar17;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            local_660 = vpermilps_avx(_local_480,0);
            auStack_650 = auVar223._16_16_;
            local_680 = vpermilps_avx(ZEXT416(uVar125),0);
            auStack_670 = auVar23._16_16_;
            _auStack_5b0 = auVar240._16_16_;
            _local_5c0 = *local_6f8;
            local_6e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            local_6f0 = k;
            local_6e8 = ray;
            fStack_55c = auVar343._4_4_;
            fStack_558 = auVar343._8_4_;
            fStack_554 = auVar343._12_4_;
            while( true ) {
              local_400 = local_1a0[uVar129];
              local_3f0 = *(undefined4 *)((long)&local_180 + uVar129 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar129 * 4);
              fVar281 = 1.0 - local_400;
              fVar270 = local_400 * fVar281 * 4.0;
              auVar260 = ZEXT416((uint)(local_400 * local_400 * 0.5));
              auVar260 = vshufps_avx(auVar260,auVar260,0);
              auVar197 = ZEXT416((uint)((fVar281 * fVar281 + fVar270) * 0.5));
              auVar197 = vshufps_avx(auVar197,auVar197,0);
              auVar207 = ZEXT416((uint)((-local_400 * local_400 - fVar270) * 0.5));
              auVar207 = vshufps_avx(auVar207,auVar207,0);
              auVar237._0_4_ = auVar207._0_4_ * (float)local_7c0._0_4_;
              auVar237._4_4_ = auVar207._4_4_ * (float)local_7c0._4_4_;
              auVar237._8_4_ = auVar207._8_4_ * (float)uStack_7b8;
              auVar237._12_4_ = auVar207._12_4_ * uStack_7b8._4_4_;
              auVar245 = ZEXT1664(auVar237);
              local_7b0.context = context->user;
              auVar207 = ZEXT416((uint)(fVar281 * -fVar281 * 0.5));
              auVar207 = vshufps_avx(auVar207,auVar207,0);
              auVar200._0_4_ =
                   local_8d0 * auVar207._0_4_ +
                   auVar237._0_4_ +
                   auVar260._0_4_ * (float)local_7e0._0_4_ + auVar197._0_4_ * (float)local_7d0._0_4_
              ;
              auVar200._4_4_ =
                   fStack_8cc * auVar207._4_4_ +
                   auVar237._4_4_ +
                   auVar260._4_4_ * (float)local_7e0._4_4_ + auVar197._4_4_ * (float)local_7d0._4_4_
              ;
              auVar200._8_4_ =
                   fStack_8c8 * auVar207._8_4_ +
                   auVar237._8_4_ +
                   auVar260._8_4_ * (float)uStack_7d8 + auVar197._8_4_ * (float)uStack_7c8;
              auVar200._12_4_ =
                   fStack_8c4 * auVar207._12_4_ +
                   auVar237._12_4_ +
                   auVar260._12_4_ * uStack_7d8._4_4_ + auVar197._12_4_ * uStack_7c8._4_4_;
              auVar260 = vshufps_avx(auVar200,auVar200,0);
              local_430[0] = (RTCHitN)auVar260[0];
              local_430[1] = (RTCHitN)auVar260[1];
              local_430[2] = (RTCHitN)auVar260[2];
              local_430[3] = (RTCHitN)auVar260[3];
              local_430[4] = (RTCHitN)auVar260[4];
              local_430[5] = (RTCHitN)auVar260[5];
              local_430[6] = (RTCHitN)auVar260[6];
              local_430[7] = (RTCHitN)auVar260[7];
              local_430[8] = (RTCHitN)auVar260[8];
              local_430[9] = (RTCHitN)auVar260[9];
              local_430[10] = (RTCHitN)auVar260[10];
              local_430[0xb] = (RTCHitN)auVar260[0xb];
              local_430[0xc] = (RTCHitN)auVar260[0xc];
              local_430[0xd] = (RTCHitN)auVar260[0xd];
              local_430[0xe] = (RTCHitN)auVar260[0xe];
              local_430[0xf] = (RTCHitN)auVar260[0xf];
              auVar260 = vshufps_avx(auVar200,auVar200,0x55);
              local_420 = auVar260;
              local_410 = vshufps_avx(auVar200,auVar200,0xaa);
              fStack_3fc = local_400;
              fStack_3f8 = local_400;
              fStack_3f4 = local_400;
              uStack_3ec = local_3f0;
              uStack_3e8 = local_3f0;
              uStack_3e4 = local_3f0;
              local_3e0 = local_680._0_8_;
              uStack_3d8 = local_680._8_8_;
              local_3d0 = local_660;
              vcmpps_avx(ZEXT1632(local_660),ZEXT1632(local_660),0xf);
              uStack_3bc = (local_7b0.context)->instID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = (local_7b0.context)->instPrimID[0];
              uStack_3ac = uStack_3b0;
              uStack_3a8 = uStack_3b0;
              uStack_3a4 = uStack_3b0;
              local_830 = _local_5c0;
              local_7b0.valid = (int *)local_830;
              local_7b0.geometryUserPtr = *(void **)(local_780._0_8_ + 0x18);
              local_7b0.hit = local_430;
              local_7b0.N = 4;
              local_7b0.ray = (RTCRayN *)ray;
              if (*(code **)(local_780._0_8_ + 0x40) != (code *)0x0) {
                auVar245 = ZEXT1664(auVar237);
                (**(code **)(local_780._0_8_ + 0x40))(&local_7b0);
                auVar324 = ZEXT3264(_local_640);
                auVar350 = ZEXT3264(_local_820);
                auVar333 = ZEXT3264(local_800);
                ray = local_6e8;
                k = local_6f0;
                fVar367 = (float)local_740._0_4_;
                fVar370 = (float)local_740._4_4_;
                fVar371 = fStack_738;
                fVar372 = fStack_734;
                fVar287 = fStack_730;
                fVar288 = fStack_72c;
                fVar289 = fStack_728;
                fVar229 = fStack_724;
              }
              if (local_830 == (undefined1  [16])0x0) {
                auVar260 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar260 = auVar260 ^ _DAT_01f46b70;
              }
              else {
                p_Var21 = context->args->filter;
                if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    ((*(byte *)(local_780._0_8_ + 0x3e) & 0x40) != 0)))) {
                  auVar245 = ZEXT1664(auVar245._0_16_);
                  (*p_Var21)(&local_7b0);
                  auVar324 = ZEXT3264(_local_640);
                  auVar350 = ZEXT3264(_local_820);
                  auVar333 = ZEXT3264(local_800);
                  ray = local_6e8;
                  k = local_6f0;
                  fVar367 = (float)local_740._0_4_;
                  fVar370 = (float)local_740._4_4_;
                  fVar371 = fStack_738;
                  fVar372 = fStack_734;
                  fVar287 = fStack_730;
                  fVar288 = fStack_72c;
                  fVar289 = fStack_728;
                  fVar229 = fStack_724;
                }
                auVar197 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                auVar207 = vpcmpeqd_avx(auVar260,auVar260);
                auVar260 = auVar197 ^ auVar207;
                if (local_830 != (undefined1  [16])0x0) {
                  auVar197 = auVar197 ^ auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])local_7b0.hit);
                  *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x10));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x20));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x30));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x40));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x50));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x60));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar207;
                  auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x70));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar207;
                  auVar197 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x80));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar197;
                }
              }
              auVar144 = local_4c0;
              auVar172._8_8_ = 0x100000001;
              auVar172._0_8_ = 0x100000001;
              if ((auVar172 & auVar260) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = local_6e0._0_4_;
                auVar260 = local_6e0;
              }
              else {
                auVar260 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_5a0[0] + uVar129 * 4) = 0;
              local_6e0 = auVar260;
              auVar260 = vshufps_avx(auVar260,auVar260,0);
              auVar150._16_16_ = auVar260;
              auVar150._0_16_ = auVar260;
              auVar23 = vcmpps_avx(auVar144,auVar150,2);
              auVar223 = vandps_avx(auVar23,local_5a0[0]);
              local_5a0[0] = local_5a0[0] & auVar23;
              if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                    (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                  (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_5a0[0][0x1f]) break;
              auVar183._8_4_ = 0x7f800000;
              auVar183._0_8_ = 0x7f8000007f800000;
              auVar183._12_4_ = 0x7f800000;
              auVar183._16_4_ = 0x7f800000;
              auVar183._20_4_ = 0x7f800000;
              auVar183._24_4_ = 0x7f800000;
              auVar183._28_4_ = 0x7f800000;
              auVar144 = vblendvps_avx(auVar183,auVar144,auVar223);
              auVar23 = vshufps_avx(auVar144,auVar144,0xb1);
              auVar23 = vminps_avx(auVar144,auVar23);
              auVar24 = vshufpd_avx(auVar23,auVar23,5);
              auVar23 = vminps_avx(auVar23,auVar24);
              auVar24 = vperm2f128_avx(auVar23,auVar23,1);
              auVar23 = vminps_avx(auVar23,auVar24);
              auVar23 = vcmpps_avx(auVar144,auVar23,0);
              auVar24 = auVar223 & auVar23;
              auVar144 = auVar223;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar144 = vandps_avx(auVar23,auVar223);
              }
              uVar127 = vmovmskps_avx(auVar144);
              uVar126 = 0;
              if (uVar127 != 0) {
                for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                }
              }
              uVar129 = (ulong)uVar126;
              local_5a0[0] = auVar223;
            }
          }
        }
        uVar126 = local_6c0._0_4_;
        fVar186 = (float)local_720._0_4_;
        fVar187 = (float)local_720._4_4_;
        fVar189 = fStack_718;
        fVar190 = fStack_714;
        fVar270 = fStack_710;
        fVar281 = fStack_70c;
        fVar283 = fStack_708;
        fVar285 = fStack_704;
      }
    }
    auVar184 = ZEXT3264(local_540);
    auVar298 = ZEXT3264(_local_600);
    local_6e0._0_8_ = prim;
    local_660._0_8_ = pPVar132;
    local_680._0_8_ = pLVar133;
    if (8 < (int)uVar126) {
      auVar260 = vpshufd_avx(ZEXT416(uVar126),0);
      local_320._0_16_ = auVar260;
      auVar260 = vshufps_avx(auVar235,auVar235,0);
      register0x00001210 = auVar260;
      _local_340 = auVar260;
      auVar260 = vpermilps_avx(local_620._0_16_,0);
      register0x00001210 = auVar260;
      _local_360 = auVar260;
      auVar137._0_4_ = 1.0 / local_560;
      auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar260 = vshufps_avx(auVar137,auVar137,0);
      register0x00001210 = auVar260;
      _local_100 = auVar260;
      local_290 = vpermilps_avx(_local_480,0);
      local_2a0 = vpermilps_avx(local_4a0._0_16_,0);
      local_6c0._0_4_ = uVar126;
      local_800 = auVar333._0_32_;
      _local_640 = auVar324._0_32_;
      for (lVar131 = 8; local_540 = auVar184._0_32_, lVar131 < (int)uVar18; lVar131 = lVar131 + 8) {
        pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar131 * 4 + lVar128);
        fVar246 = *(float *)*pauVar1;
        fVar249 = *(float *)(*pauVar1 + 4);
        fVar252 = *(float *)(*pauVar1 + 8);
        fVar255 = *(float *)(*pauVar1 + 0xc);
        fVar256 = *(float *)(*pauVar1 + 0x10);
        fVar257 = *(float *)(*pauVar1 + 0x14);
        fVar258 = *(float *)(*pauVar1 + 0x18);
        auVar122 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar128 + 0x21fffac + lVar131 * 4);
        fVar264 = *(float *)*pauVar1;
        fVar265 = *(float *)(*pauVar1 + 4);
        fVar266 = *(float *)(*pauVar1 + 8);
        fVar267 = *(float *)(*pauVar1 + 0xc);
        fVar268 = *(float *)(*pauVar1 + 0x10);
        fVar269 = *(float *)(*pauVar1 + 0x14);
        fVar309 = *(float *)(*pauVar1 + 0x18);
        auVar121 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar128 + 0x2200430 + lVar131 * 4);
        fVar311 = *(float *)*pauVar1;
        fVar226 = *(float *)(*pauVar1 + 4);
        fVar302 = *(float *)(*pauVar1 + 8);
        fVar312 = *(float *)(*pauVar1 + 0xc);
        fVar313 = *(float *)(*pauVar1 + 0x10);
        fVar160 = *(float *)(*pauVar1 + 0x14);
        fVar163 = *(float *)(*pauVar1 + 0x18);
        auVar120 = *pauVar1;
        pfVar2 = (float *)(lVar128 + 0x22008b4 + lVar131 * 4);
        fVar314 = *pfVar2;
        fVar315 = pfVar2[1];
        fVar227 = pfVar2[2];
        fVar303 = pfVar2[3];
        fVar316 = pfVar2[4];
        fVar327 = pfVar2[5];
        fVar228 = pfVar2[6];
        fVar191 = pfVar2[7];
        fVar165 = fVar191 + fVar191 + fStack_444;
        auVar338._0_4_ =
             fVar246 * (float)local_300._0_4_ +
             auVar324._0_4_ * fVar264 + auVar298._0_4_ * fVar311 + (float)local_460._0_4_ * fVar314;
        auVar338._4_4_ =
             fVar249 * (float)local_300._4_4_ +
             auVar324._4_4_ * fVar265 + auVar298._4_4_ * fVar226 + (float)local_460._4_4_ * fVar315;
        auVar338._8_4_ =
             fVar252 * fStack_2f8 +
             auVar324._8_4_ * fVar266 + auVar298._8_4_ * fVar302 + fStack_458 * fVar227;
        auVar338._12_4_ =
             fVar255 * fStack_2f4 +
             auVar324._12_4_ * fVar267 + auVar298._12_4_ * fVar312 + fStack_454 * fVar303;
        auVar338._16_4_ =
             fVar256 * fStack_2f0 +
             auVar324._16_4_ * fVar268 + auVar298._16_4_ * fVar313 + fStack_450 * fVar316;
        auVar338._20_4_ =
             fVar257 * fStack_2ec +
             auVar324._20_4_ * fVar269 + auVar298._20_4_ * fVar160 + fStack_44c * fVar327;
        auVar338._24_4_ =
             fVar258 * fStack_2e8 +
             auVar324._24_4_ * fVar309 + auVar298._24_4_ * fVar163 + fStack_448 * fVar228;
        auVar338._28_4_ = fVar191 + fVar285 + fVar165;
        local_620._0_4_ =
             fVar246 * fVar192 + fVar367 * fVar264 + auVar350._0_4_ * fVar311 + fVar186 * fVar314;
        local_620._4_4_ =
             fVar249 * fVar204 + fVar370 * fVar265 + auVar350._4_4_ * fVar226 + fVar187 * fVar315;
        local_620._8_4_ =
             fVar252 * fVar205 + fVar371 * fVar266 + auVar350._8_4_ * fVar302 + fVar189 * fVar227;
        local_620._12_4_ =
             fVar255 * fVar206 + fVar372 * fVar267 + auVar350._12_4_ * fVar312 + fVar190 * fVar303;
        local_620._16_4_ =
             fVar256 * fVar192 + fVar287 * fVar268 + auVar350._16_4_ * fVar313 + fVar270 * fVar316;
        local_620._20_4_ =
             fVar257 * fVar204 + fVar288 * fVar269 + auVar350._20_4_ * fVar160 + fVar281 * fVar327;
        local_620._24_4_ =
             fVar258 * fVar205 + fVar289 * fVar309 + auVar350._24_4_ * fVar163 + fVar283 * fVar228;
        local_620._28_4_ = fVar165 + fVar191 + fVar191 + auVar245._28_4_;
        fVar135 = fVar246 * (float)local_c0._0_4_ +
                  (float)local_a0._0_4_ * fVar264 +
                  fVar311 * (float)local_120._0_4_ + fVar314 * (float)local_140._0_4_;
        fVar152 = fVar249 * (float)local_c0._4_4_ +
                  (float)local_a0._4_4_ * fVar265 +
                  fVar226 * (float)local_120._4_4_ + fVar315 * (float)local_140._4_4_;
        fVar154 = fVar252 * fStack_b8 +
                  fStack_98 * fVar266 + fVar302 * fStack_118 + fVar227 * fStack_138;
        fVar156 = fVar255 * fStack_b4 +
                  fStack_94 * fVar267 + fVar312 * fStack_114 + fVar303 * fStack_134;
        fVar158 = fVar256 * fStack_b0 +
                  fStack_90 * fVar268 + fVar313 * fStack_110 + fVar316 * fStack_130;
        fVar160 = fVar257 * fStack_ac +
                  fStack_8c * fVar269 + fVar160 * fStack_10c + fVar327 * fStack_12c;
        fVar163 = fVar258 * fStack_a8 +
                  fStack_88 * fVar309 + fVar163 * fStack_108 + fVar228 * fStack_128;
        fVar165 = fVar165 + fVar191 + fVar191 + fVar285;
        pfVar2 = (float *)(bspline_basis1 + lVar131 * 4 + lVar128);
        fVar258 = *pfVar2;
        fVar264 = pfVar2[1];
        fVar265 = pfVar2[2];
        fVar266 = pfVar2[3];
        fVar267 = pfVar2[4];
        fVar268 = pfVar2[5];
        fVar269 = pfVar2[6];
        pauVar1 = (undefined1 (*) [28])(lVar128 + 0x22023cc + lVar131 * 4);
        auVar123 = *pauVar1;
        fVar309 = *(float *)pauVar1[1];
        pfVar3 = (float *)(lVar128 + 0x2202850 + lVar131 * 4);
        fVar311 = *pfVar3;
        fVar226 = pfVar3[1];
        fVar302 = pfVar3[2];
        fVar312 = pfVar3[3];
        fStack_550 = pfVar3[4];
        fStack_54c = pfVar3[5];
        fStack_548 = pfVar3[6];
        fStack_544 = pfVar3[7];
        pauVar4 = (undefined1 (*) [16])(lVar128 + 0x2202cd4 + lVar131 * 4);
        fVar285 = *(float *)*pauVar4;
        fVar246 = *(float *)(*pauVar4 + 4);
        fVar249 = *(float *)(*pauVar4 + 8);
        auVar310 = *(undefined1 (*) [12])*pauVar4;
        fVar313 = *(float *)(*pauVar4 + 0xc);
        fStack_470 = *(float *)pauVar4[1];
        fStack_46c = *(float *)(pauVar4[1] + 4);
        fStack_468 = *(float *)(pauVar4[1] + 8);
        fStack_464 = *(float *)(pauVar4[1] + 0xc);
        fVar252 = auVar298._28_4_;
        local_880._0_4_ = auVar123._0_4_;
        local_880._4_4_ = auVar123._4_4_;
        fStack_878 = auVar123._8_4_;
        fStack_874 = auVar123._12_4_;
        auStack_870._0_4_ = auVar123._16_4_;
        auStack_870._4_4_ = auVar123._20_4_;
        fStack_868 = auVar123._24_4_;
        fVar255 = fVar252 + fVar252 + fVar309;
        auVar279._0_4_ =
             (float)local_300._0_4_ * fVar258 +
             auVar324._0_4_ * (float)local_880._0_4_ +
             fVar311 * auVar298._0_4_ + (float)local_460._0_4_ * fVar285;
        auVar279._4_4_ =
             (float)local_300._4_4_ * fVar264 +
             auVar324._4_4_ * (float)local_880._4_4_ +
             fVar226 * auVar298._4_4_ + (float)local_460._4_4_ * fVar246;
        auVar279._8_4_ =
             fStack_2f8 * fVar265 +
             auVar324._8_4_ * fStack_878 + fVar302 * auVar298._8_4_ + fStack_458 * fVar249;
        auVar279._12_4_ =
             fStack_2f4 * fVar266 +
             auVar324._12_4_ * fStack_874 + fVar312 * auVar298._12_4_ + fStack_454 * fVar313;
        auVar279._16_4_ =
             fStack_2f0 * fVar267 +
             auVar324._16_4_ * (float)auStack_870._0_4_ +
             fStack_550 * auVar298._16_4_ + fStack_450 * fStack_470;
        auVar279._20_4_ =
             fStack_2ec * fVar268 +
             auVar324._20_4_ * (float)auStack_870._4_4_ +
             fStack_54c * auVar298._20_4_ + fStack_44c * fStack_46c;
        auVar279._24_4_ =
             fStack_2e8 * fVar269 +
             auVar324._24_4_ * fStack_868 + fStack_548 * auVar298._24_4_ + fStack_448 * fStack_468;
        auVar279._28_4_ = fVar252 + fStack_464 + fVar255;
        auVar262._0_4_ =
             fVar186 * fVar285 + auVar350._0_4_ * fVar311 + fVar367 * (float)local_880._0_4_ +
             fVar192 * fVar258;
        auVar262._4_4_ =
             fVar187 * fVar246 + auVar350._4_4_ * fVar226 + fVar370 * (float)local_880._4_4_ +
             fVar204 * fVar264;
        auVar262._8_4_ =
             fVar189 * fVar249 + auVar350._8_4_ * fVar302 + fVar371 * fStack_878 + fVar205 * fVar265
        ;
        auVar262._12_4_ =
             fVar190 * fVar313 + auVar350._12_4_ * fVar312 + fVar372 * fStack_874 +
             fVar206 * fVar266;
        auVar262._16_4_ =
             fVar270 * fStack_470 + auVar350._16_4_ * fStack_550 +
             fVar287 * (float)auStack_870._0_4_ + fVar192 * fVar267;
        auVar262._20_4_ =
             fVar281 * fStack_46c + auVar350._20_4_ * fStack_54c +
             fVar288 * (float)auStack_870._4_4_ + fVar204 * fVar268;
        auVar262._24_4_ =
             fVar283 * fStack_468 + auVar350._24_4_ * fStack_548 + fVar289 * fStack_868 +
             fVar205 * fVar269;
        auVar262._28_4_ = fVar229 + fVar252 + fVar252 + fVar255;
        local_780._0_4_ =
             (float)local_a0._0_4_ * (float)local_880._0_4_ +
             fVar311 * (float)local_120._0_4_ + fVar285 * (float)local_140._0_4_ +
             (float)local_c0._0_4_ * fVar258;
        local_780._4_4_ =
             (float)local_a0._4_4_ * (float)local_880._4_4_ +
             fVar226 * (float)local_120._4_4_ + fVar246 * (float)local_140._4_4_ +
             (float)local_c0._4_4_ * fVar264;
        local_780._8_4_ =
             fStack_98 * fStack_878 + fVar302 * fStack_118 + fVar249 * fStack_138 +
             fStack_b8 * fVar265;
        local_780._12_4_ =
             fStack_94 * fStack_874 + fVar312 * fStack_114 + fVar313 * fStack_134 +
             fStack_b4 * fVar266;
        local_780._16_4_ =
             fStack_90 * (float)auStack_870._0_4_ +
             fStack_550 * fStack_110 + fStack_470 * fStack_130 + fStack_b0 * fVar267;
        local_780._20_4_ =
             fStack_8c * (float)auStack_870._4_4_ +
             fStack_54c * fStack_10c + fStack_46c * fStack_12c + fStack_ac * fVar268;
        local_780._24_4_ =
             fStack_88 * fStack_868 + fStack_548 * fStack_108 + fStack_468 * fStack_128 +
             fStack_a8 * fVar269;
        local_780._28_4_ = fVar252 + fVar252 + fStack_464 + fVar255;
        auVar223 = vsubps_avx(auVar279,auVar338);
        auVar23 = vsubps_avx(auVar262,local_620);
        fVar270 = auVar223._0_4_;
        fVar283 = auVar223._4_4_;
        auVar72._4_4_ = local_620._4_4_ * fVar283;
        auVar72._0_4_ = local_620._0_4_ * fVar270;
        fVar287 = auVar223._8_4_;
        auVar72._8_4_ = local_620._8_4_ * fVar287;
        fVar289 = auVar223._12_4_;
        auVar72._12_4_ = local_620._12_4_ * fVar289;
        fVar246 = auVar223._16_4_;
        auVar72._16_4_ = local_620._16_4_ * fVar246;
        fVar252 = auVar223._20_4_;
        auVar72._20_4_ = local_620._20_4_ * fVar252;
        fVar256 = auVar223._24_4_;
        auVar72._24_4_ = local_620._24_4_ * fVar256;
        auVar72._28_4_ = fVar255;
        fVar281 = auVar23._0_4_;
        fVar285 = auVar23._4_4_;
        auVar73._4_4_ = auVar338._4_4_ * fVar285;
        auVar73._0_4_ = auVar338._0_4_ * fVar281;
        fVar288 = auVar23._8_4_;
        auVar73._8_4_ = auVar338._8_4_ * fVar288;
        fVar229 = auVar23._12_4_;
        auVar73._12_4_ = auVar338._12_4_ * fVar229;
        fVar249 = auVar23._16_4_;
        auVar73._16_4_ = auVar338._16_4_ * fVar249;
        fVar255 = auVar23._20_4_;
        auVar73._20_4_ = auVar338._20_4_ * fVar255;
        fVar257 = auVar23._24_4_;
        auVar73._24_4_ = auVar338._24_4_ * fVar257;
        auVar73._28_4_ = auVar262._28_4_;
        auVar24 = vsubps_avx(auVar72,auVar73);
        auVar116._4_4_ = fVar152;
        auVar116._0_4_ = fVar135;
        auVar116._8_4_ = fVar154;
        auVar116._12_4_ = fVar156;
        auVar116._16_4_ = fVar158;
        auVar116._20_4_ = fVar160;
        auVar116._24_4_ = fVar163;
        auVar116._28_4_ = fVar165;
        auVar144 = vmaxps_avx(auVar116,local_780);
        auVar74._4_4_ = auVar144._4_4_ * auVar144._4_4_ * (fVar283 * fVar283 + fVar285 * fVar285);
        auVar74._0_4_ = auVar144._0_4_ * auVar144._0_4_ * (fVar270 * fVar270 + fVar281 * fVar281);
        auVar74._8_4_ = auVar144._8_4_ * auVar144._8_4_ * (fVar287 * fVar287 + fVar288 * fVar288);
        auVar74._12_4_ = auVar144._12_4_ * auVar144._12_4_ * (fVar289 * fVar289 + fVar229 * fVar229)
        ;
        auVar74._16_4_ = auVar144._16_4_ * auVar144._16_4_ * (fVar246 * fVar246 + fVar249 * fVar249)
        ;
        auVar74._20_4_ = auVar144._20_4_ * auVar144._20_4_ * (fVar252 * fVar252 + fVar255 * fVar255)
        ;
        auVar74._24_4_ = auVar144._24_4_ * auVar144._24_4_ * (fVar256 * fVar256 + fVar257 * fVar257)
        ;
        auVar74._28_4_ = auVar279._28_4_ + auVar262._28_4_;
        auVar75._4_4_ = auVar24._4_4_ * auVar24._4_4_;
        auVar75._0_4_ = auVar24._0_4_ * auVar24._0_4_;
        auVar75._8_4_ = auVar24._8_4_ * auVar24._8_4_;
        auVar75._12_4_ = auVar24._12_4_ * auVar24._12_4_;
        auVar75._16_4_ = auVar24._16_4_ * auVar24._16_4_;
        auVar75._20_4_ = auVar24._20_4_ * auVar24._20_4_;
        auVar75._24_4_ = auVar24._24_4_ * auVar24._24_4_;
        auVar75._28_4_ = auVar24._28_4_;
        auVar245 = ZEXT3264(auVar75);
        _local_4e0 = vcmpps_avx(auVar75,auVar74,2);
        local_220 = (uint)lVar131;
        auVar197 = vpshufd_avx(ZEXT416(local_220),0);
        auVar260 = vpor_avx(auVar197,_DAT_01f4ad30);
        auVar197 = vpor_avx(auVar197,_DAT_01f7afa0);
        auVar260 = vpcmpgtd_avx(local_320._0_16_,auVar260);
        auVar197 = vpcmpgtd_avx(local_320._0_16_,auVar197);
        auVar221._16_16_ = auVar197;
        auVar221._0_16_ = auVar260;
        auVar144 = auVar221 & _local_4e0;
        fVar367 = (float)local_740._0_4_;
        fVar370 = (float)local_740._4_4_;
        fVar371 = fStack_738;
        fVar372 = fStack_734;
        fVar287 = fStack_730;
        fVar288 = fStack_72c;
        fVar289 = fStack_728;
        fVar229 = fStack_724;
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0x7f,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0xbf,0) == '\0') &&
            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar144[0x1f]) {
          auVar184 = ZEXT3264(local_540);
LAB_009b8ae0:
          auVar333 = ZEXT3264(local_800);
          auVar350 = ZEXT3264(_local_820);
          auVar298 = ZEXT3264(_local_600);
          fVar186 = (float)local_720._0_4_;
          fVar187 = (float)local_720._4_4_;
          fVar189 = fStack_718;
          fVar190 = fStack_714;
          fVar270 = fStack_710;
          fVar281 = fStack_70c;
          fVar283 = fStack_708;
          fVar285 = fStack_704;
        }
        else {
          local_480._0_4_ = auVar310._0_4_;
          local_480._4_4_ = auVar310._4_4_;
          fStack_478 = auVar310._8_4_;
          local_560 = fVar258 * (float)local_520._0_4_ +
                      (float)local_880._0_4_ * (float)local_2e0._0_4_ +
                      (float)local_e0._0_4_ * fVar311 +
                      (float)local_2c0._0_4_ * (float)local_480._0_4_;
          fStack_55c = fVar264 * (float)local_520._4_4_ +
                       (float)local_880._4_4_ * (float)local_2e0._4_4_ +
                       (float)local_e0._4_4_ * fVar226 +
                       (float)local_2c0._4_4_ * (float)local_480._4_4_;
          fStack_558 = fVar265 * fStack_518 +
                       fStack_878 * fStack_2d8 + fStack_d8 * fVar302 + fStack_2b8 * fStack_478;
          fStack_554 = fVar266 * fStack_514 +
                       fStack_874 * fStack_2d4 + fStack_d4 * fVar312 + fStack_2b4 * fVar313;
          fStack_550 = fVar267 * fStack_510 +
                       (float)auStack_870._0_4_ * fStack_2d0 +
                       fStack_d0 * fStack_550 + fStack_2b0 * fStack_470;
          fStack_54c = fVar268 * fStack_50c +
                       (float)auStack_870._4_4_ * fStack_2cc +
                       fStack_cc * fStack_54c + fStack_2ac * fStack_46c;
          fStack_548 = fVar269 * fStack_508 +
                       fStack_868 * fStack_2c8 + fStack_c8 * fStack_548 + fStack_2a8 * fStack_468;
          fStack_544 = auVar23._28_4_ + fVar165 + local_4e0._28_4_ + 0.0;
          local_760._0_4_ = auVar121._0_4_;
          local_760._4_4_ = auVar121._4_4_;
          fStack_758 = auVar121._8_4_;
          fStack_754 = auVar121._12_4_;
          fStack_750 = auVar121._16_4_;
          fStack_74c = auVar121._20_4_;
          fStack_748 = auVar121._24_4_;
          local_6a0._0_4_ = auVar120._0_4_;
          local_6a0._4_4_ = auVar120._4_4_;
          fStack_698 = auVar120._8_4_;
          fStack_694 = auVar120._12_4_;
          fStack_690 = auVar120._16_4_;
          fStack_68c = auVar120._20_4_;
          fStack_688 = auVar120._24_4_;
          fVar168 = (float)local_e0._0_4_ * (float)local_6a0._0_4_;
          fVar186 = (float)local_e0._4_4_ * (float)local_6a0._4_4_;
          fVar187 = fStack_d8 * fStack_698;
          fVar189 = fStack_d4 * fStack_694;
          fVar190 = fStack_d0 * fStack_690;
          fVar134 = fStack_cc * fStack_68c;
          fVar151 = fStack_c8 * fStack_688;
          pfVar3 = (float *)(lVar128 + 0x2201640 + lVar131 * 4);
          fVar270 = *pfVar3;
          fVar281 = pfVar3[1];
          fVar283 = pfVar3[2];
          fVar285 = pfVar3[3];
          fVar246 = pfVar3[4];
          fVar249 = pfVar3[5];
          fVar252 = pfVar3[6];
          pfVar5 = (float *)(lVar128 + 0x2201ac4 + lVar131 * 4);
          fVar255 = *pfVar5;
          fVar256 = pfVar5[1];
          fVar257 = pfVar5[2];
          fVar258 = pfVar5[3];
          fVar264 = pfVar5[4];
          fVar265 = pfVar5[5];
          fVar266 = pfVar5[6];
          fVar153 = pfVar2[7] + 0.0;
          pfVar6 = (float *)(lVar128 + 0x22011bc + lVar131 * 4);
          fVar267 = *pfVar6;
          fVar268 = pfVar6[1];
          fVar269 = pfVar6[2];
          fVar311 = pfVar6[3];
          fVar226 = pfVar6[4];
          fVar302 = pfVar6[5];
          fVar312 = pfVar6[6];
          fVar166 = pfVar3[7] + pfVar5[7];
          fStack_5c4 = pfVar5[7] + fVar153;
          fVar153 = pfVar2[7] + fVar309 + fVar153;
          pfVar2 = (float *)(lVar128 + 0x2200d38 + lVar131 * 4);
          fVar309 = *pfVar2;
          fVar313 = pfVar2[1];
          fVar191 = pfVar2[2];
          fVar162 = pfVar2[3];
          fVar208 = pfVar2[4];
          fVar224 = pfVar2[5];
          fVar225 = pfVar2[6];
          local_6a0._4_4_ =
               (float)local_300._4_4_ * fVar313 +
               (float)local_640._4_4_ * fVar268 +
               (float)local_600._4_4_ * fVar281 + (float)local_460._4_4_ * fVar256;
          local_6a0._0_4_ =
               (float)local_300._0_4_ * fVar309 +
               (float)local_640._0_4_ * fVar267 +
               (float)local_600._0_4_ * fVar270 + (float)local_460._0_4_ * fVar255;
          fStack_698 = fStack_2f8 * fVar191 +
                       fStack_638 * fVar269 + fStack_5f8 * fVar283 + fStack_458 * fVar257;
          fStack_694 = fStack_2f4 * fVar162 +
                       fStack_634 * fVar311 + fStack_5f4 * fVar285 + fStack_454 * fVar258;
          fStack_690 = fStack_2f0 * fVar208 +
                       fStack_630 * fVar226 + fStack_5f0 * fVar246 + fStack_450 * fVar264;
          fStack_68c = fStack_2ec * fVar224 +
                       fStack_62c * fVar302 + fStack_5ec * fVar249 + fStack_44c * fVar265;
          fStack_688 = fStack_2e8 * fVar225 +
                       fStack_628 * fVar312 + fStack_5e8 * fVar252 + fStack_448 * fVar266;
          fStack_684 = fVar166 + fStack_5c4;
          local_5e0 = fVar309 * fVar192 +
                      (float)local_820._0_4_ * fVar270 + (float)local_720._0_4_ * fVar255 +
                      fVar267 * (float)local_740._0_4_;
          fStack_5dc = fVar313 * fVar204 +
                       (float)local_820._4_4_ * fVar281 + (float)local_720._4_4_ * fVar256 +
                       fVar268 * (float)local_740._4_4_;
          fStack_5d8 = fVar191 * fVar205 +
                       fStack_818 * fVar283 + fStack_718 * fVar257 + fVar269 * fStack_738;
          fStack_5d4 = fVar162 * fVar206 +
                       fStack_814 * fVar285 + fStack_714 * fVar258 + fVar311 * fStack_734;
          fStack_5d0 = fVar208 * fVar192 +
                       fStack_810 * fVar246 + fStack_710 * fVar264 + fVar226 * fStack_730;
          fStack_5cc = fVar224 * fVar204 +
                       fStack_80c * fVar249 + fStack_70c * fVar265 + fVar302 * fStack_72c;
          fStack_5c8 = fVar225 * fVar205 +
                       fStack_808 * fVar252 + fStack_708 * fVar266 + fVar312 * fStack_728;
          fStack_5c4 = fStack_5c4 + fVar153;
          auVar354._0_4_ =
               fVar267 * (float)local_2e0._0_4_ +
               (float)local_e0._0_4_ * fVar270 + (float)local_2c0._0_4_ * fVar255 +
               fVar309 * (float)local_520._0_4_;
          auVar354._4_4_ =
               fVar268 * (float)local_2e0._4_4_ +
               (float)local_e0._4_4_ * fVar281 + (float)local_2c0._4_4_ * fVar256 +
               fVar313 * (float)local_520._4_4_;
          auVar354._8_4_ =
               fVar269 * fStack_2d8 + fStack_d8 * fVar283 + fStack_2b8 * fVar257 +
               fVar191 * fStack_518;
          auVar354._12_4_ =
               fVar311 * fStack_2d4 + fStack_d4 * fVar285 + fStack_2b4 * fVar258 +
               fVar162 * fStack_514;
          auVar354._16_4_ =
               fVar226 * fStack_2d0 + fStack_d0 * fVar246 + fStack_2b0 * fVar264 +
               fVar208 * fStack_510;
          auVar354._20_4_ =
               fVar302 * fStack_2cc + fStack_cc * fVar249 + fStack_2ac * fVar265 +
               fVar224 * fStack_50c;
          auVar354._24_4_ =
               fVar312 * fStack_2c8 + fStack_c8 * fVar252 + fStack_2a8 * fVar266 +
               fVar225 * fStack_508;
          auVar354._28_4_ = pfVar6[7] + fVar166 + fVar153;
          pfVar2 = (float *)(lVar128 + 0x2203a60 + lVar131 * 4);
          fVar270 = *pfVar2;
          fVar281 = pfVar2[1];
          fVar283 = pfVar2[2];
          fVar285 = pfVar2[3];
          fVar246 = pfVar2[4];
          fVar249 = pfVar2[5];
          fVar252 = pfVar2[6];
          pfVar3 = (float *)(lVar128 + 0x2203ee4 + lVar131 * 4);
          fVar255 = *pfVar3;
          fVar256 = pfVar3[1];
          fVar257 = pfVar3[2];
          fVar258 = pfVar3[3];
          fVar264 = pfVar3[4];
          fVar265 = pfVar3[5];
          fVar266 = pfVar3[6];
          pfVar5 = (float *)(lVar128 + 0x22035dc + lVar131 * 4);
          fVar267 = *pfVar5;
          fVar268 = pfVar5[1];
          fVar269 = pfVar5[2];
          fVar309 = pfVar5[3];
          fVar311 = pfVar5[4];
          fVar226 = pfVar5[5];
          fVar302 = pfVar5[6];
          pfVar6 = (float *)(lVar128 + 0x2203158 + lVar131 * 4);
          fVar312 = *pfVar6;
          fVar313 = pfVar6[1];
          fVar191 = pfVar6[2];
          fVar162 = pfVar6[3];
          fVar208 = pfVar6[4];
          fVar224 = pfVar6[5];
          fVar225 = pfVar6[6];
          auVar322._0_4_ =
               (float)local_300._0_4_ * fVar312 +
               (float)local_640._0_4_ * fVar267 +
               (float)local_600._0_4_ * fVar270 + (float)local_460._0_4_ * fVar255;
          auVar322._4_4_ =
               (float)local_300._4_4_ * fVar313 +
               (float)local_640._4_4_ * fVar268 +
               (float)local_600._4_4_ * fVar281 + (float)local_460._4_4_ * fVar256;
          auVar322._8_4_ =
               fStack_2f8 * fVar191 +
               fStack_638 * fVar269 + fStack_5f8 * fVar283 + fStack_458 * fVar257;
          auVar322._12_4_ =
               fStack_2f4 * fVar162 +
               fStack_634 * fVar309 + fStack_5f4 * fVar285 + fStack_454 * fVar258;
          auVar322._16_4_ =
               fStack_2f0 * fVar208 +
               fStack_630 * fVar311 + fStack_5f0 * fVar246 + fStack_450 * fVar264;
          auVar322._20_4_ =
               fStack_2ec * fVar224 +
               fStack_62c * fVar226 + fStack_5ec * fVar249 + fStack_44c * fVar265;
          auVar322._24_4_ =
               fStack_2e8 * fVar225 +
               fStack_628 * fVar302 + fStack_5e8 * fVar252 + fStack_448 * fVar266;
          auVar322._28_4_ = fStack_804 + fStack_804 + fStack_444 + fStack_5c4;
          auVar348._0_4_ =
               fVar312 * fVar192 +
               fVar267 * (float)local_740._0_4_ +
               (float)local_820._0_4_ * fVar270 + (float)local_720._0_4_ * fVar255;
          auVar348._4_4_ =
               fVar313 * fVar204 +
               fVar268 * (float)local_740._4_4_ +
               (float)local_820._4_4_ * fVar281 + (float)local_720._4_4_ * fVar256;
          auVar348._8_4_ =
               fVar191 * fVar205 +
               fVar269 * fStack_738 + fStack_818 * fVar283 + fStack_718 * fVar257;
          auVar348._12_4_ =
               fVar162 * fVar206 +
               fVar309 * fStack_734 + fStack_814 * fVar285 + fStack_714 * fVar258;
          auVar348._16_4_ =
               fVar208 * fVar192 +
               fVar311 * fStack_730 + fStack_810 * fVar246 + fStack_710 * fVar264;
          auVar348._20_4_ =
               fVar224 * fVar204 +
               fVar226 * fStack_72c + fStack_80c * fVar249 + fStack_70c * fVar265;
          auVar348._24_4_ =
               fVar225 * fVar205 +
               fVar302 * fStack_728 + fStack_808 * fVar252 + fStack_708 * fVar266;
          auVar348._28_4_ = fStack_804 + fStack_804 + fStack_704 + fStack_5c4;
          auVar263._8_4_ = 0x7fffffff;
          auVar263._0_8_ = 0x7fffffff7fffffff;
          auVar263._12_4_ = 0x7fffffff;
          auVar263._16_4_ = 0x7fffffff;
          auVar263._20_4_ = 0x7fffffff;
          auVar263._24_4_ = 0x7fffffff;
          auVar263._28_4_ = 0x7fffffff;
          auVar144 = vandps_avx(_local_6a0,auVar263);
          auVar118._4_4_ = fStack_5dc;
          auVar118._0_4_ = local_5e0;
          auVar118._8_4_ = fStack_5d8;
          auVar118._12_4_ = fStack_5d4;
          auVar118._16_4_ = fStack_5d0;
          auVar118._20_4_ = fStack_5cc;
          auVar118._24_4_ = fStack_5c8;
          auVar118._28_4_ = fStack_5c4;
          auVar24 = vandps_avx(auVar118,auVar263);
          auVar24 = vmaxps_avx(auVar144,auVar24);
          auVar144 = vandps_avx(auVar354,auVar263);
          auVar24 = vmaxps_avx(auVar24,auVar144);
          auVar24 = vcmpps_avx(auVar24,_local_340,1);
          auVar25 = vblendvps_avx(_local_6a0,auVar223,auVar24);
          auVar146._0_4_ =
               fVar312 * (float)local_520._0_4_ +
               fVar267 * (float)local_2e0._0_4_ +
               fVar255 * (float)local_2c0._0_4_ + (float)local_e0._0_4_ * fVar270;
          auVar146._4_4_ =
               fVar313 * (float)local_520._4_4_ +
               fVar268 * (float)local_2e0._4_4_ +
               fVar256 * (float)local_2c0._4_4_ + (float)local_e0._4_4_ * fVar281;
          auVar146._8_4_ =
               fVar191 * fStack_518 +
               fVar269 * fStack_2d8 + fVar257 * fStack_2b8 + fStack_d8 * fVar283;
          auVar146._12_4_ =
               fVar162 * fStack_514 +
               fVar309 * fStack_2d4 + fVar258 * fStack_2b4 + fStack_d4 * fVar285;
          auVar146._16_4_ =
               fVar208 * fStack_510 +
               fVar311 * fStack_2d0 + fVar264 * fStack_2b0 + fStack_d0 * fVar246;
          auVar146._20_4_ =
               fVar224 * fStack_50c +
               fVar226 * fStack_2cc + fVar265 * fStack_2ac + fStack_cc * fVar249;
          auVar146._24_4_ =
               fVar225 * fStack_508 +
               fVar302 * fStack_2c8 + fVar266 * fStack_2a8 + fStack_c8 * fVar252;
          auVar146._28_4_ = auVar144._28_4_ + pfVar5[7] + pfVar3[7] + pfVar2[7];
          auVar26 = vblendvps_avx(auVar118,auVar23,auVar24);
          auVar144 = vandps_avx(auVar322,auVar263);
          auVar24 = vandps_avx(auVar348,auVar263);
          auVar27 = vmaxps_avx(auVar144,auVar24);
          auVar144 = vandps_avx(auVar146,auVar263);
          auVar144 = vmaxps_avx(auVar27,auVar144);
          local_5c0._0_4_ = auVar122._0_4_;
          local_5c0._4_4_ = auVar122._4_4_;
          fStack_5b8 = auVar122._8_4_;
          fStack_5b4 = auVar122._12_4_;
          auStack_5b0._0_4_ = auVar122._16_4_;
          auStack_5b0._4_4_ = auVar122._20_4_;
          fStack_5a8 = auVar122._24_4_;
          auVar24 = vcmpps_avx(auVar144,_local_340,1);
          auVar144 = vblendvps_avx(auVar322,auVar223,auVar24);
          auVar147._0_4_ =
               (float)local_520._0_4_ * (float)local_5c0._0_4_ +
               (float)local_2e0._0_4_ * (float)local_760._0_4_ +
               fVar168 + (float)local_2c0._0_4_ * fVar314;
          auVar147._4_4_ =
               (float)local_520._4_4_ * (float)local_5c0._4_4_ +
               (float)local_2e0._4_4_ * (float)local_760._4_4_ +
               fVar186 + (float)local_2c0._4_4_ * fVar315;
          auVar147._8_4_ =
               fStack_518 * fStack_5b8 + fStack_2d8 * fStack_758 + fVar187 + fStack_2b8 * fVar227;
          auVar147._12_4_ =
               fStack_514 * fStack_5b4 + fStack_2d4 * fStack_754 + fVar189 + fStack_2b4 * fVar303;
          auVar147._16_4_ =
               fStack_510 * (float)auStack_5b0._0_4_ +
               fStack_2d0 * fStack_750 + fVar190 + fStack_2b0 * fVar316;
          auVar147._20_4_ =
               fStack_50c * (float)auStack_5b0._4_4_ +
               fStack_2cc * fStack_74c + fVar134 + fStack_2ac * fVar327;
          auVar147._24_4_ =
               fStack_508 * fStack_5a8 + fStack_2c8 * fStack_748 + fVar151 + fStack_2a8 * fVar228;
          auVar147._28_4_ = auVar27._28_4_ + fStack_544 + local_4e0._28_4_ + 0.0;
          auVar223 = vblendvps_avx(auVar348,auVar23,auVar24);
          fVar166 = auVar25._0_4_;
          fVar168 = auVar25._4_4_;
          fVar186 = auVar25._8_4_;
          fVar187 = auVar25._12_4_;
          fVar189 = auVar25._16_4_;
          fVar190 = auVar25._20_4_;
          fVar134 = auVar25._24_4_;
          fVar151 = auVar25._28_4_;
          fVar267 = auVar144._0_4_;
          fVar269 = auVar144._4_4_;
          fVar311 = auVar144._8_4_;
          fVar302 = auVar144._12_4_;
          fVar313 = auVar144._16_4_;
          fVar315 = auVar144._20_4_;
          fVar303 = auVar144._24_4_;
          fVar270 = auVar26._0_4_;
          fVar283 = auVar26._4_4_;
          fVar246 = auVar26._8_4_;
          fVar252 = auVar26._12_4_;
          fVar256 = auVar26._16_4_;
          fVar258 = auVar26._20_4_;
          fVar265 = auVar26._24_4_;
          auVar331._0_4_ = fVar270 * fVar270 + fVar166 * fVar166;
          auVar331._4_4_ = fVar283 * fVar283 + fVar168 * fVar168;
          auVar331._8_4_ = fVar246 * fVar246 + fVar186 * fVar186;
          auVar331._12_4_ = fVar252 * fVar252 + fVar187 * fVar187;
          auVar331._16_4_ = fVar256 * fVar256 + fVar189 * fVar189;
          auVar331._20_4_ = fVar258 * fVar258 + fVar190 * fVar190;
          auVar331._24_4_ = fVar265 * fVar265 + fVar134 * fVar134;
          auVar331._28_4_ = fStack_624 + fStack_5c4;
          auVar24 = vrsqrtps_avx(auVar331);
          fVar281 = auVar24._0_4_;
          fVar285 = auVar24._4_4_;
          auVar76._4_4_ = fVar285 * 1.5;
          auVar76._0_4_ = fVar281 * 1.5;
          fVar249 = auVar24._8_4_;
          auVar76._8_4_ = fVar249 * 1.5;
          fVar255 = auVar24._12_4_;
          auVar76._12_4_ = fVar255 * 1.5;
          fVar257 = auVar24._16_4_;
          auVar76._16_4_ = fVar257 * 1.5;
          fVar264 = auVar24._20_4_;
          auVar76._20_4_ = fVar264 * 1.5;
          fVar266 = auVar24._24_4_;
          auVar76._24_4_ = fVar266 * 1.5;
          auVar76._28_4_ = auVar348._28_4_;
          auVar77._4_4_ = fVar285 * fVar285 * fVar285 * auVar331._4_4_ * 0.5;
          auVar77._0_4_ = fVar281 * fVar281 * fVar281 * auVar331._0_4_ * 0.5;
          auVar77._8_4_ = fVar249 * fVar249 * fVar249 * auVar331._8_4_ * 0.5;
          auVar77._12_4_ = fVar255 * fVar255 * fVar255 * auVar331._12_4_ * 0.5;
          auVar77._16_4_ = fVar257 * fVar257 * fVar257 * auVar331._16_4_ * 0.5;
          auVar77._20_4_ = fVar264 * fVar264 * fVar264 * auVar331._20_4_ * 0.5;
          auVar77._24_4_ = fVar266 * fVar266 * fVar266 * auVar331._24_4_ * 0.5;
          auVar77._28_4_ = auVar331._28_4_;
          auVar25 = vsubps_avx(auVar76,auVar77);
          fVar327 = auVar25._0_4_;
          fVar228 = auVar25._4_4_;
          fVar191 = auVar25._8_4_;
          fVar162 = auVar25._12_4_;
          fVar208 = auVar25._16_4_;
          fVar224 = auVar25._20_4_;
          fVar225 = auVar25._24_4_;
          fVar281 = auVar223._0_4_;
          fVar285 = auVar223._4_4_;
          fVar249 = auVar223._8_4_;
          fVar255 = auVar223._12_4_;
          fVar257 = auVar223._16_4_;
          fVar264 = auVar223._20_4_;
          fVar266 = auVar223._24_4_;
          auVar307._0_4_ = fVar281 * fVar281 + fVar267 * fVar267;
          auVar307._4_4_ = fVar285 * fVar285 + fVar269 * fVar269;
          auVar307._8_4_ = fVar249 * fVar249 + fVar311 * fVar311;
          auVar307._12_4_ = fVar255 * fVar255 + fVar302 * fVar302;
          auVar307._16_4_ = fVar257 * fVar257 + fVar313 * fVar313;
          auVar307._20_4_ = fVar264 * fVar264 + fVar315 * fVar315;
          auVar307._24_4_ = fVar266 * fVar266 + fVar303 * fVar303;
          auVar307._28_4_ = auVar24._28_4_ + auVar144._28_4_;
          auVar144 = vrsqrtps_avx(auVar307);
          fVar268 = auVar144._0_4_;
          fVar309 = auVar144._4_4_;
          auVar78._4_4_ = fVar309 * 1.5;
          auVar78._0_4_ = fVar268 * 1.5;
          fVar226 = auVar144._8_4_;
          auVar78._8_4_ = fVar226 * 1.5;
          fVar312 = auVar144._12_4_;
          auVar78._12_4_ = fVar312 * 1.5;
          fVar314 = auVar144._16_4_;
          auVar78._16_4_ = fVar314 * 1.5;
          fVar227 = auVar144._20_4_;
          auVar78._20_4_ = fVar227 * 1.5;
          fVar316 = auVar144._24_4_;
          auVar78._24_4_ = fVar316 * 1.5;
          auVar78._28_4_ = auVar348._28_4_;
          auVar79._4_4_ = fVar309 * fVar309 * fVar309 * auVar307._4_4_ * 0.5;
          auVar79._0_4_ = fVar268 * fVar268 * fVar268 * auVar307._0_4_ * 0.5;
          auVar79._8_4_ = fVar226 * fVar226 * fVar226 * auVar307._8_4_ * 0.5;
          auVar79._12_4_ = fVar312 * fVar312 * fVar312 * auVar307._12_4_ * 0.5;
          auVar79._16_4_ = fVar314 * fVar314 * fVar314 * auVar307._16_4_ * 0.5;
          auVar79._20_4_ = fVar227 * fVar227 * fVar227 * auVar307._20_4_ * 0.5;
          auVar79._24_4_ = fVar316 * fVar316 * fVar316 * auVar307._24_4_ * 0.5;
          auVar79._28_4_ = auVar307._28_4_;
          auVar223 = vsubps_avx(auVar78,auVar79);
          fVar268 = auVar223._0_4_;
          fVar309 = auVar223._4_4_;
          fVar226 = auVar223._8_4_;
          fVar312 = auVar223._12_4_;
          fVar314 = auVar223._16_4_;
          fVar227 = auVar223._20_4_;
          fVar316 = auVar223._24_4_;
          fVar270 = fVar135 * fVar327 * fVar270;
          fVar283 = fVar152 * fVar228 * fVar283;
          auVar80._4_4_ = fVar283;
          auVar80._0_4_ = fVar270;
          fVar246 = fVar154 * fVar191 * fVar246;
          auVar80._8_4_ = fVar246;
          fVar252 = fVar156 * fVar162 * fVar252;
          auVar80._12_4_ = fVar252;
          fVar256 = fVar158 * fVar208 * fVar256;
          auVar80._16_4_ = fVar256;
          fVar258 = fVar160 * fVar224 * fVar258;
          auVar80._20_4_ = fVar258;
          fVar265 = fVar163 * fVar225 * fVar265;
          auVar80._24_4_ = fVar265;
          auVar80._28_4_ = auVar144._28_4_;
          local_5c0._4_4_ = fVar283 + auVar338._4_4_;
          local_5c0._0_4_ = fVar270 + auVar338._0_4_;
          fStack_5b8 = fVar246 + auVar338._8_4_;
          fStack_5b4 = fVar252 + auVar338._12_4_;
          auStack_5b0._0_4_ = fVar256 + auVar338._16_4_;
          auStack_5b0._4_4_ = fVar258 + auVar338._20_4_;
          fStack_5a8 = fVar265 + auVar338._24_4_;
          fStack_5a4 = auVar144._28_4_ + auVar338._28_4_;
          fVar270 = fVar135 * fVar327 * -fVar166;
          fVar283 = fVar152 * fVar228 * -fVar168;
          auVar81._4_4_ = fVar283;
          auVar81._0_4_ = fVar270;
          fVar246 = fVar154 * fVar191 * -fVar186;
          auVar81._8_4_ = fVar246;
          fVar252 = fVar156 * fVar162 * -fVar187;
          auVar81._12_4_ = fVar252;
          fVar256 = fVar158 * fVar208 * -fVar189;
          auVar81._16_4_ = fVar256;
          fVar258 = fVar160 * fVar224 * -fVar190;
          auVar81._20_4_ = fVar258;
          fVar265 = fVar163 * fVar225 * -fVar134;
          auVar81._24_4_ = fVar265;
          auVar81._28_4_ = -fVar151;
          local_760._4_4_ = local_620._4_4_ + fVar283;
          local_760._0_4_ = local_620._0_4_ + fVar270;
          fStack_758 = local_620._8_4_ + fVar246;
          fStack_754 = local_620._12_4_ + fVar252;
          fStack_750 = local_620._16_4_ + fVar256;
          fStack_74c = local_620._20_4_ + fVar258;
          fStack_748 = local_620._24_4_ + fVar265;
          fStack_744 = local_620._28_4_ + -fVar151;
          fVar270 = fVar327 * 0.0 * fVar135;
          fVar283 = fVar228 * 0.0 * fVar152;
          auVar82._4_4_ = fVar283;
          auVar82._0_4_ = fVar270;
          fVar246 = fVar191 * 0.0 * fVar154;
          auVar82._8_4_ = fVar246;
          fVar252 = fVar162 * 0.0 * fVar156;
          auVar82._12_4_ = fVar252;
          fVar256 = fVar208 * 0.0 * fVar158;
          auVar82._16_4_ = fVar256;
          fVar258 = fVar224 * 0.0 * fVar160;
          auVar82._20_4_ = fVar258;
          fVar265 = fVar225 * 0.0 * fVar163;
          auVar82._24_4_ = fVar265;
          auVar82._28_4_ = fVar151;
          auVar144 = vsubps_avx(auVar338,auVar80);
          auVar369._0_4_ = fVar270 + auVar147._0_4_;
          auVar369._4_4_ = fVar283 + auVar147._4_4_;
          auVar369._8_4_ = fVar246 + auVar147._8_4_;
          auVar369._12_4_ = fVar252 + auVar147._12_4_;
          auVar369._16_4_ = fVar256 + auVar147._16_4_;
          auVar369._20_4_ = fVar258 + auVar147._20_4_;
          auVar369._24_4_ = fVar265 + auVar147._24_4_;
          auVar369._28_4_ = fVar151 + auVar147._28_4_;
          fVar270 = local_780._0_4_ * fVar268 * fVar281;
          fVar281 = local_780._4_4_ * fVar309 * fVar285;
          auVar83._4_4_ = fVar281;
          auVar83._0_4_ = fVar270;
          fVar283 = local_780._8_4_ * fVar226 * fVar249;
          auVar83._8_4_ = fVar283;
          fVar285 = local_780._12_4_ * fVar312 * fVar255;
          auVar83._12_4_ = fVar285;
          fVar246 = local_780._16_4_ * fVar314 * fVar257;
          auVar83._16_4_ = fVar246;
          fVar249 = local_780._20_4_ * fVar227 * fVar264;
          auVar83._20_4_ = fVar249;
          fVar252 = local_780._24_4_ * fVar316 * fVar266;
          auVar83._24_4_ = fVar252;
          auVar83._28_4_ = fVar165;
          auVar139 = vsubps_avx(local_620,auVar81);
          auVar355._0_4_ = auVar279._0_4_ + fVar270;
          auVar355._4_4_ = auVar279._4_4_ + fVar281;
          auVar355._8_4_ = auVar279._8_4_ + fVar283;
          auVar355._12_4_ = auVar279._12_4_ + fVar285;
          auVar355._16_4_ = auVar279._16_4_ + fVar246;
          auVar355._20_4_ = auVar279._20_4_ + fVar249;
          auVar355._24_4_ = auVar279._24_4_ + fVar252;
          auVar355._28_4_ = auVar279._28_4_ + fVar165;
          fVar270 = fVar268 * -fVar267 * local_780._0_4_;
          fVar281 = fVar309 * -fVar269 * local_780._4_4_;
          auVar84._4_4_ = fVar281;
          auVar84._0_4_ = fVar270;
          fVar283 = fVar226 * -fVar311 * local_780._8_4_;
          auVar84._8_4_ = fVar283;
          fVar285 = fVar312 * -fVar302 * local_780._12_4_;
          auVar84._12_4_ = fVar285;
          fVar246 = fVar314 * -fVar313 * local_780._16_4_;
          auVar84._16_4_ = fVar246;
          fVar249 = fVar227 * -fVar315 * local_780._20_4_;
          auVar84._20_4_ = fVar249;
          fVar252 = fVar316 * -fVar303 * local_780._24_4_;
          auVar84._24_4_ = fVar252;
          auVar84._28_4_ = auVar338._28_4_;
          auVar173 = vsubps_avx(auVar147,auVar82);
          auVar244._0_4_ = auVar262._0_4_ + fVar270;
          auVar244._4_4_ = auVar262._4_4_ + fVar281;
          auVar244._8_4_ = auVar262._8_4_ + fVar283;
          auVar244._12_4_ = auVar262._12_4_ + fVar285;
          auVar244._16_4_ = auVar262._16_4_ + fVar246;
          auVar244._20_4_ = auVar262._20_4_ + fVar249;
          auVar244._24_4_ = auVar262._24_4_ + fVar252;
          auVar244._28_4_ = auVar262._28_4_ + auVar338._28_4_;
          fVar270 = fVar268 * 0.0 * local_780._0_4_;
          fVar281 = fVar309 * 0.0 * local_780._4_4_;
          auVar85._4_4_ = fVar281;
          auVar85._0_4_ = fVar270;
          fVar283 = fVar226 * 0.0 * local_780._8_4_;
          auVar85._8_4_ = fVar283;
          fVar285 = fVar312 * 0.0 * local_780._12_4_;
          auVar85._12_4_ = fVar285;
          fVar246 = fVar314 * 0.0 * local_780._16_4_;
          auVar85._16_4_ = fVar246;
          fVar249 = fVar227 * 0.0 * local_780._20_4_;
          auVar85._20_4_ = fVar249;
          fVar252 = fVar316 * 0.0 * local_780._24_4_;
          auVar85._24_4_ = fVar252;
          auVar85._28_4_ = auVar147._28_4_;
          auVar24 = vsubps_avx(auVar279,auVar83);
          auVar119._4_4_ = fStack_55c;
          auVar119._0_4_ = local_560;
          auVar119._8_4_ = fStack_558;
          auVar119._12_4_ = fStack_554;
          auVar119._16_4_ = fStack_550;
          auVar119._20_4_ = fStack_54c;
          auVar119._24_4_ = fStack_548;
          auVar119._28_4_ = fStack_544;
          auVar323._0_4_ = local_560 + fVar270;
          auVar323._4_4_ = fStack_55c + fVar281;
          auVar323._8_4_ = fStack_558 + fVar283;
          auVar323._12_4_ = fStack_554 + fVar285;
          auVar323._16_4_ = fStack_550 + fVar246;
          auVar323._20_4_ = fStack_54c + fVar249;
          auVar323._24_4_ = fStack_548 + fVar252;
          auVar323._28_4_ = fStack_544 + auVar147._28_4_;
          auVar25 = vsubps_avx(auVar262,auVar84);
          auVar26 = vsubps_avx(auVar119,auVar85);
          auVar27 = vsubps_avx(auVar244,auVar139);
          auVar28 = vsubps_avx(auVar323,auVar173);
          auVar86._4_4_ = auVar173._4_4_ * auVar27._4_4_;
          auVar86._0_4_ = auVar173._0_4_ * auVar27._0_4_;
          auVar86._8_4_ = auVar173._8_4_ * auVar27._8_4_;
          auVar86._12_4_ = auVar173._12_4_ * auVar27._12_4_;
          auVar86._16_4_ = auVar173._16_4_ * auVar27._16_4_;
          auVar86._20_4_ = auVar173._20_4_ * auVar27._20_4_;
          auVar86._24_4_ = auVar173._24_4_ * auVar27._24_4_;
          auVar86._28_4_ = auVar348._28_4_;
          auVar87._4_4_ = auVar139._4_4_ * auVar28._4_4_;
          auVar87._0_4_ = auVar139._0_4_ * auVar28._0_4_;
          auVar87._8_4_ = auVar139._8_4_ * auVar28._8_4_;
          auVar87._12_4_ = auVar139._12_4_ * auVar28._12_4_;
          auVar87._16_4_ = auVar139._16_4_ * auVar28._16_4_;
          auVar87._20_4_ = auVar139._20_4_ * auVar28._20_4_;
          auVar87._24_4_ = auVar139._24_4_ * auVar28._24_4_;
          auVar87._28_4_ = fStack_544;
          auVar29 = vsubps_avx(auVar87,auVar86);
          auVar88._4_4_ = auVar144._4_4_ * auVar28._4_4_;
          auVar88._0_4_ = auVar144._0_4_ * auVar28._0_4_;
          auVar88._8_4_ = auVar144._8_4_ * auVar28._8_4_;
          auVar88._12_4_ = auVar144._12_4_ * auVar28._12_4_;
          auVar88._16_4_ = auVar144._16_4_ * auVar28._16_4_;
          auVar88._20_4_ = auVar144._20_4_ * auVar28._20_4_;
          auVar88._24_4_ = auVar144._24_4_ * auVar28._24_4_;
          auVar88._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar355,auVar144);
          auVar89._4_4_ = auVar173._4_4_ * auVar28._4_4_;
          auVar89._0_4_ = auVar173._0_4_ * auVar28._0_4_;
          auVar89._8_4_ = auVar173._8_4_ * auVar28._8_4_;
          auVar89._12_4_ = auVar173._12_4_ * auVar28._12_4_;
          auVar89._16_4_ = auVar173._16_4_ * auVar28._16_4_;
          auVar89._20_4_ = auVar173._20_4_ * auVar28._20_4_;
          auVar89._24_4_ = auVar173._24_4_ * auVar28._24_4_;
          auVar89._28_4_ = auVar223._28_4_;
          auVar30 = vsubps_avx(auVar89,auVar88);
          auVar90._4_4_ = auVar139._4_4_ * auVar28._4_4_;
          auVar90._0_4_ = auVar139._0_4_ * auVar28._0_4_;
          auVar90._8_4_ = auVar139._8_4_ * auVar28._8_4_;
          auVar90._12_4_ = auVar139._12_4_ * auVar28._12_4_;
          auVar90._16_4_ = auVar139._16_4_ * auVar28._16_4_;
          auVar90._20_4_ = auVar139._20_4_ * auVar28._20_4_;
          auVar90._24_4_ = auVar139._24_4_ * auVar28._24_4_;
          auVar90._28_4_ = auVar223._28_4_;
          auVar91._4_4_ = auVar144._4_4_ * auVar27._4_4_;
          auVar91._0_4_ = auVar144._0_4_ * auVar27._0_4_;
          auVar91._8_4_ = auVar144._8_4_ * auVar27._8_4_;
          auVar91._12_4_ = auVar144._12_4_ * auVar27._12_4_;
          auVar91._16_4_ = auVar144._16_4_ * auVar27._16_4_;
          auVar91._20_4_ = auVar144._20_4_ * auVar27._20_4_;
          auVar91._24_4_ = auVar144._24_4_ * auVar27._24_4_;
          auVar91._28_4_ = auVar27._28_4_;
          auVar223 = vsubps_avx(auVar91,auVar90);
          auVar180._0_4_ = auVar29._0_4_ * 0.0 + auVar223._0_4_ + auVar30._0_4_ * 0.0;
          auVar180._4_4_ = auVar29._4_4_ * 0.0 + auVar223._4_4_ + auVar30._4_4_ * 0.0;
          auVar180._8_4_ = auVar29._8_4_ * 0.0 + auVar223._8_4_ + auVar30._8_4_ * 0.0;
          auVar180._12_4_ = auVar29._12_4_ * 0.0 + auVar223._12_4_ + auVar30._12_4_ * 0.0;
          auVar180._16_4_ = auVar29._16_4_ * 0.0 + auVar223._16_4_ + auVar30._16_4_ * 0.0;
          auVar180._20_4_ = auVar29._20_4_ * 0.0 + auVar223._20_4_ + auVar30._20_4_ * 0.0;
          auVar180._24_4_ = auVar29._24_4_ * 0.0 + auVar223._24_4_ + auVar30._24_4_ * 0.0;
          auVar180._28_4_ = auVar29._28_4_ + auVar223._28_4_ + auVar30._28_4_;
          auVar138 = vcmpps_avx(auVar180,ZEXT832(0) << 0x20,2);
          auVar223 = vblendvps_avx(auVar24,_local_5c0,auVar138);
          auVar24 = vblendvps_avx(auVar25,_local_760,auVar138);
          auVar25 = vblendvps_avx(auVar26,auVar369,auVar138);
          auVar26 = vblendvps_avx(auVar144,auVar355,auVar138);
          auVar27 = vblendvps_avx(auVar139,auVar244,auVar138);
          auVar28 = vblendvps_avx(auVar173,auVar323,auVar138);
          auVar29 = vblendvps_avx(auVar355,auVar144,auVar138);
          auVar30 = vblendvps_avx(auVar244,auVar139,auVar138);
          auVar22 = vblendvps_avx(auVar323,auVar173,auVar138);
          auVar144 = vandps_avx(_local_4e0,auVar221);
          auVar29 = vsubps_avx(auVar29,auVar223);
          auVar174 = vsubps_avx(auVar30,auVar24);
          auVar22 = vsubps_avx(auVar22,auVar25);
          auVar308 = vsubps_avx(auVar24,auVar27);
          fVar270 = auVar174._0_4_;
          fVar167 = auVar25._0_4_;
          fVar255 = auVar174._4_4_;
          fVar185 = auVar25._4_4_;
          auVar92._4_4_ = fVar185 * fVar255;
          auVar92._0_4_ = fVar167 * fVar270;
          fVar267 = auVar174._8_4_;
          fVar304 = auVar25._8_4_;
          auVar92._8_4_ = fVar304 * fVar267;
          fVar312 = auVar174._12_4_;
          fVar188 = auVar25._12_4_;
          auVar92._12_4_ = fVar188 * fVar312;
          fVar327 = auVar174._16_4_;
          fVar230 = auVar25._16_4_;
          auVar92._16_4_ = fVar230 * fVar327;
          fVar166 = auVar174._20_4_;
          fVar247 = auVar25._20_4_;
          auVar92._20_4_ = fVar247 * fVar166;
          fVar151 = auVar174._24_4_;
          fVar250 = auVar25._24_4_;
          auVar92._24_4_ = fVar250 * fVar151;
          auVar92._28_4_ = auVar30._28_4_;
          fVar281 = auVar24._0_4_;
          fVar253 = auVar22._0_4_;
          fVar256 = auVar24._4_4_;
          fVar231 = auVar22._4_4_;
          auVar93._4_4_ = fVar231 * fVar256;
          auVar93._0_4_ = fVar253 * fVar281;
          fVar268 = auVar24._8_4_;
          fVar248 = auVar22._8_4_;
          auVar93._8_4_ = fVar248 * fVar268;
          fVar313 = auVar24._12_4_;
          fVar251 = auVar22._12_4_;
          auVar93._12_4_ = fVar251 * fVar313;
          fVar228 = auVar24._16_4_;
          fVar271 = auVar22._16_4_;
          auVar93._16_4_ = fVar271 * fVar228;
          fVar168 = auVar24._20_4_;
          fVar282 = auVar22._20_4_;
          auVar93._20_4_ = fVar282 * fVar168;
          fVar153 = auVar24._24_4_;
          fVar284 = auVar22._24_4_;
          uVar7 = auVar139._28_4_;
          auVar93._24_4_ = fVar284 * fVar153;
          auVar93._28_4_ = uVar7;
          auVar30 = vsubps_avx(auVar93,auVar92);
          fVar283 = auVar223._0_4_;
          fVar257 = auVar223._4_4_;
          auVar94._4_4_ = fVar231 * fVar257;
          auVar94._0_4_ = fVar253 * fVar283;
          fVar269 = auVar223._8_4_;
          auVar94._8_4_ = fVar248 * fVar269;
          fVar314 = auVar223._12_4_;
          auVar94._12_4_ = fVar251 * fVar314;
          fVar191 = auVar223._16_4_;
          auVar94._16_4_ = fVar271 * fVar191;
          fVar186 = auVar223._20_4_;
          auVar94._20_4_ = fVar282 * fVar186;
          fVar155 = auVar223._24_4_;
          auVar94._24_4_ = fVar284 * fVar155;
          auVar94._28_4_ = uVar7;
          fVar285 = auVar29._0_4_;
          fVar258 = auVar29._4_4_;
          auVar95._4_4_ = fVar185 * fVar258;
          auVar95._0_4_ = fVar167 * fVar285;
          fVar309 = auVar29._8_4_;
          auVar95._8_4_ = fVar304 * fVar309;
          fVar315 = auVar29._12_4_;
          auVar95._12_4_ = fVar188 * fVar315;
          fVar162 = auVar29._16_4_;
          auVar95._16_4_ = fVar230 * fVar162;
          fVar187 = auVar29._20_4_;
          auVar95._20_4_ = fVar247 * fVar187;
          fVar157 = auVar29._24_4_;
          auVar95._24_4_ = fVar250 * fVar157;
          auVar95._28_4_ = auVar355._28_4_;
          auVar139 = vsubps_avx(auVar95,auVar94);
          auVar96._4_4_ = fVar256 * fVar258;
          auVar96._0_4_ = fVar281 * fVar285;
          auVar96._8_4_ = fVar268 * fVar309;
          auVar96._12_4_ = fVar313 * fVar315;
          auVar96._16_4_ = fVar228 * fVar162;
          auVar96._20_4_ = fVar168 * fVar187;
          auVar96._24_4_ = fVar153 * fVar157;
          auVar96._28_4_ = uVar7;
          auVar97._4_4_ = fVar257 * fVar255;
          auVar97._0_4_ = fVar283 * fVar270;
          auVar97._8_4_ = fVar269 * fVar267;
          auVar97._12_4_ = fVar314 * fVar312;
          auVar97._16_4_ = fVar191 * fVar327;
          auVar97._20_4_ = fVar186 * fVar166;
          auVar97._24_4_ = fVar155 * fVar151;
          auVar97._28_4_ = auVar173._28_4_;
          auVar173 = vsubps_avx(auVar97,auVar96);
          auVar25 = vsubps_avx(auVar25,auVar28);
          fVar249 = auVar173._28_4_ + auVar139._28_4_;
          auVar332._0_4_ = auVar173._0_4_ + auVar139._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
          auVar332._4_4_ = auVar173._4_4_ + auVar139._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
          auVar332._8_4_ = auVar173._8_4_ + auVar139._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
          auVar332._12_4_ = auVar173._12_4_ + auVar139._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
          auVar332._16_4_ = auVar173._16_4_ + auVar139._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
          auVar332._20_4_ = auVar173._20_4_ + auVar139._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
          auVar332._24_4_ = auVar173._24_4_ + auVar139._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
          auVar332._28_4_ = fVar249 + auVar30._28_4_;
          fVar246 = auVar308._0_4_;
          fVar264 = auVar308._4_4_;
          auVar98._4_4_ = auVar28._4_4_ * fVar264;
          auVar98._0_4_ = auVar28._0_4_ * fVar246;
          fVar311 = auVar308._8_4_;
          auVar98._8_4_ = auVar28._8_4_ * fVar311;
          fVar227 = auVar308._12_4_;
          auVar98._12_4_ = auVar28._12_4_ * fVar227;
          fVar208 = auVar308._16_4_;
          auVar98._16_4_ = auVar28._16_4_ * fVar208;
          fVar189 = auVar308._20_4_;
          auVar98._20_4_ = auVar28._20_4_ * fVar189;
          fVar159 = auVar308._24_4_;
          auVar98._24_4_ = auVar28._24_4_ * fVar159;
          auVar98._28_4_ = fVar249;
          fVar249 = auVar25._0_4_;
          fVar265 = auVar25._4_4_;
          auVar99._4_4_ = auVar27._4_4_ * fVar265;
          auVar99._0_4_ = auVar27._0_4_ * fVar249;
          fVar226 = auVar25._8_4_;
          auVar99._8_4_ = auVar27._8_4_ * fVar226;
          fVar303 = auVar25._12_4_;
          auVar99._12_4_ = auVar27._12_4_ * fVar303;
          fVar224 = auVar25._16_4_;
          auVar99._16_4_ = auVar27._16_4_ * fVar224;
          fVar190 = auVar25._20_4_;
          auVar99._20_4_ = auVar27._20_4_ * fVar190;
          fVar161 = auVar25._24_4_;
          auVar99._24_4_ = auVar27._24_4_ * fVar161;
          auVar99._28_4_ = auVar173._28_4_;
          auVar139 = vsubps_avx(auVar99,auVar98);
          auVar223 = vsubps_avx(auVar223,auVar26);
          fVar252 = auVar223._0_4_;
          fVar266 = auVar223._4_4_;
          auVar100._4_4_ = auVar28._4_4_ * fVar266;
          auVar100._0_4_ = auVar28._0_4_ * fVar252;
          fVar302 = auVar223._8_4_;
          auVar100._8_4_ = auVar28._8_4_ * fVar302;
          fVar316 = auVar223._12_4_;
          auVar100._12_4_ = auVar28._12_4_ * fVar316;
          fVar225 = auVar223._16_4_;
          auVar100._16_4_ = auVar28._16_4_ * fVar225;
          fVar134 = auVar223._20_4_;
          auVar100._20_4_ = auVar28._20_4_ * fVar134;
          fVar164 = auVar223._24_4_;
          auVar100._24_4_ = auVar28._24_4_ * fVar164;
          auVar100._28_4_ = auVar28._28_4_;
          auVar101._4_4_ = fVar265 * auVar26._4_4_;
          auVar101._0_4_ = fVar249 * auVar26._0_4_;
          auVar101._8_4_ = fVar226 * auVar26._8_4_;
          auVar101._12_4_ = fVar303 * auVar26._12_4_;
          auVar101._16_4_ = fVar224 * auVar26._16_4_;
          auVar101._20_4_ = fVar190 * auVar26._20_4_;
          auVar101._24_4_ = fVar161 * auVar26._24_4_;
          auVar101._28_4_ = auVar30._28_4_;
          auVar223 = vsubps_avx(auVar100,auVar101);
          auVar102._4_4_ = auVar27._4_4_ * fVar266;
          auVar102._0_4_ = auVar27._0_4_ * fVar252;
          auVar102._8_4_ = auVar27._8_4_ * fVar302;
          auVar102._12_4_ = auVar27._12_4_ * fVar316;
          auVar102._16_4_ = auVar27._16_4_ * fVar225;
          auVar102._20_4_ = auVar27._20_4_ * fVar134;
          auVar102._24_4_ = auVar27._24_4_ * fVar164;
          auVar102._28_4_ = auVar27._28_4_;
          auVar103._4_4_ = fVar264 * auVar26._4_4_;
          auVar103._0_4_ = fVar246 * auVar26._0_4_;
          auVar103._8_4_ = fVar311 * auVar26._8_4_;
          auVar103._12_4_ = fVar227 * auVar26._12_4_;
          auVar103._16_4_ = fVar208 * auVar26._16_4_;
          auVar103._20_4_ = fVar189 * auVar26._20_4_;
          auVar103._24_4_ = fVar159 * auVar26._24_4_;
          auVar103._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar103,auVar102);
          auVar148._0_4_ = auVar139._0_4_ * 0.0 + auVar26._0_4_ + auVar223._0_4_ * 0.0;
          auVar148._4_4_ = auVar139._4_4_ * 0.0 + auVar26._4_4_ + auVar223._4_4_ * 0.0;
          auVar148._8_4_ = auVar139._8_4_ * 0.0 + auVar26._8_4_ + auVar223._8_4_ * 0.0;
          auVar148._12_4_ = auVar139._12_4_ * 0.0 + auVar26._12_4_ + auVar223._12_4_ * 0.0;
          auVar148._16_4_ = auVar139._16_4_ * 0.0 + auVar26._16_4_ + auVar223._16_4_ * 0.0;
          auVar148._20_4_ = auVar139._20_4_ * 0.0 + auVar26._20_4_ + auVar223._20_4_ * 0.0;
          auVar148._24_4_ = auVar139._24_4_ * 0.0 + auVar26._24_4_ + auVar223._24_4_ * 0.0;
          auVar148._28_4_ = auVar223._28_4_ + auVar26._28_4_ + auVar223._28_4_;
          auVar223 = vmaxps_avx(auVar332,auVar148);
          auVar223 = vcmpps_avx(auVar223,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar245 = ZEXT3264(auVar144);
          auVar26 = auVar144 & auVar223;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
LAB_009b8e31:
            auVar310 = auVar308._4_12_;
            auVar184 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                          CONCAT816(local_5a0[1]._16_8_,
                                                    CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))
                                         ));
            auVar339._4_4_ = fVar152;
            auVar339._0_4_ = fVar135;
            auVar339._8_4_ = fVar154;
            auVar339._12_4_ = fVar156;
            auVar339._16_4_ = fVar158;
            auVar339._20_4_ = fVar160;
            auVar339._24_4_ = fVar163;
            auVar339._28_4_ = fVar165;
          }
          else {
            auVar26 = vandps_avx(auVar223,auVar144);
            auVar104._4_4_ = fVar265 * fVar255;
            auVar104._0_4_ = fVar249 * fVar270;
            auVar104._8_4_ = fVar226 * fVar267;
            auVar104._12_4_ = fVar303 * fVar312;
            auVar104._16_4_ = fVar224 * fVar327;
            auVar104._20_4_ = fVar190 * fVar166;
            auVar104._24_4_ = fVar161 * fVar151;
            auVar104._28_4_ = auVar144._28_4_;
            auVar105._4_4_ = fVar264 * fVar231;
            auVar105._0_4_ = fVar246 * fVar253;
            auVar105._8_4_ = fVar311 * fVar248;
            auVar105._12_4_ = fVar227 * fVar251;
            auVar105._16_4_ = fVar208 * fVar271;
            auVar105._20_4_ = fVar189 * fVar282;
            auVar105._24_4_ = fVar159 * fVar284;
            auVar105._28_4_ = auVar223._28_4_;
            auVar27 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = fVar266 * fVar231;
            auVar106._0_4_ = fVar252 * fVar253;
            auVar106._8_4_ = fVar302 * fVar248;
            auVar106._12_4_ = fVar316 * fVar251;
            auVar106._16_4_ = fVar225 * fVar271;
            auVar106._20_4_ = fVar134 * fVar282;
            auVar106._24_4_ = fVar164 * fVar284;
            auVar106._28_4_ = auVar22._28_4_;
            auVar107._4_4_ = fVar265 * fVar258;
            auVar107._0_4_ = fVar249 * fVar285;
            auVar107._8_4_ = fVar226 * fVar309;
            auVar107._12_4_ = fVar303 * fVar315;
            auVar107._16_4_ = fVar224 * fVar162;
            auVar107._20_4_ = fVar190 * fVar187;
            auVar107._24_4_ = fVar161 * fVar157;
            auVar107._28_4_ = auVar25._28_4_;
            auVar28 = vsubps_avx(auVar107,auVar106);
            auVar108._4_4_ = fVar264 * fVar258;
            auVar108._0_4_ = fVar246 * fVar285;
            auVar108._8_4_ = fVar311 * fVar309;
            auVar108._12_4_ = fVar227 * fVar315;
            auVar108._16_4_ = fVar208 * fVar162;
            auVar108._20_4_ = fVar189 * fVar187;
            auVar108._24_4_ = fVar159 * fVar157;
            auVar108._28_4_ = auVar29._28_4_;
            auVar109._4_4_ = fVar266 * fVar255;
            auVar109._0_4_ = fVar252 * fVar270;
            auVar109._8_4_ = fVar302 * fVar267;
            auVar109._12_4_ = fVar316 * fVar312;
            auVar109._16_4_ = fVar225 * fVar327;
            auVar109._20_4_ = fVar134 * fVar166;
            auVar109._24_4_ = fVar164 * fVar151;
            auVar109._28_4_ = auVar174._28_4_;
            auVar30 = vsubps_avx(auVar109,auVar108);
            fVar270 = auVar308._28_4_;
            auVar305._0_4_ = auVar27._0_4_ * 0.0 + auVar30._0_4_ + auVar28._0_4_ * 0.0;
            auVar305._4_4_ = auVar27._4_4_ * 0.0 + auVar30._4_4_ + auVar28._4_4_ * 0.0;
            auVar305._8_4_ = auVar27._8_4_ * 0.0 + auVar30._8_4_ + auVar28._8_4_ * 0.0;
            auVar305._12_4_ = auVar27._12_4_ * 0.0 + auVar30._12_4_ + auVar28._12_4_ * 0.0;
            auVar308._16_4_ = auVar27._16_4_ * 0.0 + auVar30._16_4_ + auVar28._16_4_ * 0.0;
            auVar308._0_16_ = auVar305;
            auVar308._20_4_ = auVar27._20_4_ * 0.0 + auVar30._20_4_ + auVar28._20_4_ * 0.0;
            auVar308._24_4_ = auVar27._24_4_ * 0.0 + auVar30._24_4_ + auVar28._24_4_ * 0.0;
            auVar308._28_4_ = fVar270 + auVar30._28_4_ + auVar29._28_4_;
            auVar310 = auVar305._4_12_;
            auVar223 = vrcpps_avx(auVar308);
            fVar270 = auVar223._0_4_;
            fVar285 = auVar223._4_4_;
            auVar110._4_4_ = auVar305._4_4_ * fVar285;
            auVar110._0_4_ = auVar305._0_4_ * fVar270;
            fVar246 = auVar223._8_4_;
            auVar110._8_4_ = auVar305._8_4_ * fVar246;
            fVar249 = auVar223._12_4_;
            auVar110._12_4_ = auVar305._12_4_ * fVar249;
            fVar252 = auVar223._16_4_;
            auVar110._16_4_ = auVar308._16_4_ * fVar252;
            fVar255 = auVar223._20_4_;
            auVar110._20_4_ = auVar308._20_4_ * fVar255;
            fVar258 = auVar223._24_4_;
            auVar110._24_4_ = auVar308._24_4_ * fVar258;
            auVar110._28_4_ = auVar25._28_4_;
            auVar349._8_4_ = 0x3f800000;
            auVar349._0_8_ = 0x3f8000003f800000;
            auVar349._12_4_ = 0x3f800000;
            auVar349._16_4_ = 0x3f800000;
            auVar349._20_4_ = 0x3f800000;
            auVar349._24_4_ = 0x3f800000;
            auVar349._28_4_ = 0x3f800000;
            auVar223 = vsubps_avx(auVar349,auVar110);
            fVar270 = auVar223._0_4_ * fVar270 + fVar270;
            fVar285 = auVar223._4_4_ * fVar285 + fVar285;
            fVar246 = auVar223._8_4_ * fVar246 + fVar246;
            fVar249 = auVar223._12_4_ * fVar249 + fVar249;
            fVar252 = auVar223._16_4_ * fVar252 + fVar252;
            fVar255 = auVar223._20_4_ * fVar255 + fVar255;
            fVar258 = auVar223._24_4_ * fVar258 + fVar258;
            auVar111._4_4_ =
                 (fVar257 * auVar27._4_4_ + auVar28._4_4_ * fVar256 + fVar185 * auVar30._4_4_) *
                 fVar285;
            auVar111._0_4_ =
                 (fVar283 * auVar27._0_4_ + auVar28._0_4_ * fVar281 + fVar167 * auVar30._0_4_) *
                 fVar270;
            auVar111._8_4_ =
                 (fVar269 * auVar27._8_4_ + auVar28._8_4_ * fVar268 + fVar304 * auVar30._8_4_) *
                 fVar246;
            auVar111._12_4_ =
                 (fVar314 * auVar27._12_4_ + auVar28._12_4_ * fVar313 + fVar188 * auVar30._12_4_) *
                 fVar249;
            auVar111._16_4_ =
                 (fVar191 * auVar27._16_4_ + auVar28._16_4_ * fVar228 + fVar230 * auVar30._16_4_) *
                 fVar252;
            auVar111._20_4_ =
                 (fVar186 * auVar27._20_4_ + auVar28._20_4_ * fVar168 + fVar247 * auVar30._20_4_) *
                 fVar255;
            auVar111._24_4_ =
                 (fVar155 * auVar27._24_4_ + auVar28._24_4_ * fVar153 + fVar250 * auVar30._24_4_) *
                 fVar258;
            auVar111._28_4_ = auVar24._28_4_ + auVar30._28_4_;
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar222._4_4_ = uVar7;
            auVar222._0_4_ = uVar7;
            auVar222._8_4_ = uVar7;
            auVar222._12_4_ = uVar7;
            auVar222._16_4_ = uVar7;
            auVar222._20_4_ = uVar7;
            auVar222._24_4_ = uVar7;
            auVar222._28_4_ = uVar7;
            auVar24 = vcmpps_avx(_local_360,auVar111,2);
            auVar245 = ZEXT3264(auVar24);
            auVar223 = vcmpps_avx(auVar111,auVar222,2);
            auVar223 = vandps_avx(auVar24,auVar223);
            auVar25 = auVar26 & auVar223;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) goto LAB_009b8e31;
            auVar223 = vandps_avx(auVar26,auVar223);
            auVar25 = vcmpps_avx(auVar308,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar26 = auVar223 & auVar25;
            auVar184 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                          CONCAT816(local_5a0[1]._16_8_,
                                                    CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))
                                         ));
            auVar339._4_4_ = fVar152;
            auVar339._0_4_ = fVar135;
            auVar339._8_4_ = fVar154;
            auVar339._12_4_ = fVar156;
            auVar339._16_4_ = fVar158;
            auVar339._20_4_ = fVar160;
            auVar339._24_4_ = fVar163;
            auVar339._28_4_ = fVar165;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar223 = vandps_avx(auVar25,auVar223);
              auVar184 = ZEXT3264(auVar223);
              auVar112._4_4_ = auVar332._4_4_ * fVar285;
              auVar112._0_4_ = auVar332._0_4_ * fVar270;
              auVar112._8_4_ = auVar332._8_4_ * fVar246;
              auVar112._12_4_ = auVar332._12_4_ * fVar249;
              auVar112._16_4_ = auVar332._16_4_ * fVar252;
              auVar112._20_4_ = auVar332._20_4_ * fVar255;
              auVar112._24_4_ = auVar332._24_4_ * fVar258;
              auVar112._28_4_ = auVar24._28_4_;
              auVar245 = ZEXT3264(auVar112);
              auVar113._4_4_ = auVar148._4_4_ * fVar285;
              auVar113._0_4_ = auVar148._0_4_ * fVar270;
              auVar113._8_4_ = auVar148._8_4_ * fVar246;
              auVar113._12_4_ = auVar148._12_4_ * fVar249;
              auVar113._16_4_ = auVar148._16_4_ * fVar252;
              auVar113._20_4_ = auVar148._20_4_ * fVar255;
              auVar113._24_4_ = auVar148._24_4_ * fVar258;
              auVar113._28_4_ = auVar148._28_4_;
              auVar280._8_4_ = 0x3f800000;
              auVar280._0_8_ = 0x3f8000003f800000;
              auVar280._12_4_ = 0x3f800000;
              auVar280._16_4_ = 0x3f800000;
              auVar280._20_4_ = 0x3f800000;
              auVar280._24_4_ = 0x3f800000;
              auVar280._28_4_ = 0x3f800000;
              auVar223 = vsubps_avx(auVar280,auVar112);
              local_540 = vblendvps_avx(auVar223,auVar112,auVar138);
              auVar223 = vsubps_avx(auVar280,auVar113);
              _local_3a0 = vblendvps_avx(auVar223,auVar113,auVar138);
              local_500 = auVar111;
            }
          }
          auVar333 = ZEXT3264(local_800);
          auVar350 = ZEXT3264(_local_820);
          auVar223 = auVar184._0_32_;
          local_4a0 = auVar23;
          if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar223 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar223 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar223 >> 0x7f,0) == '\0') &&
                (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar223 >> 0xbf,0) == '\0') &&
              (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar184[0x1f]) {
            auVar184 = ZEXT3264(local_540);
            goto LAB_009b8ae0;
          }
          auVar23 = vsubps_avx(local_780,auVar339);
          auVar245 = ZEXT3264(local_540);
          fVar281 = auVar339._0_4_ + auVar23._0_4_ * local_540._0_4_;
          fVar283 = auVar339._4_4_ + auVar23._4_4_ * local_540._4_4_;
          fVar285 = auVar339._8_4_ + auVar23._8_4_ * local_540._8_4_;
          fVar246 = auVar339._12_4_ + auVar23._12_4_ * local_540._12_4_;
          fVar249 = auVar339._16_4_ + auVar23._16_4_ * local_540._16_4_;
          fVar252 = auVar339._20_4_ + auVar23._20_4_ * local_540._20_4_;
          fVar255 = auVar339._24_4_ + auVar23._24_4_ * local_540._24_4_;
          fVar256 = auVar339._28_4_ + auVar23._28_4_;
          fVar270 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar114._4_4_ = (fVar283 + fVar283) * fVar270;
          auVar114._0_4_ = (fVar281 + fVar281) * fVar270;
          auVar114._8_4_ = (fVar285 + fVar285) * fVar270;
          auVar114._12_4_ = (fVar246 + fVar246) * fVar270;
          auVar114._16_4_ = (fVar249 + fVar249) * fVar270;
          auVar114._20_4_ = (fVar252 + fVar252) * fVar270;
          auVar114._24_4_ = (fVar255 + fVar255) * fVar270;
          auVar114._28_4_ = fVar256 + fVar256;
          auVar23 = vcmpps_avx(local_500,auVar114,6);
          auVar24 = auVar223 & auVar23;
          auVar298 = ZEXT3264(_local_600);
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
            auVar184 = ZEXT3264(local_540);
            goto LAB_009b8ae0;
          }
          local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
          local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
          uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
          uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
          uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
          uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
          uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
          uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
          local_280 = local_540;
          auVar124 = _local_3a0;
          auVar24 = _local_3a0;
          local_260 = (float)local_3a0._0_4_;
          fStack_25c = (float)local_3a0._4_4_;
          fStack_258 = (float)uStack_398;
          fStack_254 = uStack_398._4_4_;
          fStack_250 = (float)uStack_390;
          fStack_24c = uStack_390._4_4_;
          fStack_248 = (float)uStack_388;
          fStack_244 = uStack_388._4_4_;
          local_240 = local_500;
          local_21c = local_6c0._0_4_;
          local_210 = local_8d0;
          fStack_20c = fStack_8cc;
          fStack_208 = fStack_8c8;
          fStack_204 = fStack_8c4;
          local_200 = local_7c0;
          uStack_1f8 = uStack_7b8;
          local_1f0 = local_7d0;
          uStack_1e8 = uStack_7c8;
          local_1e0 = local_7e0;
          uStack_1d8 = uStack_7d8;
          pGVar20 = (context->scene->geometries).items[uVar17].ptr;
          if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_5a0[0] = vandps_avx(auVar23,auVar223);
            auVar196._0_4_ = (float)(int)local_220;
            auVar196._4_12_ = auVar310;
            auVar260 = vshufps_avx(auVar196,auVar196,0);
            local_1a0[0] = (auVar260._0_4_ + local_540._0_4_ + 0.0) * (float)local_100._0_4_;
            local_1a0[1] = (auVar260._4_4_ + local_540._4_4_ + 1.0) * (float)local_100._4_4_;
            local_1a0[2] = (auVar260._8_4_ + local_540._8_4_ + 2.0) * fStack_f8;
            local_1a0[3] = (auVar260._12_4_ + local_540._12_4_ + 3.0) * fStack_f4;
            fStack_190 = (auVar260._0_4_ + local_540._16_4_ + 4.0) * fStack_f0;
            fStack_18c = (auVar260._4_4_ + local_540._20_4_ + 5.0) * fStack_ec;
            fStack_188 = (auVar260._8_4_ + local_540._24_4_ + 6.0) * fStack_e8;
            fStack_184 = auVar260._12_4_ + local_540._28_4_ + 7.0;
            uStack_390 = auVar124._16_8_;
            uStack_388 = auVar24._24_8_;
            local_180 = local_3a0;
            uStack_178 = uStack_398;
            uStack_170 = uStack_390;
            uStack_168 = uStack_388;
            local_160 = local_500;
            auVar181._8_4_ = 0x7f800000;
            auVar181._0_8_ = 0x7f8000007f800000;
            auVar181._12_4_ = 0x7f800000;
            auVar181._16_4_ = 0x7f800000;
            auVar181._20_4_ = 0x7f800000;
            auVar181._24_4_ = 0x7f800000;
            auVar181._28_4_ = 0x7f800000;
            auVar223 = vblendvps_avx(auVar181,local_500,local_5a0[0]);
            auVar23 = vshufps_avx(auVar223,auVar223,0xb1);
            auVar23 = vminps_avx(auVar223,auVar23);
            auVar25 = vshufpd_avx(auVar23,auVar23,5);
            auVar23 = vminps_avx(auVar23,auVar25);
            auVar25 = vperm2f128_avx(auVar23,auVar23,1);
            auVar23 = vminps_avx(auVar23,auVar25);
            auVar23 = vcmpps_avx(auVar223,auVar23,0);
            auVar25 = local_5a0[0] & auVar23;
            auVar223 = local_5a0[0];
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar223 = vandps_avx(auVar23,local_5a0[0]);
            }
            local_620._0_8_ = lVar131;
            uVar127 = vmovmskps_avx(auVar223);
            uVar126 = 0;
            if (uVar127 != 0) {
              for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
              }
            }
            uVar129 = (ulong)uVar126;
            _local_3a0 = auVar24;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar270 = local_1a0[uVar129];
              uVar7 = *(undefined4 *)((long)&local_180 + uVar129 * 4);
              fVar283 = 1.0 - fVar270;
              fVar281 = fVar270 * fVar283 * 4.0;
              auVar260 = ZEXT416((uint)(fVar270 * fVar270 * 0.5));
              auVar260 = vshufps_avx(auVar260,auVar260,0);
              auVar197 = ZEXT416((uint)((fVar283 * fVar283 + fVar281) * 0.5));
              auVar197 = vshufps_avx(auVar197,auVar197,0);
              auVar207 = ZEXT416((uint)((-fVar270 * fVar270 - fVar281) * 0.5));
              auVar207 = vshufps_avx(auVar207,auVar207,0);
              fVar281 = auVar207._0_4_ * (float)local_7c0._0_4_;
              fVar285 = auVar207._4_4_ * (float)local_7c0._4_4_;
              fVar246 = auVar207._8_4_ * (float)uStack_7b8;
              fVar249 = auVar207._12_4_ * uStack_7b8._4_4_;
              auVar245 = ZEXT1664(CONCAT412(fVar249,CONCAT48(fVar246,CONCAT44(fVar285,fVar281))));
              auVar207 = ZEXT416((uint)(fVar283 * -fVar283 * 0.5));
              auVar207 = vshufps_avx(auVar207,auVar207,0);
              auVar198._0_4_ =
                   local_8d0 * auVar207._0_4_ +
                   fVar281 + auVar260._0_4_ * (float)local_7e0._0_4_ +
                             auVar197._0_4_ * (float)local_7d0._0_4_;
              auVar198._4_4_ =
                   fStack_8cc * auVar207._4_4_ +
                   fVar285 + auVar260._4_4_ * (float)local_7e0._4_4_ +
                             auVar197._4_4_ * (float)local_7d0._4_4_;
              auVar198._8_4_ =
                   fStack_8c8 * auVar207._8_4_ +
                   fVar246 + auVar260._8_4_ * (float)uStack_7d8 + auVar197._8_4_ * (float)uStack_7c8
              ;
              auVar198._12_4_ =
                   fStack_8c4 * auVar207._12_4_ +
                   fVar249 + auVar260._12_4_ * uStack_7d8._4_4_ + auVar197._12_4_ * uStack_7c8._4_4_
              ;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar129 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar198._0_4_;
              uVar19 = vextractps_avx(auVar198,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
              uVar19 = vextractps_avx(auVar198,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
              *(float *)(ray + k * 4 + 0xf0) = fVar270;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
              *(uint *)(ray + k * 4 + 0x110) = uVar125;
              *(uint *)(ray + k * 4 + 0x120) = uVar17;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              stack0xfffffffffffff988 = auVar262._8_24_;
              stack0xfffffffffffff9a8 = auVar279._8_24_;
              stack0xfffffffffffff928 = auVar338._8_24_;
              local_780._0_16_ = *local_6f8;
              _auStack_870 = auVar144._16_16_;
              _local_880 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              _local_480 = *pauVar4;
              while( true ) {
                local_400 = local_1a0[uVar129];
                local_3f0 = *(undefined4 *)((long)&local_180 + uVar129 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar129 * 4);
                fVar281 = 1.0 - local_400;
                fVar270 = local_400 * fVar281 * 4.0;
                auVar260 = ZEXT416((uint)(local_400 * local_400 * 0.5));
                auVar260 = vshufps_avx(auVar260,auVar260,0);
                auVar197 = ZEXT416((uint)((fVar281 * fVar281 + fVar270) * 0.5));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar207 = ZEXT416((uint)((-local_400 * local_400 - fVar270) * 0.5));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar236._0_4_ = auVar207._0_4_ * (float)local_7c0._0_4_;
                auVar236._4_4_ = auVar207._4_4_ * (float)local_7c0._4_4_;
                auVar236._8_4_ = auVar207._8_4_ * (float)uStack_7b8;
                auVar236._12_4_ = auVar207._12_4_ * uStack_7b8._4_4_;
                auVar245 = ZEXT1664(auVar236);
                local_7b0.context = context->user;
                auVar207 = ZEXT416((uint)(fVar281 * -fVar281 * 0.5));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar199._0_4_ =
                     local_8d0 * auVar207._0_4_ +
                     auVar236._0_4_ +
                     auVar260._0_4_ * (float)local_7e0._0_4_ +
                     auVar197._0_4_ * (float)local_7d0._0_4_;
                auVar199._4_4_ =
                     fStack_8cc * auVar207._4_4_ +
                     auVar236._4_4_ +
                     auVar260._4_4_ * (float)local_7e0._4_4_ +
                     auVar197._4_4_ * (float)local_7d0._4_4_;
                auVar199._8_4_ =
                     fStack_8c8 * auVar207._8_4_ +
                     auVar236._8_4_ +
                     auVar260._8_4_ * (float)uStack_7d8 + auVar197._8_4_ * (float)uStack_7c8;
                auVar199._12_4_ =
                     fStack_8c4 * auVar207._12_4_ +
                     auVar236._12_4_ +
                     auVar260._12_4_ * uStack_7d8._4_4_ + auVar197._12_4_ * uStack_7c8._4_4_;
                auVar260 = vshufps_avx(auVar199,auVar199,0);
                local_430[0] = (RTCHitN)auVar260[0];
                local_430[1] = (RTCHitN)auVar260[1];
                local_430[2] = (RTCHitN)auVar260[2];
                local_430[3] = (RTCHitN)auVar260[3];
                local_430[4] = (RTCHitN)auVar260[4];
                local_430[5] = (RTCHitN)auVar260[5];
                local_430[6] = (RTCHitN)auVar260[6];
                local_430[7] = (RTCHitN)auVar260[7];
                local_430[8] = (RTCHitN)auVar260[8];
                local_430[9] = (RTCHitN)auVar260[9];
                local_430[10] = (RTCHitN)auVar260[10];
                local_430[0xb] = (RTCHitN)auVar260[0xb];
                local_430[0xc] = (RTCHitN)auVar260[0xc];
                local_430[0xd] = (RTCHitN)auVar260[0xd];
                local_430[0xe] = (RTCHitN)auVar260[0xe];
                local_430[0xf] = (RTCHitN)auVar260[0xf];
                auVar260 = vshufps_avx(auVar199,auVar199,0x55);
                local_420 = auVar260;
                local_410 = vshufps_avx(auVar199,auVar199,0xaa);
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                local_3e0 = local_2a0._0_8_;
                uStack_3d8 = local_2a0._8_8_;
                local_3d0 = local_290;
                vcmpps_avx(ZEXT1632(local_290),ZEXT1632(local_290),0xf);
                uStack_3bc = (local_7b0.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_7b0.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_830 = local_780._0_16_;
                local_7b0.valid = (int *)local_830;
                local_7b0.geometryUserPtr = pGVar20->userPtr;
                local_7b0.hit = local_430;
                local_7b0.N = 4;
                local_7b0.ray = (RTCRayN *)ray;
                if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar245 = ZEXT1664(auVar236);
                  (*pGVar20->intersectionFilterN)(&local_7b0);
                }
                if (local_830 == (undefined1  [16])0x0) {
                  auVar260 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar260 = auVar260 ^ _DAT_01f46b70;
                }
                else {
                  p_Var21 = context->args->filter;
                  if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar245 = ZEXT1664(auVar245._0_16_);
                    (*p_Var21)(&local_7b0);
                  }
                  auVar197 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                  auVar207 = vpcmpeqd_avx(auVar260,auVar260);
                  auVar260 = auVar197 ^ auVar207;
                  if (local_830 != (undefined1  [16])0x0) {
                    auVar197 = auVar197 ^ auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])local_7b0.hit);
                    *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar207;
                    auVar207 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar207;
                    auVar197 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])(local_7b0.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar197;
                  }
                }
                auVar144 = local_500;
                auVar171._8_8_ = 0x100000001;
                auVar171._0_8_ = 0x100000001;
                if ((auVar171 & auVar260) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_880._0_4_;
                  auVar260 = _local_880;
                }
                else {
                  auVar260 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_5a0[0] + uVar129 * 4) = 0;
                _local_880 = auVar260;
                auVar260 = vshufps_avx(auVar260,auVar260,0);
                auVar149._16_16_ = auVar260;
                auVar149._0_16_ = auVar260;
                auVar23 = vcmpps_avx(auVar144,auVar149,2);
                auVar223 = vandps_avx(auVar23,local_5a0[0]);
                local_5a0[0] = local_5a0[0] & auVar23;
                if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                      (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                    (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_5a0[0][0x1f]) break;
                auVar182._8_4_ = 0x7f800000;
                auVar182._0_8_ = 0x7f8000007f800000;
                auVar182._12_4_ = 0x7f800000;
                auVar182._16_4_ = 0x7f800000;
                auVar182._20_4_ = 0x7f800000;
                auVar182._24_4_ = 0x7f800000;
                auVar182._28_4_ = 0x7f800000;
                auVar144 = vblendvps_avx(auVar182,auVar144,auVar223);
                auVar23 = vshufps_avx(auVar144,auVar144,0xb1);
                auVar23 = vminps_avx(auVar144,auVar23);
                auVar24 = vshufpd_avx(auVar23,auVar23,5);
                auVar23 = vminps_avx(auVar23,auVar24);
                auVar24 = vperm2f128_avx(auVar23,auVar23,1);
                auVar23 = vminps_avx(auVar23,auVar24);
                auVar23 = vcmpps_avx(auVar144,auVar23,0);
                auVar24 = auVar223 & auVar23;
                auVar144 = auVar223;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  auVar144 = vandps_avx(auVar23,auVar223);
                }
                uVar127 = vmovmskps_avx(auVar144);
                uVar126 = 0;
                if (uVar127 != 0) {
                  for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                  }
                }
                uVar129 = (ulong)uVar126;
                local_5a0[0] = auVar223;
              }
              auVar333 = ZEXT3264(local_800);
              auVar298 = ZEXT3264(_local_600);
              auVar350 = ZEXT3264(_local_820);
              fVar367 = (float)local_740._0_4_;
              fVar370 = (float)local_740._4_4_;
              fVar371 = fStack_738;
              fVar372 = fStack_734;
              fVar287 = fStack_730;
              fVar288 = fStack_72c;
              fVar289 = fStack_728;
              fVar229 = fStack_724;
            }
            lVar131 = local_620._0_8_;
          }
          auVar184 = ZEXT3264(local_540);
          fVar186 = (float)local_720._0_4_;
          fVar187 = (float)local_720._4_4_;
          fVar189 = fStack_718;
          fVar190 = fStack_714;
          fVar270 = fStack_710;
          fVar281 = fStack_70c;
          fVar283 = fStack_708;
          fVar285 = fStack_704;
        }
        auVar324 = ZEXT3264(_local_640);
      }
    }
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar145._4_4_ = uVar7;
    auVar145._0_4_ = uVar7;
    auVar145._8_4_ = uVar7;
    auVar145._12_4_ = uVar7;
    auVar145._16_4_ = uVar7;
    auVar145._20_4_ = uVar7;
    auVar145._24_4_ = uVar7;
    auVar145._28_4_ = uVar7;
    auVar144 = vcmpps_avx(local_80,auVar145,2);
    uVar125 = vmovmskps_avx(auVar144);
    uVar125 = (uint)uVar130 & uVar125;
    prim = (Primitive *)local_6e0._0_8_;
    pPVar132 = (Primitive *)local_660._0_8_;
    pLVar133 = (LinearSpace3fa *)local_680._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }